

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx::CurveNvIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  uint uVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  bool bVar116;
  bool bVar117;
  long lVar118;
  bool bVar119;
  bool bVar120;
  bool bVar121;
  bool bVar122;
  bool bVar123;
  bool bVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [28];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [24];
  uint uVar141;
  uint uVar142;
  uint uVar143;
  ulong uVar144;
  undefined1 auVar145 [8];
  undefined1 auVar181 [32];
  undefined1 auVar194 [16];
  long lVar146;
  Primitive *pPVar147;
  ulong uVar148;
  long lVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar167;
  float fVar169;
  float fVar173;
  float fVar175;
  float fVar177;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar174;
  float fVar176;
  float fVar178;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar195;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar209;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar210;
  float fVar211;
  float fVar228;
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  float fVar225;
  float fVar227;
  float fVar229;
  undefined1 auVar215 [16];
  float fVar224;
  float fVar226;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar213 [16];
  undefined1 auVar219 [32];
  float fVar235;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  float fVar236;
  float fVar247;
  float fVar248;
  float fVar250;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar241 [32];
  float fVar249;
  float fVar251;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar255;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  float fVar256;
  float fVar266;
  float fVar267;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar257;
  undefined1 auVar260 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar261 [32];
  float fVar268;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar272;
  float fVar281;
  float fVar282;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar283;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  float fVar284;
  undefined1 auVar280 [32];
  float fVar297;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar303;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar304;
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  float fVar305;
  float fVar306;
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar307 [32];
  float fVar325;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar314;
  float fVar316;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [64];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float fVar333;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  float fVar339;
  float fVar340;
  float fVar341;
  float in_register_0000151c;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar342;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar343 [32];
  float fVar349;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar350;
  float fVar353;
  float fVar354;
  float fVar355;
  float in_register_0000159c;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar356;
  float fVar359;
  float fVar360;
  float fVar361;
  float in_register_000015dc;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  Precalculations *local_7a8;
  RayHit *local_7a0;
  RayQueryContext *local_798;
  Primitive *local_790;
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 auStack_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 auStack_650 [8];
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined4 local_5e8;
  float local_5e4;
  undefined4 local_5e0;
  uint local_5dc;
  undefined4 local_5d8;
  uint local_5d4;
  uint local_5d0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined1 local_530 [8];
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [2] [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  uint local_360;
  uint local_35c;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_300 [32];
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [8];
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar18 = prim[1];
  uVar148 = (ulong)(byte)PVar18;
  lVar146 = uVar148 * 5;
  lVar118 = uVar148 * 0x19;
  fVar210 = *(float *)(prim + lVar118 + 0x12);
  auVar194 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar118 + 6));
  auVar258._0_4_ = fVar210 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar258._4_4_ = fVar210 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar258._8_4_ = fVar210 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar258._12_4_ = fVar210 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 4 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 4 + 10)));
  auVar179._0_4_ = fVar210 * auVar194._0_4_;
  auVar179._4_4_ = fVar210 * auVar194._4_4_;
  auVar179._8_4_ = fVar210 * auVar194._8_4_;
  auVar179._12_4_ = fVar210 * auVar194._12_4_;
  auVar153._16_16_ = auVar200;
  auVar153._0_16_ = auVar260;
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar146 + 6)));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar146 + 10)));
  auVar204._16_16_ = auVar200;
  auVar204._0_16_ = auVar260;
  auVar23 = vcvtdq2ps_avx(auVar204);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 6 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 6 + 10)));
  auVar216._16_16_ = auVar200;
  auVar216._0_16_ = auVar260;
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0xb + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0xb + 10)));
  auVar24 = vcvtdq2ps_avx(auVar216);
  auVar217._16_16_ = auVar200;
  auVar217._0_16_ = auVar260;
  auVar25 = vcvtdq2ps_avx(auVar217);
  uVar144 = (ulong)((uint)(byte)PVar18 * 0xc);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar275._16_16_ = auVar200;
  auVar275._0_16_ = auVar260;
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar148 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar275);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar148 + 10)));
  auVar285._16_16_ = auVar200;
  auVar285._0_16_ = auVar260;
  lVar149 = uVar148 * 9;
  uVar144 = (ulong)(uint)((int)lVar149 * 2);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar285);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar286._16_16_ = auVar200;
  auVar286._0_16_ = auVar260;
  auVar28 = vcvtdq2ps_avx(auVar286);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar148 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar148 + 10)));
  auVar307._16_16_ = auVar200;
  auVar307._0_16_ = auVar260;
  uVar144 = (ulong)(uint)((int)lVar146 << 2);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar29 = vcvtdq2ps_avx(auVar307);
  auVar326._16_16_ = auVar200;
  auVar326._0_16_ = auVar260;
  auVar30 = vcvtdq2ps_avx(auVar326);
  auVar260 = vshufps_avx(auVar258,auVar258,0);
  auVar200 = vshufps_avx(auVar258,auVar258,0x55);
  auVar194 = vshufps_avx(auVar258,auVar258,0xaa);
  fVar210 = auVar194._0_4_;
  fVar224 = auVar194._4_4_;
  fVar226 = auVar194._8_4_;
  fVar228 = auVar194._12_4_;
  fVar230 = auVar200._0_4_;
  fVar232 = auVar200._4_4_;
  fVar234 = auVar200._8_4_;
  fVar236 = auVar200._12_4_;
  fVar247 = auVar260._0_4_;
  fVar248 = auVar260._4_4_;
  fVar250 = auVar260._8_4_;
  fVar252 = auVar260._12_4_;
  auVar334._0_4_ = fVar247 * auVar153._0_4_ + fVar230 * auVar23._0_4_ + fVar210 * auVar24._0_4_;
  auVar334._4_4_ = fVar248 * auVar153._4_4_ + fVar232 * auVar23._4_4_ + fVar224 * auVar24._4_4_;
  auVar334._8_4_ = fVar250 * auVar153._8_4_ + fVar234 * auVar23._8_4_ + fVar226 * auVar24._8_4_;
  auVar334._12_4_ = fVar252 * auVar153._12_4_ + fVar236 * auVar23._12_4_ + fVar228 * auVar24._12_4_;
  auVar334._16_4_ = fVar247 * auVar153._16_4_ + fVar230 * auVar23._16_4_ + fVar210 * auVar24._16_4_;
  auVar334._20_4_ = fVar248 * auVar153._20_4_ + fVar232 * auVar23._20_4_ + fVar224 * auVar24._20_4_;
  auVar334._24_4_ = fVar250 * auVar153._24_4_ + fVar234 * auVar23._24_4_ + fVar226 * auVar24._24_4_;
  auVar334._28_4_ = fVar236 + in_register_000015dc + in_register_0000151c;
  auVar330._0_4_ = fVar247 * auVar25._0_4_ + fVar230 * auVar26._0_4_ + auVar27._0_4_ * fVar210;
  auVar330._4_4_ = fVar248 * auVar25._4_4_ + fVar232 * auVar26._4_4_ + auVar27._4_4_ * fVar224;
  auVar330._8_4_ = fVar250 * auVar25._8_4_ + fVar234 * auVar26._8_4_ + auVar27._8_4_ * fVar226;
  auVar330._12_4_ = fVar252 * auVar25._12_4_ + fVar236 * auVar26._12_4_ + auVar27._12_4_ * fVar228;
  auVar330._16_4_ = fVar247 * auVar25._16_4_ + fVar230 * auVar26._16_4_ + auVar27._16_4_ * fVar210;
  auVar330._20_4_ = fVar248 * auVar25._20_4_ + fVar232 * auVar26._20_4_ + auVar27._20_4_ * fVar224;
  auVar330._24_4_ = fVar250 * auVar25._24_4_ + fVar234 * auVar26._24_4_ + auVar27._24_4_ * fVar226;
  auVar330._28_4_ = fVar236 + in_register_000015dc + in_register_0000159c;
  auVar261._0_4_ = fVar247 * auVar28._0_4_ + fVar230 * auVar29._0_4_ + auVar30._0_4_ * fVar210;
  auVar261._4_4_ = fVar248 * auVar28._4_4_ + fVar232 * auVar29._4_4_ + auVar30._4_4_ * fVar224;
  auVar261._8_4_ = fVar250 * auVar28._8_4_ + fVar234 * auVar29._8_4_ + auVar30._8_4_ * fVar226;
  auVar261._12_4_ = fVar252 * auVar28._12_4_ + fVar236 * auVar29._12_4_ + auVar30._12_4_ * fVar228;
  auVar261._16_4_ = fVar247 * auVar28._16_4_ + fVar230 * auVar29._16_4_ + auVar30._16_4_ * fVar210;
  auVar261._20_4_ = fVar248 * auVar28._20_4_ + fVar232 * auVar29._20_4_ + auVar30._20_4_ * fVar224;
  auVar261._24_4_ = fVar250 * auVar28._24_4_ + fVar234 * auVar29._24_4_ + auVar30._24_4_ * fVar226;
  auVar261._28_4_ = fVar252 + fVar236 + fVar228;
  auVar260 = vshufps_avx(auVar179,auVar179,0);
  auVar200 = vshufps_avx(auVar179,auVar179,0x55);
  auVar194 = vshufps_avx(auVar179,auVar179,0xaa);
  fVar224 = auVar194._0_4_;
  fVar226 = auVar194._4_4_;
  fVar228 = auVar194._8_4_;
  fVar230 = auVar194._12_4_;
  fVar248 = auVar200._0_4_;
  fVar250 = auVar200._4_4_;
  fVar252 = auVar200._8_4_;
  fVar253 = auVar200._12_4_;
  fVar232 = auVar260._0_4_;
  fVar234 = auVar260._4_4_;
  fVar236 = auVar260._8_4_;
  fVar247 = auVar260._12_4_;
  fVar210 = auVar153._28_4_;
  auVar276._0_4_ = fVar232 * auVar153._0_4_ + fVar248 * auVar23._0_4_ + fVar224 * auVar24._0_4_;
  auVar276._4_4_ = fVar234 * auVar153._4_4_ + fVar250 * auVar23._4_4_ + fVar226 * auVar24._4_4_;
  auVar276._8_4_ = fVar236 * auVar153._8_4_ + fVar252 * auVar23._8_4_ + fVar228 * auVar24._8_4_;
  auVar276._12_4_ = fVar247 * auVar153._12_4_ + fVar253 * auVar23._12_4_ + fVar230 * auVar24._12_4_;
  auVar276._16_4_ = fVar232 * auVar153._16_4_ + fVar248 * auVar23._16_4_ + fVar224 * auVar24._16_4_;
  auVar276._20_4_ = fVar234 * auVar153._20_4_ + fVar250 * auVar23._20_4_ + fVar226 * auVar24._20_4_;
  auVar276._24_4_ = fVar236 * auVar153._24_4_ + fVar252 * auVar23._24_4_ + fVar228 * auVar24._24_4_;
  auVar276._28_4_ = fVar210 + auVar23._28_4_ + auVar24._28_4_;
  auVar181._0_4_ = fVar232 * auVar25._0_4_ + auVar27._0_4_ * fVar224 + fVar248 * auVar26._0_4_;
  auVar181._4_4_ = fVar234 * auVar25._4_4_ + auVar27._4_4_ * fVar226 + fVar250 * auVar26._4_4_;
  auVar181._8_4_ = fVar236 * auVar25._8_4_ + auVar27._8_4_ * fVar228 + fVar252 * auVar26._8_4_;
  auVar181._12_4_ = fVar247 * auVar25._12_4_ + auVar27._12_4_ * fVar230 + fVar253 * auVar26._12_4_;
  auVar181._16_4_ = fVar232 * auVar25._16_4_ + auVar27._16_4_ * fVar224 + fVar248 * auVar26._16_4_;
  auVar181._20_4_ = fVar234 * auVar25._20_4_ + auVar27._20_4_ * fVar226 + fVar250 * auVar26._20_4_;
  auVar181._24_4_ = fVar236 * auVar25._24_4_ + auVar27._24_4_ * fVar228 + fVar252 * auVar26._24_4_;
  auVar181._28_4_ = fVar210 + auVar27._28_4_ + auVar24._28_4_;
  auVar287._8_4_ = 0x7fffffff;
  auVar287._0_8_ = 0x7fffffff7fffffff;
  auVar287._12_4_ = 0x7fffffff;
  auVar287._16_4_ = 0x7fffffff;
  auVar287._20_4_ = 0x7fffffff;
  auVar287._24_4_ = 0x7fffffff;
  auVar287._28_4_ = 0x7fffffff;
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  auVar205._16_4_ = 0x219392ef;
  auVar205._20_4_ = 0x219392ef;
  auVar205._24_4_ = 0x219392ef;
  auVar205._28_4_ = 0x219392ef;
  auVar153 = vandps_avx(auVar334,auVar287);
  auVar153 = vcmpps_avx(auVar153,auVar205,1);
  auVar23 = vblendvps_avx(auVar334,auVar205,auVar153);
  auVar153 = vandps_avx(auVar330,auVar287);
  auVar153 = vcmpps_avx(auVar153,auVar205,1);
  auVar24 = vblendvps_avx(auVar330,auVar205,auVar153);
  auVar153 = vandps_avx(auVar261,auVar287);
  auVar153 = vcmpps_avx(auVar153,auVar205,1);
  auVar153 = vblendvps_avx(auVar261,auVar205,auVar153);
  auVar206._0_4_ = fVar248 * auVar29._0_4_ + auVar30._0_4_ * fVar224 + fVar232 * auVar28._0_4_;
  auVar206._4_4_ = fVar250 * auVar29._4_4_ + auVar30._4_4_ * fVar226 + fVar234 * auVar28._4_4_;
  auVar206._8_4_ = fVar252 * auVar29._8_4_ + auVar30._8_4_ * fVar228 + fVar236 * auVar28._8_4_;
  auVar206._12_4_ = fVar253 * auVar29._12_4_ + auVar30._12_4_ * fVar230 + fVar247 * auVar28._12_4_;
  auVar206._16_4_ = fVar248 * auVar29._16_4_ + auVar30._16_4_ * fVar224 + fVar232 * auVar28._16_4_;
  auVar206._20_4_ = fVar250 * auVar29._20_4_ + auVar30._20_4_ * fVar226 + fVar234 * auVar28._20_4_;
  auVar206._24_4_ = fVar252 * auVar29._24_4_ + auVar30._24_4_ * fVar228 + fVar236 * auVar28._24_4_;
  auVar206._28_4_ = auVar26._28_4_ + fVar230 + fVar210;
  auVar25 = vrcpps_avx(auVar23);
  fVar210 = auVar25._0_4_;
  fVar224 = auVar25._4_4_;
  auVar26._4_4_ = auVar23._4_4_ * fVar224;
  auVar26._0_4_ = auVar23._0_4_ * fVar210;
  fVar226 = auVar25._8_4_;
  auVar26._8_4_ = auVar23._8_4_ * fVar226;
  fVar228 = auVar25._12_4_;
  auVar26._12_4_ = auVar23._12_4_ * fVar228;
  fVar230 = auVar25._16_4_;
  auVar26._16_4_ = auVar23._16_4_ * fVar230;
  fVar232 = auVar25._20_4_;
  auVar26._20_4_ = auVar23._20_4_ * fVar232;
  fVar234 = auVar25._24_4_;
  auVar26._24_4_ = auVar23._24_4_ * fVar234;
  auVar26._28_4_ = auVar23._28_4_;
  auVar298._8_4_ = 0x3f800000;
  auVar298._0_8_ = &DAT_3f8000003f800000;
  auVar298._12_4_ = 0x3f800000;
  auVar298._16_4_ = 0x3f800000;
  auVar298._20_4_ = 0x3f800000;
  auVar298._24_4_ = 0x3f800000;
  auVar298._28_4_ = 0x3f800000;
  auVar26 = vsubps_avx(auVar298,auVar26);
  auVar23 = vrcpps_avx(auVar24);
  fVar210 = fVar210 + fVar210 * auVar26._0_4_;
  fVar224 = fVar224 + fVar224 * auVar26._4_4_;
  fVar226 = fVar226 + fVar226 * auVar26._8_4_;
  fVar228 = fVar228 + fVar228 * auVar26._12_4_;
  fVar230 = fVar230 + fVar230 * auVar26._16_4_;
  fVar232 = fVar232 + fVar232 * auVar26._20_4_;
  fVar234 = fVar234 + fVar234 * auVar26._24_4_;
  fVar256 = auVar23._0_4_;
  fVar266 = auVar23._4_4_;
  auVar27._4_4_ = fVar266 * auVar24._4_4_;
  auVar27._0_4_ = fVar256 * auVar24._0_4_;
  fVar267 = auVar23._8_4_;
  auVar27._8_4_ = fVar267 * auVar24._8_4_;
  fVar268 = auVar23._12_4_;
  auVar27._12_4_ = fVar268 * auVar24._12_4_;
  fVar269 = auVar23._16_4_;
  auVar27._16_4_ = fVar269 * auVar24._16_4_;
  fVar270 = auVar23._20_4_;
  auVar27._20_4_ = fVar270 * auVar24._20_4_;
  fVar271 = auVar23._24_4_;
  auVar27._24_4_ = fVar271 * auVar24._24_4_;
  auVar27._28_4_ = auVar25._28_4_;
  auVar23 = vsubps_avx(auVar298,auVar27);
  fVar256 = fVar256 + fVar256 * auVar23._0_4_;
  fVar266 = fVar266 + fVar266 * auVar23._4_4_;
  fVar267 = fVar267 + fVar267 * auVar23._8_4_;
  fVar268 = fVar268 + fVar268 * auVar23._12_4_;
  fVar269 = fVar269 + fVar269 * auVar23._16_4_;
  fVar270 = fVar270 + fVar270 * auVar23._20_4_;
  fVar271 = fVar271 + fVar271 * auVar23._24_4_;
  auVar23 = vrcpps_avx(auVar153);
  fVar236 = auVar23._0_4_;
  fVar247 = auVar23._4_4_;
  auVar28._4_4_ = fVar247 * auVar153._4_4_;
  auVar28._0_4_ = fVar236 * auVar153._0_4_;
  fVar248 = auVar23._8_4_;
  auVar28._8_4_ = fVar248 * auVar153._8_4_;
  fVar250 = auVar23._12_4_;
  auVar28._12_4_ = fVar250 * auVar153._12_4_;
  fVar252 = auVar23._16_4_;
  auVar28._16_4_ = fVar252 * auVar153._16_4_;
  fVar253 = auVar23._20_4_;
  auVar28._20_4_ = fVar253 * auVar153._20_4_;
  fVar254 = auVar23._24_4_;
  auVar28._24_4_ = fVar254 * auVar153._24_4_;
  auVar28._28_4_ = auVar24._28_4_;
  auVar153 = vsubps_avx(auVar298,auVar28);
  fVar236 = fVar236 + fVar236 * auVar153._0_4_;
  fVar247 = fVar247 + fVar247 * auVar153._4_4_;
  fVar248 = fVar248 + fVar248 * auVar153._8_4_;
  fVar250 = fVar250 + fVar250 * auVar153._12_4_;
  fVar252 = fVar252 + fVar252 * auVar153._16_4_;
  fVar253 = fVar253 + fVar253 * auVar153._20_4_;
  fVar254 = fVar254 + fVar254 * auVar153._24_4_;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar148 * 7 + 6);
  auVar260 = vpmovsxwd_avx(auVar260);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar148 * 7 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar200);
  auVar154._16_16_ = auVar200;
  auVar154._0_16_ = auVar260;
  auVar153 = vcvtdq2ps_avx(auVar154);
  auVar153 = vsubps_avx(auVar153,auVar276);
  auVar151._0_4_ = fVar210 * auVar153._0_4_;
  auVar151._4_4_ = fVar224 * auVar153._4_4_;
  auVar151._8_4_ = fVar226 * auVar153._8_4_;
  auVar151._12_4_ = fVar228 * auVar153._12_4_;
  auVar24._16_4_ = fVar230 * auVar153._16_4_;
  auVar24._0_16_ = auVar151;
  auVar24._20_4_ = fVar232 * auVar153._20_4_;
  auVar24._24_4_ = fVar234 * auVar153._24_4_;
  auVar24._28_4_ = auVar153._28_4_;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + lVar149 + 6);
  auVar260 = vpmovsxwd_avx(auVar194);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + lVar149 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar214);
  auVar288._16_16_ = auVar200;
  auVar288._0_16_ = auVar260;
  auVar153 = vcvtdq2ps_avx(auVar288);
  auVar153 = vsubps_avx(auVar153,auVar276);
  auVar212._0_4_ = fVar210 * auVar153._0_4_;
  auVar212._4_4_ = fVar224 * auVar153._4_4_;
  auVar212._8_4_ = fVar226 * auVar153._8_4_;
  auVar212._12_4_ = fVar228 * auVar153._12_4_;
  auVar29._16_4_ = fVar230 * auVar153._16_4_;
  auVar29._0_16_ = auVar212;
  auVar29._20_4_ = fVar232 * auVar153._20_4_;
  auVar29._24_4_ = fVar234 * auVar153._24_4_;
  auVar29._28_4_ = auVar25._28_4_ + auVar26._28_4_;
  lVar146 = (ulong)(byte)PVar18 * 0x10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar146 + 6);
  auVar260 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar146 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar11);
  lVar146 = lVar146 + uVar148 * -2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar146 + 6);
  auVar194 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar146 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar13);
  auVar277._16_16_ = auVar214;
  auVar277._0_16_ = auVar194;
  auVar153 = vcvtdq2ps_avx(auVar277);
  auVar153 = vsubps_avx(auVar153,auVar181);
  auVar273._0_4_ = fVar256 * auVar153._0_4_;
  auVar273._4_4_ = fVar266 * auVar153._4_4_;
  auVar273._8_4_ = fVar267 * auVar153._8_4_;
  auVar273._12_4_ = fVar268 * auVar153._12_4_;
  auVar25._16_4_ = fVar269 * auVar153._16_4_;
  auVar25._0_16_ = auVar273;
  auVar25._20_4_ = fVar270 * auVar153._20_4_;
  auVar25._24_4_ = fVar271 * auVar153._24_4_;
  auVar25._28_4_ = auVar153._28_4_;
  auVar289._16_16_ = auVar200;
  auVar289._0_16_ = auVar260;
  auVar153 = vcvtdq2ps_avx(auVar289);
  auVar153 = vsubps_avx(auVar153,auVar181);
  auVar180._0_4_ = fVar256 * auVar153._0_4_;
  auVar180._4_4_ = fVar266 * auVar153._4_4_;
  auVar180._8_4_ = fVar267 * auVar153._8_4_;
  auVar180._12_4_ = fVar268 * auVar153._12_4_;
  auVar23._16_4_ = fVar269 * auVar153._16_4_;
  auVar23._0_16_ = auVar180;
  auVar23._20_4_ = fVar270 * auVar153._20_4_;
  auVar23._24_4_ = fVar271 * auVar153._24_4_;
  auVar23._28_4_ = auVar153._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar144 + uVar148 + 6);
  auVar260 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar144 + uVar148 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar15);
  auVar262._16_16_ = auVar200;
  auVar262._0_16_ = auVar260;
  auVar153 = vcvtdq2ps_avx(auVar262);
  auVar153 = vsubps_avx(auVar153,auVar206);
  auVar259._0_4_ = fVar236 * auVar153._0_4_;
  auVar259._4_4_ = fVar247 * auVar153._4_4_;
  auVar259._8_4_ = fVar248 * auVar153._8_4_;
  auVar259._12_4_ = fVar250 * auVar153._12_4_;
  auVar30._16_4_ = fVar252 * auVar153._16_4_;
  auVar30._0_16_ = auVar259;
  auVar30._20_4_ = fVar253 * auVar153._20_4_;
  auVar30._24_4_ = fVar254 * auVar153._24_4_;
  auVar30._28_4_ = auVar153._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar148 * 0x17 + 6);
  auVar260 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar148 * 0x17 + 0xe);
  auVar200 = vpmovsxwd_avx(auVar17);
  auVar290._16_16_ = auVar200;
  auVar290._0_16_ = auVar260;
  auVar153 = vcvtdq2ps_avx(auVar290);
  auVar153 = vsubps_avx(auVar153,auVar206);
  auVar196._0_4_ = fVar236 * auVar153._0_4_;
  auVar196._4_4_ = fVar247 * auVar153._4_4_;
  auVar196._8_4_ = fVar248 * auVar153._8_4_;
  auVar196._12_4_ = fVar250 * auVar153._12_4_;
  auVar31._16_4_ = fVar252 * auVar153._16_4_;
  auVar31._0_16_ = auVar196;
  auVar31._20_4_ = fVar253 * auVar153._20_4_;
  auVar31._24_4_ = fVar254 * auVar153._24_4_;
  auVar31._28_4_ = auVar153._28_4_;
  auVar260 = vpminsd_avx(auVar24._16_16_,auVar29._16_16_);
  auVar200 = vpminsd_avx(auVar151,auVar212);
  auVar299._16_16_ = auVar260;
  auVar299._0_16_ = auVar200;
  auVar194 = auVar23._16_16_;
  auVar312 = ZEXT1664(auVar194);
  auVar260 = vpminsd_avx(auVar25._16_16_,auVar194);
  auVar200 = vpminsd_avx(auVar273,auVar180);
  auVar331._16_16_ = auVar260;
  auVar331._0_16_ = auVar200;
  auVar153 = vmaxps_avx(auVar299,auVar331);
  auVar260 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar200 = vpminsd_avx(auVar259,auVar196);
  auVar343._16_16_ = auVar260;
  auVar343._0_16_ = auVar200;
  uVar7 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar351._4_4_ = uVar7;
  auVar351._0_4_ = uVar7;
  auVar351._8_4_ = uVar7;
  auVar351._12_4_ = uVar7;
  auVar351._16_4_ = uVar7;
  auVar351._20_4_ = uVar7;
  auVar351._24_4_ = uVar7;
  auVar351._28_4_ = uVar7;
  auVar23 = vmaxps_avx(auVar343,auVar351);
  auVar153 = vmaxps_avx(auVar153,auVar23);
  local_80._4_4_ = auVar153._4_4_ * 0.99999964;
  local_80._0_4_ = auVar153._0_4_ * 0.99999964;
  local_80._8_4_ = auVar153._8_4_ * 0.99999964;
  local_80._12_4_ = auVar153._12_4_ * 0.99999964;
  local_80._16_4_ = auVar153._16_4_ * 0.99999964;
  local_80._20_4_ = auVar153._20_4_ * 0.99999964;
  local_80._24_4_ = auVar153._24_4_ * 0.99999964;
  local_80._28_4_ = auVar153._28_4_;
  auVar302 = ZEXT3264(local_80);
  auVar260 = vpmaxsd_avx(auVar24._16_16_,auVar29._16_16_);
  auVar200 = vpmaxsd_avx(auVar151,auVar212);
  auVar155._16_16_ = auVar260;
  auVar155._0_16_ = auVar200;
  auVar260 = vpmaxsd_avx(auVar25._16_16_,auVar194);
  auVar200 = vpmaxsd_avx(auVar273,auVar180);
  auVar182._16_16_ = auVar260;
  auVar182._0_16_ = auVar200;
  auVar153 = vminps_avx(auVar155,auVar182);
  auVar260 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar200 = vpmaxsd_avx(auVar259,auVar196);
  fVar210 = (ray->super_RayK<1>).tfar;
  auVar218._4_4_ = fVar210;
  auVar218._0_4_ = fVar210;
  auVar218._8_4_ = fVar210;
  auVar218._12_4_ = fVar210;
  auVar218._16_4_ = fVar210;
  auVar218._20_4_ = fVar210;
  auVar218._24_4_ = fVar210;
  auVar218._28_4_ = fVar210;
  auVar183._16_16_ = auVar260;
  auVar183._0_16_ = auVar200;
  auVar23 = vminps_avx(auVar183,auVar218);
  auVar153 = vminps_avx(auVar153,auVar23);
  auVar32._4_4_ = auVar153._4_4_ * 1.0000004;
  auVar32._0_4_ = auVar153._0_4_ * 1.0000004;
  auVar32._8_4_ = auVar153._8_4_ * 1.0000004;
  auVar32._12_4_ = auVar153._12_4_ * 1.0000004;
  auVar32._16_4_ = auVar153._16_4_ * 1.0000004;
  auVar32._20_4_ = auVar153._20_4_ * 1.0000004;
  auVar32._24_4_ = auVar153._24_4_ * 1.0000004;
  auVar32._28_4_ = auVar153._28_4_;
  auVar153 = vcmpps_avx(local_80,auVar32,2);
  auVar260 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar184._16_16_ = auVar260;
  auVar184._0_16_ = auVar260;
  auVar23 = vcvtdq2ps_avx(auVar184);
  auVar23 = vcmpps_avx(_DAT_02020f40,auVar23,1);
  auVar153 = vandps_avx(auVar153,auVar23);
  uVar143 = vmovmskps_avx(auVar153);
  if (uVar143 != 0) {
    uVar143 = uVar143 & 0xff;
    local_4c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_4c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    pPVar147 = prim;
    do {
      auVar153 = local_640;
      uVar148 = (ulong)uVar143;
      local_720 = auVar312._0_32_;
      local_700 = auVar302._0_32_;
      lVar146 = 0;
      if (uVar148 != 0) {
        for (; (uVar143 >> lVar146 & 1) == 0; lVar146 = lVar146 + 1) {
        }
      }
      uVar148 = uVar148 - 1 & uVar148;
      uVar143 = *(uint *)(pPVar147 + lVar146 * 4 + 6);
      lVar146 = lVar146 * 0x40;
      lVar149 = 0;
      if (uVar148 != 0) {
        for (; (uVar148 >> lVar149 & 1) == 0; lVar149 = lVar149 + 1) {
        }
      }
      uVar19 = *(uint *)(pPVar147 + 2);
      local_788 = (ulong)uVar19;
      pGVar21 = (context->scene->geometries).items[uVar19].ptr;
      _local_7c0 = *(undefined1 (*) [16])(prim + lVar146 + lVar118 + 0x16);
      if (((uVar148 != 0) && (uVar144 = uVar148 - 1 & uVar148, uVar144 != 0)) &&
         (lVar149 = 0, uVar144 != 0)) {
        for (; (uVar144 >> lVar149 & 1) == 0; lVar149 = lVar149 + 1) {
        }
      }
      _local_600 = *(undefined1 (*) [16])(prim + lVar146 + lVar118 + 0x26);
      _local_530 = *(undefined1 (*) [16])(prim + lVar146 + lVar118 + 0x36);
      _local_540 = *(undefined1 (*) [16])(prim + lVar146 + lVar118 + 0x46);
      uVar20 = (uint)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar9 = (ray->super_RayK<1>).org.field_0;
      auVar194 = vsubps_avx(_local_7c0,(undefined1  [16])aVar9);
      auVar12 = _local_7c0;
      auVar260 = vshufps_avx(auVar194,auVar194,0);
      auVar200 = vshufps_avx(auVar194,auVar194,0x55);
      auVar194 = vshufps_avx(auVar194,auVar194,0xaa);
      fVar210 = (pre->ray_space).vx.field_0.m128[0];
      fVar224 = (pre->ray_space).vx.field_0.m128[1];
      fVar226 = (pre->ray_space).vx.field_0.m128[2];
      fVar228 = (pre->ray_space).vx.field_0.m128[3];
      fVar230 = (pre->ray_space).vy.field_0.m128[0];
      fVar232 = (pre->ray_space).vy.field_0.m128[1];
      fVar234 = (pre->ray_space).vy.field_0.m128[2];
      fVar236 = (pre->ray_space).vy.field_0.m128[3];
      fVar247 = (pre->ray_space).vz.field_0.m128[0];
      fVar248 = (pre->ray_space).vz.field_0.m128[1];
      fVar250 = (pre->ray_space).vz.field_0.m128[2];
      fVar252 = (pre->ray_space).vz.field_0.m128[3];
      auVar237._0_4_ =
           auVar260._0_4_ * fVar210 + auVar194._0_4_ * fVar247 + auVar200._0_4_ * fVar230;
      auVar237._4_4_ =
           auVar260._4_4_ * fVar224 + auVar194._4_4_ * fVar248 + auVar200._4_4_ * fVar232;
      auVar237._8_4_ =
           auVar260._8_4_ * fVar226 + auVar194._8_4_ * fVar250 + auVar200._8_4_ * fVar234;
      auVar237._12_4_ =
           auVar260._12_4_ * fVar228 + auVar194._12_4_ * fVar252 + auVar200._12_4_ * fVar236;
      auVar260 = vblendps_avx(auVar237,_local_7c0,8);
      auVar13 = _local_600;
      auVar214 = vsubps_avx(_local_600,(undefined1  [16])aVar9);
      auVar200 = vshufps_avx(auVar214,auVar214,0);
      auVar194 = vshufps_avx(auVar214,auVar214,0x55);
      auVar214 = vshufps_avx(auVar214,auVar214,0xaa);
      auVar238._0_8_ =
           CONCAT44(auVar200._4_4_ * fVar224 + auVar194._4_4_ * fVar232 + auVar214._4_4_ * fVar248,
                    auVar200._0_4_ * fVar210 + auVar194._0_4_ * fVar230 + auVar214._0_4_ * fVar247);
      auVar238._8_4_ =
           auVar200._8_4_ * fVar226 + auVar194._8_4_ * fVar234 + auVar214._8_4_ * fVar250;
      auVar238._12_4_ =
           auVar200._12_4_ * fVar228 + auVar194._12_4_ * fVar236 + auVar214._12_4_ * fVar252;
      auVar200 = vblendps_avx(auVar238,_local_600,8);
      auVar10 = vsubps_avx(_local_530,(undefined1  [16])aVar9);
      auVar194 = vshufps_avx(auVar10,auVar10,0);
      auVar214 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar239._0_4_ = auVar194._0_4_ * fVar210 + auVar214._0_4_ * fVar230 + auVar10._0_4_ * fVar247
      ;
      auVar239._4_4_ = auVar194._4_4_ * fVar224 + auVar214._4_4_ * fVar232 + auVar10._4_4_ * fVar248
      ;
      auVar239._8_4_ = auVar194._8_4_ * fVar226 + auVar214._8_4_ * fVar234 + auVar10._8_4_ * fVar250
      ;
      auVar239._12_4_ =
           auVar194._12_4_ * fVar228 + auVar214._12_4_ * fVar236 + auVar10._12_4_ * fVar252;
      auVar194 = vblendps_avx(auVar239,_local_530,8);
      auVar11 = vsubps_avx(_local_540,(undefined1  [16])aVar9);
      auVar214 = vshufps_avx(auVar11,auVar11,0);
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar274._0_4_ = auVar214._0_4_ * fVar210 + auVar11._0_4_ * fVar247 + auVar10._0_4_ * fVar230;
      auVar274._4_4_ = auVar214._4_4_ * fVar224 + auVar11._4_4_ * fVar248 + auVar10._4_4_ * fVar232;
      auVar274._8_4_ = auVar214._8_4_ * fVar226 + auVar11._8_4_ * fVar250 + auVar10._8_4_ * fVar234;
      auVar274._12_4_ =
           auVar214._12_4_ * fVar228 + auVar11._12_4_ * fVar252 + auVar10._12_4_ * fVar236;
      auVar214 = vblendps_avx(auVar274,_local_540,8);
      auVar213._8_4_ = 0x7fffffff;
      auVar213._0_8_ = 0x7fffffff7fffffff;
      auVar213._12_4_ = 0x7fffffff;
      auVar260 = vandps_avx(auVar260,auVar213);
      auVar200 = vandps_avx(auVar200,auVar213);
      auVar10 = vmaxps_avx(auVar260,auVar200);
      auVar260 = vandps_avx(auVar194,auVar213);
      auVar200 = vandps_avx(auVar214,auVar213);
      auVar260 = vmaxps_avx(auVar260,auVar200);
      auVar260 = vmaxps_avx(auVar10,auVar260);
      auVar200 = vmovshdup_avx(auVar260);
      auVar200 = vmaxss_avx(auVar200,auVar260);
      auVar260 = vshufpd_avx(auVar260,auVar260,1);
      auVar260 = vmaxss_avx(auVar260,auVar200);
      local_640._0_4_ = auVar260._0_4_;
      lVar146 = (long)(int)uVar20 * 0x44;
      fVar210 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar146 + 0x908);
      fVar224 = *(float *)(bezier_basis0 + lVar146 + 0x90c);
      fVar226 = *(float *)(bezier_basis0 + lVar146 + 0x910);
      fVar228 = *(float *)(bezier_basis0 + lVar146 + 0x914);
      fVar230 = *(float *)(bezier_basis0 + lVar146 + 0x918);
      fVar232 = *(float *)(bezier_basis0 + lVar146 + 0x91c);
      fVar234 = *(float *)(bezier_basis0 + lVar146 + 0x920);
      auVar135 = *(undefined1 (*) [28])(bezier_basis0 + lVar146 + 0x908);
      auVar200 = vshufps_avx(auVar239,auVar239,0);
      register0x00001250 = auVar200;
      _local_560 = auVar200;
      auVar194 = vshufps_avx(auVar239,auVar239,0x55);
      register0x00001350 = auVar194;
      _local_5c0 = auVar194;
      fVar236 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar146 + 0xd8c);
      fVar247 = *(float *)(bezier_basis0 + lVar146 + 0xd90);
      fVar248 = *(float *)(bezier_basis0 + lVar146 + 0xd94);
      fVar250 = *(float *)(bezier_basis0 + lVar146 + 0xd98);
      fVar252 = *(float *)(bezier_basis0 + lVar146 + 0xd9c);
      fVar253 = *(float *)(bezier_basis0 + lVar146 + 0xda0);
      fVar254 = *(float *)(bezier_basis0 + lVar146 + 0xda4);
      auVar134 = *(undefined1 (*) [28])(bezier_basis0 + lVar146 + 0xd8c);
      auVar214 = vshufps_avx(auVar274,auVar274,0);
      register0x000015d0 = auVar214;
      _local_3e0 = auVar214;
      auVar10 = vshufps_avx(auVar274,auVar274,0x55);
      register0x00001390 = auVar10;
      _local_6e0 = auVar10;
      fVar356 = auVar214._0_4_;
      fVar359 = auVar214._4_4_;
      fVar360 = auVar214._8_4_;
      fVar361 = auVar214._12_4_;
      fVar172 = auVar200._0_4_;
      fVar174 = auVar200._4_4_;
      fVar176 = auVar200._8_4_;
      fVar178 = auVar200._12_4_;
      fVar272 = auVar10._0_4_;
      fVar281 = auVar10._4_4_;
      fVar282 = auVar10._8_4_;
      fVar283 = auVar10._12_4_;
      fVar257 = auVar194._0_4_;
      fVar150 = auVar194._4_4_;
      fVar168 = auVar194._8_4_;
      fVar170 = auVar194._12_4_;
      auVar14 = _local_530;
      auVar200 = vshufps_avx(_local_530,_local_530,0xff);
      register0x00001490 = auVar200;
      _local_140 = auVar200;
      auVar11 = _local_540;
      auVar194 = vshufps_avx(_local_540,_local_540,0xff);
      register0x00001410 = auVar194;
      _local_160 = auVar194;
      fVar255 = auVar194._0_4_;
      fVar249 = auVar194._4_4_;
      fVar251 = auVar194._8_4_;
      fVar297 = auVar194._12_4_;
      fVar318 = auVar200._0_4_;
      fVar320 = auVar200._4_4_;
      fVar322 = auVar200._8_4_;
      auVar125._8_4_ = auVar238._8_4_;
      auVar125._0_8_ = auVar238._0_8_;
      auVar125._12_4_ = auVar238._12_4_;
      auVar194 = vshufps_avx(auVar125,auVar125,0);
      register0x00001550 = auVar194;
      _local_a0 = auVar194;
      fVar256 = *(float *)(bezier_basis0 + lVar146 + 0x484);
      fVar266 = *(float *)(bezier_basis0 + lVar146 + 0x488);
      fVar267 = *(float *)(bezier_basis0 + lVar146 + 0x48c);
      fVar268 = *(float *)(bezier_basis0 + lVar146 + 0x490);
      fVar269 = *(float *)(bezier_basis0 + lVar146 + 0x494);
      fVar270 = *(float *)(bezier_basis0 + lVar146 + 0x498);
      fVar271 = *(float *)(bezier_basis0 + lVar146 + 0x49c);
      fVar342 = auVar194._0_4_;
      fVar346 = auVar194._4_4_;
      fVar347 = auVar194._8_4_;
      fVar348 = auVar194._12_4_;
      auVar194 = vshufps_avx(auVar125,auVar125,0x55);
      register0x00001350 = auVar194;
      _local_1c0 = auVar194;
      fVar231 = auVar194._0_4_;
      fVar233 = auVar194._4_4_;
      fVar304 = auVar194._8_4_;
      fVar284 = auVar194._12_4_;
      auVar194 = vpermilps_avx(_local_600,0xff);
      register0x00001590 = auVar194;
      _local_c0 = auVar194;
      fVar349 = auVar194._0_4_;
      fVar350 = auVar194._4_4_;
      fVar353 = auVar194._8_4_;
      fVar354 = auVar194._12_4_;
      auVar194 = vshufps_avx(auVar237,auVar237,0);
      local_1e0._16_16_ = auVar194;
      local_1e0._0_16_ = auVar194;
      fVar333 = *(float *)(bezier_basis0 + lVar146);
      fVar171 = *(float *)(bezier_basis0 + lVar146 + 4);
      fVar173 = *(float *)(bezier_basis0 + lVar146 + 8);
      fVar175 = *(float *)(bezier_basis0 + lVar146 + 0xc);
      fStack_450 = *(float *)(bezier_basis0 + lVar146 + 0x10);
      fStack_44c = *(float *)(bezier_basis0 + lVar146 + 0x14);
      fStack_448 = *(float *)(bezier_basis0 + lVar146 + 0x18);
      fVar211 = auVar194._0_4_;
      fVar225 = auVar194._4_4_;
      fVar227 = auVar194._8_4_;
      fVar229 = auVar194._12_4_;
      auVar332._0_4_ = fVar211 * fVar333 + fVar342 * fVar256 + fVar172 * fVar210 + fVar356 * fVar236
      ;
      auVar332._4_4_ = fVar225 * fVar171 + fVar346 * fVar266 + fVar174 * fVar224 + fVar359 * fVar247
      ;
      auVar332._8_4_ = fVar227 * fVar173 + fVar347 * fVar267 + fVar176 * fVar226 + fVar360 * fVar248
      ;
      auVar332._12_4_ =
           fVar229 * fVar175 + fVar348 * fVar268 + fVar178 * fVar228 + fVar361 * fVar250;
      auVar332._16_4_ =
           fVar211 * fStack_450 + fVar342 * fVar269 + fVar172 * fVar230 + fVar356 * fVar252;
      auVar332._20_4_ =
           fVar225 * fStack_44c + fVar346 * fVar270 + fVar174 * fVar232 + fVar359 * fVar253;
      auVar332._24_4_ =
           fVar227 * fStack_448 + fVar347 * fVar271 + fVar176 * fVar234 + fVar360 * fVar254;
      auVar332._28_4_ = fVar178 + 0.0 + 0.0 + 0.0;
      auVar194 = vshufps_avx(auVar237,auVar237,0x55);
      register0x00001510 = auVar194;
      _local_200 = auVar194;
      fVar324 = auVar194._0_4_;
      fVar339 = auVar194._4_4_;
      fVar340 = auVar194._8_4_;
      fVar341 = auVar194._12_4_;
      auVar278._0_4_ = fVar324 * fVar333 + fVar231 * fVar256 + fVar257 * fVar210 + fVar272 * fVar236
      ;
      auVar278._4_4_ = fVar339 * fVar171 + fVar233 * fVar266 + fVar150 * fVar224 + fVar281 * fVar247
      ;
      auVar278._8_4_ = fVar340 * fVar173 + fVar304 * fVar267 + fVar168 * fVar226 + fVar282 * fVar248
      ;
      auVar278._12_4_ =
           fVar341 * fVar175 + fVar284 * fVar268 + fVar170 * fVar228 + fVar283 * fVar250;
      auVar278._16_4_ =
           fVar324 * fStack_450 + fVar231 * fVar269 + fVar257 * fVar230 + fVar272 * fVar252;
      auVar278._20_4_ =
           fVar339 * fStack_44c + fVar233 * fVar270 + fVar150 * fVar232 + fVar281 * fVar253;
      auVar278._24_4_ =
           fVar340 * fStack_448 + fVar304 * fVar271 + fVar168 * fVar234 + fVar282 * fVar254;
      auVar278._28_4_ = fVar178 + 0.0 + 0.0 + 0.0;
      auVar194 = vpermilps_avx(_local_7c0,0xff);
      register0x00001450 = auVar194;
      _local_180 = auVar194;
      fStack_444 = *(float *)(bezier_basis0 + lVar146 + 0x1c);
      fVar305 = auVar194._0_4_;
      fVar313 = auVar194._4_4_;
      fVar315 = auVar194._8_4_;
      local_780._0_4_ =
           fVar305 * fVar333 + fVar349 * fVar256 + fVar318 * fVar210 + fVar255 * fVar236;
      local_780._4_4_ =
           fVar313 * fVar171 + fVar350 * fVar266 + fVar320 * fVar224 + fVar249 * fVar247;
      fStack_778 = fVar315 * fVar173 + fVar353 * fVar267 + fVar322 * fVar226 + fVar251 * fVar248;
      fStack_774 = auVar194._12_4_ * fVar175 +
                   fVar354 * fVar268 + auVar200._12_4_ * fVar228 + fVar297 * fVar250;
      fStack_770 = fVar305 * fStack_450 + fVar349 * fVar269 + fVar318 * fVar230 + fVar255 * fVar252;
      fStack_76c = fVar313 * fStack_44c + fVar350 * fVar270 + fVar320 * fVar232 + fVar249 * fVar253;
      fStack_768 = fVar315 * fStack_448 + fVar353 * fVar271 + fVar322 * fVar234 + fVar251 * fVar254;
      fStack_764 = *(float *)(bezier_basis0 + lVar146 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar236 = *(float *)(bezier_basis1 + lVar146 + 0x908);
      fVar247 = *(float *)(bezier_basis1 + lVar146 + 0x90c);
      fVar248 = *(float *)(bezier_basis1 + lVar146 + 0x910);
      fVar250 = *(float *)(bezier_basis1 + lVar146 + 0x914);
      fVar252 = *(float *)(bezier_basis1 + lVar146 + 0x918);
      fVar253 = *(float *)(bezier_basis1 + lVar146 + 0x91c);
      fVar254 = *(float *)(bezier_basis1 + lVar146 + 0x920);
      fVar210 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar146 + 0xd8c);
      fVar224 = *(float *)(bezier_basis1 + lVar146 + 0xd90);
      fVar226 = *(float *)(bezier_basis1 + lVar146 + 0xd94);
      fVar228 = *(float *)(bezier_basis1 + lVar146 + 0xd98);
      fVar230 = *(float *)(bezier_basis1 + lVar146 + 0xd9c);
      fVar232 = *(float *)(bezier_basis1 + lVar146 + 0xda0);
      fVar234 = *(float *)(bezier_basis1 + lVar146 + 0xda4);
      auVar136 = *(undefined1 (*) [28])(bezier_basis1 + lVar146 + 0xd8c);
      fVar177 = *(float *)(bezier_basis1 + lVar146 + 0x484);
      fVar306 = *(float *)(bezier_basis1 + lVar146 + 0x488);
      fVar314 = *(float *)(bezier_basis1 + lVar146 + 0x48c);
      fVar316 = *(float *)(bezier_basis1 + lVar146 + 0x490);
      fVar317 = *(float *)(bezier_basis1 + lVar146 + 0x494);
      fVar319 = *(float *)(bezier_basis1 + lVar146 + 0x498);
      fVar321 = *(float *)(bezier_basis1 + lVar146 + 0x49c);
      fVar209 = fVar348 + 0.0;
      fVar323 = *(float *)(bezier_basis1 + lVar146);
      fVar303 = *(float *)(bezier_basis1 + lVar146 + 4);
      fVar235 = *(float *)(bezier_basis1 + lVar146 + 8);
      fVar195 = *(float *)(bezier_basis1 + lVar146 + 0xc);
      fVar325 = *(float *)(bezier_basis1 + lVar146 + 0x10);
      fVar167 = *(float *)(bezier_basis1 + lVar146 + 0x14);
      fVar169 = *(float *)(bezier_basis1 + lVar146 + 0x18);
      auVar241._0_4_ = fVar323 * fVar211 + fVar342 * fVar177 + fVar236 * fVar172 + fVar356 * fVar210
      ;
      auVar241._4_4_ = fVar303 * fVar225 + fVar346 * fVar306 + fVar247 * fVar174 + fVar359 * fVar224
      ;
      auVar241._8_4_ = fVar235 * fVar227 + fVar347 * fVar314 + fVar248 * fVar176 + fVar360 * fVar226
      ;
      auVar241._12_4_ =
           fVar195 * fVar229 + fVar348 * fVar316 + fVar250 * fVar178 + fVar361 * fVar228;
      auVar241._16_4_ =
           fVar325 * fVar211 + fVar342 * fVar317 + fVar252 * fVar172 + fVar356 * fVar230;
      auVar241._20_4_ =
           fVar167 * fVar225 + fVar346 * fVar319 + fVar253 * fVar174 + fVar359 * fVar232;
      auVar241._24_4_ =
           fVar169 * fVar227 + fVar347 * fVar321 + fVar254 * fVar176 + fVar360 * fVar234;
      auVar241._28_4_ = fVar354 + fVar209;
      local_220._0_4_ =
           fVar324 * fVar323 + fVar231 * fVar177 + fVar236 * fVar257 + fVar210 * fVar272;
      local_220._4_4_ =
           fVar339 * fVar303 + fVar233 * fVar306 + fVar247 * fVar150 + fVar224 * fVar281;
      fStack_218 = fVar340 * fVar235 + fVar304 * fVar314 + fVar248 * fVar168 + fVar226 * fVar282;
      fStack_214 = fVar341 * fVar195 + fVar284 * fVar316 + fVar250 * fVar170 + fVar228 * fVar283;
      fStack_210 = fVar324 * fVar325 + fVar231 * fVar317 + fVar252 * fVar257 + fVar230 * fVar272;
      fStack_20c = fVar339 * fVar167 + fVar233 * fVar319 + fVar253 * fVar150 + fVar232 * fVar281;
      fStack_208 = fVar340 * fVar169 + fVar304 * fVar321 + fVar254 * fVar168 + fVar234 * fVar282;
      register0x000012dc = fVar209 + fVar348 + 0.0;
      local_6a0._0_4_ =
           fVar349 * fVar177 + fVar318 * fVar236 + fVar255 * fVar210 + fVar305 * fVar323;
      local_6a0._4_4_ =
           fVar350 * fVar306 + fVar320 * fVar247 + fVar249 * fVar224 + fVar313 * fVar303;
      fStack_698 = fVar353 * fVar314 + fVar322 * fVar248 + fVar251 * fVar226 + fVar315 * fVar235;
      fStack_694 = fVar354 * fVar316 + auVar200._12_4_ * fVar250 + fVar297 * fVar228 +
                   auVar194._12_4_ * fVar195;
      register0x000015d0 =
           fVar349 * fVar317 + fVar318 * fVar252 + fVar255 * fVar230 + fVar305 * fVar325;
      register0x000015d4 =
           fVar350 * fVar319 + fVar320 * fVar253 + fVar249 * fVar232 + fVar313 * fVar167;
      register0x000015d8 =
           fVar353 * fVar321 + fVar322 * fVar254 + fVar251 * fVar234 + fVar315 * fVar169;
      register0x000015dc = fVar348 + fVar297 + 0.0 + fVar209;
      auVar25 = vsubps_avx(auVar241,auVar332);
      auVar26 = vsubps_avx(_local_220,auVar278);
      fVar255 = auVar25._0_4_;
      fVar249 = auVar25._4_4_;
      auVar33._4_4_ = fVar249 * auVar278._4_4_;
      auVar33._0_4_ = fVar255 * auVar278._0_4_;
      fVar251 = auVar25._8_4_;
      auVar33._8_4_ = fVar251 * auVar278._8_4_;
      fVar297 = auVar25._12_4_;
      auVar33._12_4_ = fVar297 * auVar278._12_4_;
      fVar305 = auVar25._16_4_;
      auVar33._16_4_ = fVar305 * auVar278._16_4_;
      fVar313 = auVar25._20_4_;
      auVar33._20_4_ = fVar313 * auVar278._20_4_;
      fVar315 = auVar25._24_4_;
      auVar33._24_4_ = fVar315 * auVar278._24_4_;
      auVar33._28_4_ = fVar209;
      fVar210 = auVar26._0_4_;
      fVar224 = auVar26._4_4_;
      auVar34._4_4_ = auVar332._4_4_ * fVar224;
      auVar34._0_4_ = auVar332._0_4_ * fVar210;
      fVar226 = auVar26._8_4_;
      auVar34._8_4_ = auVar332._8_4_ * fVar226;
      fVar228 = auVar26._12_4_;
      auVar34._12_4_ = auVar332._12_4_ * fVar228;
      fVar230 = auVar26._16_4_;
      auVar34._16_4_ = auVar332._16_4_ * fVar230;
      fVar232 = auVar26._20_4_;
      auVar34._20_4_ = auVar332._20_4_ * fVar232;
      fVar234 = auVar26._24_4_;
      auVar34._24_4_ = auVar332._24_4_ * fVar234;
      auVar34._28_4_ = register0x000012dc;
      auVar24 = vsubps_avx(auVar33,auVar34);
      auVar23 = vmaxps_avx(_local_780,_local_6a0);
      auVar35._4_4_ = auVar23._4_4_ * auVar23._4_4_ * (fVar249 * fVar249 + fVar224 * fVar224);
      auVar35._0_4_ = auVar23._0_4_ * auVar23._0_4_ * (fVar255 * fVar255 + fVar210 * fVar210);
      auVar35._8_4_ = auVar23._8_4_ * auVar23._8_4_ * (fVar251 * fVar251 + fVar226 * fVar226);
      auVar35._12_4_ = auVar23._12_4_ * auVar23._12_4_ * (fVar297 * fVar297 + fVar228 * fVar228);
      auVar35._16_4_ = auVar23._16_4_ * auVar23._16_4_ * (fVar305 * fVar305 + fVar230 * fVar230);
      auVar35._20_4_ = auVar23._20_4_ * auVar23._20_4_ * (fVar313 * fVar313 + fVar232 * fVar232);
      auVar35._24_4_ = auVar23._24_4_ * auVar23._24_4_ * (fVar315 * fVar315 + fVar234 * fVar234);
      auVar35._28_4_ = auVar26._28_4_ + register0x000012dc;
      auVar36._4_4_ = auVar24._4_4_ * auVar24._4_4_;
      auVar36._0_4_ = auVar24._0_4_ * auVar24._0_4_;
      auVar36._8_4_ = auVar24._8_4_ * auVar24._8_4_;
      auVar36._12_4_ = auVar24._12_4_ * auVar24._12_4_;
      auVar36._16_4_ = auVar24._16_4_ * auVar24._16_4_;
      auVar36._20_4_ = auVar24._20_4_ * auVar24._20_4_;
      auVar36._24_4_ = auVar24._24_4_ * auVar24._24_4_;
      auVar36._28_4_ = auVar24._28_4_;
      auVar23 = vcmpps_avx(auVar36,auVar35,2);
      auVar200 = ZEXT416((uint)(float)(int)uVar20);
      _local_400 = auVar200;
      auVar200 = vshufps_avx(auVar200,auVar200,0);
      auVar219._16_16_ = auVar200;
      auVar219._0_16_ = auVar200;
      auVar24 = vcmpps_avx(_DAT_02020f40,auVar219,1);
      auVar223 = ZEXT3264(auVar24);
      auVar200 = vpermilps_avx(auVar237,0xaa);
      register0x00001450 = auVar200;
      _local_4e0 = auVar200;
      auVar126._8_4_ = auVar238._8_4_;
      auVar126._0_8_ = auVar238._0_8_;
      auVar126._12_4_ = auVar238._12_4_;
      auVar194 = vpermilps_avx(auVar126,0xaa);
      register0x00001550 = auVar194;
      _local_1a0 = auVar194;
      auVar214 = vpermilps_avx(auVar239,0xaa);
      register0x00001590 = auVar214;
      _local_e0 = auVar214;
      auVar10 = vpermilps_avx(auVar274,0xaa);
      register0x00001310 = auVar10;
      _local_580 = auVar10;
      auVar27 = auVar24 & auVar23;
      local_620 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fStack_61c = 0.0;
      fStack_618 = 0.0;
      fStack_614 = 0.0;
      auVar260 = ZEXT416((uint)(auVar260._0_4_ * 4.7683716e-07));
      fVar210 = fVar257;
      fVar224 = fVar150;
      fVar226 = fVar168;
      fVar228 = fVar272;
      fVar230 = fVar281;
      fVar232 = fVar282;
      fVar234 = fVar283;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar302 = ZEXT3264(local_700);
        auVar312 = ZEXT3264(local_720);
      }
      else {
        local_240 = vandps_avx(auVar23,auVar24);
        fVar297 = auVar200._0_4_;
        fVar305 = auVar200._4_4_;
        fVar313 = auVar200._8_4_;
        fVar315 = auVar200._12_4_;
        fVar318 = auVar194._0_4_;
        fVar320 = auVar194._4_4_;
        fVar322 = auVar194._8_4_;
        fVar349 = auVar194._12_4_;
        fVar350 = auVar214._0_4_;
        fVar353 = auVar214._4_4_;
        fVar354 = auVar214._8_4_;
        fVar355 = auVar214._12_4_;
        local_480._0_4_ = auVar136._0_4_;
        local_480._4_4_ = auVar136._4_4_;
        fStack_478 = auVar136._8_4_;
        fStack_474 = auVar136._12_4_;
        fStack_470 = auVar136._16_4_;
        fStack_46c = auVar136._20_4_;
        fStack_468 = auVar136._24_4_;
        fVar209 = auVar10._0_4_;
        fVar255 = auVar10._4_4_;
        fVar249 = auVar10._8_4_;
        fVar251 = auVar10._12_4_;
        local_480._0_4_ =
             fVar297 * fVar323 +
             fVar318 * fVar177 + fVar350 * fVar236 + fVar209 * (float)local_480._0_4_;
        local_480._4_4_ =
             fVar305 * fVar303 +
             fVar320 * fVar306 + fVar353 * fVar247 + fVar255 * (float)local_480._4_4_;
        fStack_478 = fVar313 * fVar235 +
                     fVar322 * fVar314 + fVar354 * fVar248 + fVar249 * fStack_478;
        fStack_474 = fVar315 * fVar195 +
                     fVar349 * fVar316 + fVar355 * fVar250 + fVar251 * fStack_474;
        fStack_470 = fVar297 * fVar325 +
                     fVar318 * fVar317 + fVar350 * fVar252 + fVar209 * fStack_470;
        fStack_46c = fVar305 * fVar167 +
                     fVar320 * fVar319 + fVar353 * fVar253 + fVar255 * fStack_46c;
        fStack_468 = fVar313 * fVar169 +
                     fVar322 * fVar321 + fVar354 * fVar254 + fVar249 * fStack_468;
        fStack_464 = local_240._28_4_ +
                     auVar24._28_4_ + *(float *)(bezier_basis1 + lVar146 + 0x924) + 0.0;
        local_440._0_4_ = auVar135._0_4_;
        local_440._4_4_ = auVar135._4_4_;
        fStack_438 = auVar135._8_4_;
        fStack_434 = auVar135._12_4_;
        fStack_430 = auVar135._16_4_;
        fStack_42c = auVar135._20_4_;
        fStack_428 = auVar135._24_4_;
        local_5a0._0_4_ = auVar134._0_4_;
        local_5a0._4_4_ = auVar134._4_4_;
        fStack_598 = auVar134._8_4_;
        fStack_594 = auVar134._12_4_;
        fStack_590 = auVar134._16_4_;
        fStack_58c = auVar134._20_4_;
        fStack_588 = auVar134._24_4_;
        local_440._0_4_ =
             fVar297 * fVar333 +
             fVar318 * fVar256 + fVar350 * (float)local_440._0_4_ + fVar209 * (float)local_5a0._0_4_
        ;
        local_440._4_4_ =
             fVar305 * fVar171 +
             fVar320 * fVar266 + fVar353 * (float)local_440._4_4_ + fVar255 * (float)local_5a0._4_4_
        ;
        fStack_438 = fVar313 * fVar173 +
                     fVar322 * fVar267 + fVar354 * fStack_438 + fVar249 * fStack_598;
        fStack_434 = fVar315 * fVar175 +
                     fVar349 * fVar268 + fVar355 * fStack_434 + fVar251 * fStack_594;
        fStack_430 = fVar297 * fStack_450 +
                     fVar318 * fVar269 + fVar350 * fStack_430 + fVar209 * fStack_590;
        fStack_42c = fVar305 * fStack_44c +
                     fVar320 * fVar270 + fVar353 * fStack_42c + fVar255 * fStack_58c;
        fStack_428 = fVar313 * fStack_448 +
                     fVar322 * fVar271 + fVar354 * fStack_428 + fVar249 * fStack_588;
        fStack_424 = fVar341 + fStack_464 + local_240._28_4_ + auVar24._28_4_;
        fVar236 = *(float *)(bezier_basis0 + lVar146 + 0x1210);
        fVar247 = *(float *)(bezier_basis0 + lVar146 + 0x1214);
        fVar248 = *(float *)(bezier_basis0 + lVar146 + 0x1218);
        fVar250 = *(float *)(bezier_basis0 + lVar146 + 0x121c);
        fVar252 = *(float *)(bezier_basis0 + lVar146 + 0x1220);
        fVar253 = *(float *)(bezier_basis0 + lVar146 + 0x1224);
        fVar254 = *(float *)(bezier_basis0 + lVar146 + 0x1228);
        fVar256 = *(float *)(bezier_basis0 + lVar146 + 0x1694);
        fVar266 = *(float *)(bezier_basis0 + lVar146 + 0x1698);
        fVar267 = *(float *)(bezier_basis0 + lVar146 + 0x169c);
        fVar268 = *(float *)(bezier_basis0 + lVar146 + 0x16a0);
        fVar269 = *(float *)(bezier_basis0 + lVar146 + 0x16a4);
        fVar270 = *(float *)(bezier_basis0 + lVar146 + 0x16a8);
        fVar271 = *(float *)(bezier_basis0 + lVar146 + 0x16ac);
        fVar333 = *(float *)(bezier_basis0 + lVar146 + 0x1b18);
        fVar171 = *(float *)(bezier_basis0 + lVar146 + 0x1b1c);
        fVar173 = *(float *)(bezier_basis0 + lVar146 + 0x1b20);
        fVar175 = *(float *)(bezier_basis0 + lVar146 + 0x1b24);
        fVar177 = *(float *)(bezier_basis0 + lVar146 + 0x1b28);
        fVar306 = *(float *)(bezier_basis0 + lVar146 + 0x1b2c);
        fVar314 = *(float *)(bezier_basis0 + lVar146 + 0x1b30);
        fVar316 = *(float *)(bezier_basis0 + lVar146 + 0x1f9c);
        fVar317 = *(float *)(bezier_basis0 + lVar146 + 0x1fa0);
        fVar319 = *(float *)(bezier_basis0 + lVar146 + 0x1fa4);
        fVar321 = *(float *)(bezier_basis0 + lVar146 + 0x1fa8);
        fVar323 = *(float *)(bezier_basis0 + lVar146 + 0x1fac);
        fVar303 = *(float *)(bezier_basis0 + lVar146 + 0x1fb0);
        fVar235 = *(float *)(bezier_basis0 + lVar146 + 0x1fb4);
        local_640._16_16_ = auVar153._16_16_;
        local_640._0_16_ = auVar260;
        fVar195 = *(float *)(bezier_basis0 + lVar146 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar146 + 0x1fb8);
        fVar325 = *(float *)(bezier_basis0 + lVar146 + 0x16b0) + fVar195;
        local_520 = fVar211 * fVar236 + fVar342 * fVar256 + fVar172 * fVar333 + fVar356 * fVar316;
        fStack_51c = fVar225 * fVar247 + fVar346 * fVar266 + fVar174 * fVar171 + fVar359 * fVar317;
        fStack_518 = fVar227 * fVar248 + fVar347 * fVar267 + fVar176 * fVar173 + fVar360 * fVar319;
        fStack_514 = fVar229 * fVar250 + fVar348 * fVar268 + fVar178 * fVar175 + fVar361 * fVar321;
        fStack_510 = fVar211 * fVar252 + fVar342 * fVar269 + fVar172 * fVar177 + fVar356 * fVar323;
        fStack_50c = fVar225 * fVar253 + fVar346 * fVar270 + fVar174 * fVar306 + fVar359 * fVar303;
        fStack_508 = fVar227 * fVar254 + fVar347 * fVar271 + fVar176 * fVar314 + fVar360 * fVar235;
        fStack_504 = *(float *)(bezier_basis0 + lVar146 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar146 + 0x1fb8) +
                     fVar315 + *(float *)(bezier_basis1 + lVar146 + 0x4a0);
        auVar291._0_4_ =
             fVar324 * fVar236 + fVar257 * fVar333 + fVar272 * fVar316 + fVar231 * fVar256;
        auVar291._4_4_ =
             fVar339 * fVar247 + fVar150 * fVar171 + fVar281 * fVar317 + fVar233 * fVar266;
        auVar291._8_4_ =
             fVar340 * fVar248 + fVar168 * fVar173 + fVar282 * fVar319 + fVar304 * fVar267;
        auVar291._12_4_ =
             fVar341 * fVar250 + fVar170 * fVar175 + fVar283 * fVar321 + fVar284 * fVar268;
        auVar291._16_4_ =
             fVar324 * fVar252 + fVar257 * fVar177 + fVar272 * fVar323 + fVar231 * fVar269;
        auVar291._20_4_ =
             fVar339 * fVar253 + fVar150 * fVar306 + fVar281 * fVar303 + fVar233 * fVar270;
        auVar291._24_4_ =
             fVar340 * fVar254 + fVar168 * fVar314 + fVar282 * fVar235 + fVar304 * fVar271;
        auVar291._28_4_ =
             fVar195 + fVar315 + *(float *)(bezier_basis1 + lVar146 + 0x1c) +
                       fVar315 + *(float *)(bezier_basis1 + lVar146 + 0x4a0);
        local_460 = fVar318 * fVar256 + fVar350 * fVar333 + fVar209 * fVar316 + fVar297 * fVar236;
        fStack_45c = fVar320 * fVar266 + fVar353 * fVar171 + fVar255 * fVar317 + fVar305 * fVar247;
        fStack_458 = fVar322 * fVar267 + fVar354 * fVar173 + fVar249 * fVar319 + fVar313 * fVar248;
        fStack_454 = fVar349 * fVar268 + fVar355 * fVar175 + fVar251 * fVar321 + fVar315 * fVar250;
        fStack_450 = fVar318 * fVar269 + fVar350 * fVar177 + fVar209 * fVar323 + fVar297 * fVar252;
        fStack_44c = fVar320 * fVar270 + fVar353 * fVar306 + fVar255 * fVar303 + fVar305 * fVar253;
        fStack_448 = fVar322 * fVar271 + fVar354 * fVar314 + fVar249 * fVar235 + fVar313 * fVar254;
        fStack_444 = fVar325 + *(float *)(bezier_basis0 + lVar146 + 0x122c);
        fVar236 = *(float *)(bezier_basis1 + lVar146 + 0x1b18);
        fVar247 = *(float *)(bezier_basis1 + lVar146 + 0x1b1c);
        fVar248 = *(float *)(bezier_basis1 + lVar146 + 0x1b20);
        fVar250 = *(float *)(bezier_basis1 + lVar146 + 0x1b24);
        fVar252 = *(float *)(bezier_basis1 + lVar146 + 0x1b28);
        fVar253 = *(float *)(bezier_basis1 + lVar146 + 0x1b2c);
        fVar254 = *(float *)(bezier_basis1 + lVar146 + 0x1b30);
        fVar256 = *(float *)(bezier_basis1 + lVar146 + 0x1f9c);
        fVar266 = *(float *)(bezier_basis1 + lVar146 + 0x1fa0);
        fVar267 = *(float *)(bezier_basis1 + lVar146 + 0x1fa4);
        fVar268 = *(float *)(bezier_basis1 + lVar146 + 0x1fa8);
        fVar269 = *(float *)(bezier_basis1 + lVar146 + 0x1fac);
        fVar270 = *(float *)(bezier_basis1 + lVar146 + 0x1fb0);
        fVar271 = *(float *)(bezier_basis1 + lVar146 + 0x1fb4);
        fVar333 = *(float *)(bezier_basis1 + lVar146 + 0x1694);
        fVar171 = *(float *)(bezier_basis1 + lVar146 + 0x1698);
        fVar173 = *(float *)(bezier_basis1 + lVar146 + 0x169c);
        fVar175 = *(float *)(bezier_basis1 + lVar146 + 0x16a0);
        fVar177 = *(float *)(bezier_basis1 + lVar146 + 0x16a4);
        fVar306 = *(float *)(bezier_basis1 + lVar146 + 0x16a8);
        fVar314 = *(float *)(bezier_basis1 + lVar146 + 0x16ac);
        fVar316 = *(float *)(bezier_basis1 + lVar146 + 0x1210);
        fVar317 = *(float *)(bezier_basis1 + lVar146 + 0x1214);
        fVar319 = *(float *)(bezier_basis1 + lVar146 + 0x1218);
        fVar321 = *(float *)(bezier_basis1 + lVar146 + 0x121c);
        fVar323 = *(float *)(bezier_basis1 + lVar146 + 0x1220);
        fVar303 = *(float *)(bezier_basis1 + lVar146 + 0x1224);
        fVar235 = *(float *)(bezier_basis1 + lVar146 + 0x1228);
        auVar300._0_4_ =
             fVar211 * fVar316 + fVar342 * fVar333 + fVar172 * fVar236 + fVar356 * fVar256;
        auVar300._4_4_ =
             fVar225 * fVar317 + fVar346 * fVar171 + fVar174 * fVar247 + fVar359 * fVar266;
        auVar300._8_4_ =
             fVar227 * fVar319 + fVar347 * fVar173 + fVar176 * fVar248 + fVar360 * fVar267;
        auVar300._12_4_ =
             fVar229 * fVar321 + fVar348 * fVar175 + fVar178 * fVar250 + fVar361 * fVar268;
        auVar300._16_4_ =
             fVar211 * fVar323 + fVar342 * fVar177 + fVar172 * fVar252 + fVar356 * fVar269;
        auVar300._20_4_ =
             fVar225 * fVar303 + fVar346 * fVar306 + fVar174 * fVar253 + fVar359 * fVar270;
        auVar300._24_4_ =
             fVar227 * fVar235 + fVar347 * fVar314 + fVar176 * fVar254 + fVar360 * fVar271;
        auVar300._28_4_ = fVar170 + fVar170 + fVar325 + fVar361;
        auVar308._0_4_ =
             fVar324 * fVar316 + fVar231 * fVar333 + fVar257 * fVar236 + fVar272 * fVar256;
        auVar308._4_4_ =
             fVar339 * fVar317 + fVar233 * fVar171 + fVar150 * fVar247 + fVar281 * fVar266;
        auVar308._8_4_ =
             fVar340 * fVar319 + fVar304 * fVar173 + fVar168 * fVar248 + fVar282 * fVar267;
        auVar308._12_4_ =
             fVar341 * fVar321 + fVar284 * fVar175 + fVar170 * fVar250 + fVar283 * fVar268;
        auVar308._16_4_ =
             fVar324 * fVar323 + fVar231 * fVar177 + fVar257 * fVar252 + fVar272 * fVar269;
        auVar308._20_4_ =
             fVar339 * fVar303 + fVar233 * fVar306 + fVar150 * fVar253 + fVar281 * fVar270;
        auVar308._24_4_ =
             fVar340 * fVar235 + fVar304 * fVar314 + fVar168 * fVar254 + fVar282 * fVar271;
        auVar308._28_4_ = fVar170 + fVar170 + fVar170 + fVar325;
        auVar207._0_4_ =
             fVar297 * fVar316 + fVar318 * fVar333 + fVar350 * fVar236 + fVar209 * fVar256;
        auVar207._4_4_ =
             fVar305 * fVar317 + fVar320 * fVar171 + fVar353 * fVar247 + fVar255 * fVar266;
        auVar207._8_4_ =
             fVar313 * fVar319 + fVar322 * fVar173 + fVar354 * fVar248 + fVar249 * fVar267;
        auVar207._12_4_ =
             fVar315 * fVar321 + fVar349 * fVar175 + fVar355 * fVar250 + fVar251 * fVar268;
        auVar207._16_4_ =
             fVar297 * fVar323 + fVar318 * fVar177 + fVar350 * fVar252 + fVar209 * fVar269;
        auVar207._20_4_ =
             fVar305 * fVar303 + fVar320 * fVar306 + fVar353 * fVar253 + fVar255 * fVar270;
        auVar207._24_4_ =
             fVar313 * fVar235 + fVar322 * fVar314 + fVar354 * fVar254 + fVar249 * fVar271;
        auVar207._28_4_ =
             *(float *)(bezier_basis1 + lVar146 + 0x122c) +
             *(float *)(bezier_basis1 + lVar146 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar146 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar146 + 0x1fb8);
        auVar242._8_4_ = 0x7fffffff;
        auVar242._0_8_ = 0x7fffffff7fffffff;
        auVar242._12_4_ = 0x7fffffff;
        auVar242._16_4_ = 0x7fffffff;
        auVar242._20_4_ = 0x7fffffff;
        auVar242._24_4_ = 0x7fffffff;
        auVar242._28_4_ = 0x7fffffff;
        auVar130._4_4_ = fStack_51c;
        auVar130._0_4_ = local_520;
        auVar130._8_4_ = fStack_518;
        auVar130._12_4_ = fStack_514;
        auVar130._16_4_ = fStack_510;
        auVar130._20_4_ = fStack_50c;
        auVar130._24_4_ = fStack_508;
        auVar130._28_4_ = fStack_504;
        auVar153 = vandps_avx(auVar130,auVar242);
        auVar23 = vandps_avx(auVar291,auVar242);
        auVar23 = vmaxps_avx(auVar153,auVar23);
        auVar133._4_4_ = fStack_45c;
        auVar133._0_4_ = local_460;
        auVar133._8_4_ = fStack_458;
        auVar133._12_4_ = fStack_454;
        auVar133._16_4_ = fStack_450;
        auVar133._20_4_ = fStack_44c;
        auVar133._24_4_ = fStack_448;
        auVar133._28_4_ = fVar325 + *(float *)(bezier_basis0 + lVar146 + 0x122c);
        auVar153 = vandps_avx(auVar242,auVar133);
        auVar153 = vmaxps_avx(auVar23,auVar153);
        auVar260 = vpermilps_avx(auVar260,0);
        auVar292._16_16_ = auVar260;
        auVar292._0_16_ = auVar260;
        auVar153 = vcmpps_avx(auVar153,auVar292,1);
        auVar24 = vblendvps_avx(auVar130,auVar25,auVar153);
        auVar27 = vblendvps_avx(auVar291,auVar26,auVar153);
        auVar153 = vandps_avx(auVar300,auVar242);
        auVar23 = vandps_avx(auVar308,auVar242);
        auVar28 = vmaxps_avx(auVar153,auVar23);
        auVar153 = vandps_avx(auVar207,auVar242);
        auVar153 = vmaxps_avx(auVar28,auVar153);
        auVar28 = vcmpps_avx(auVar153,auVar292,1);
        auVar153 = vblendvps_avx(auVar300,auVar25,auVar28);
        auVar25 = vblendvps_avx(auVar308,auVar26,auVar28);
        fVar325 = auVar24._0_4_;
        fVar167 = auVar24._4_4_;
        fVar169 = auVar24._8_4_;
        fVar172 = auVar24._12_4_;
        fVar174 = auVar24._16_4_;
        fVar176 = auVar24._20_4_;
        fVar178 = auVar24._24_4_;
        fVar209 = auVar153._0_4_;
        fVar211 = auVar153._4_4_;
        fVar225 = auVar153._8_4_;
        fVar227 = auVar153._12_4_;
        fVar229 = auVar153._16_4_;
        fVar231 = auVar153._20_4_;
        fVar233 = auVar153._24_4_;
        fVar304 = -auVar153._28_4_;
        fVar236 = auVar27._0_4_;
        fVar252 = auVar27._4_4_;
        fVar266 = auVar27._8_4_;
        fVar270 = auVar27._12_4_;
        fVar173 = auVar27._16_4_;
        fVar314 = auVar27._20_4_;
        fVar321 = auVar27._24_4_;
        auVar156._0_4_ = fVar236 * fVar236 + fVar325 * fVar325;
        auVar156._4_4_ = fVar252 * fVar252 + fVar167 * fVar167;
        auVar156._8_4_ = fVar266 * fVar266 + fVar169 * fVar169;
        auVar156._12_4_ = fVar270 * fVar270 + fVar172 * fVar172;
        auVar156._16_4_ = fVar173 * fVar173 + fVar174 * fVar174;
        auVar156._20_4_ = fVar314 * fVar314 + fVar176 * fVar176;
        auVar156._24_4_ = fVar321 * fVar321 + fVar178 * fVar178;
        auVar156._28_4_ = auVar308._28_4_ + auVar24._28_4_;
        auVar24 = vrsqrtps_avx(auVar156);
        fVar247 = auVar24._0_4_;
        fVar248 = auVar24._4_4_;
        auVar37._4_4_ = fVar248 * 1.5;
        auVar37._0_4_ = fVar247 * 1.5;
        fVar250 = auVar24._8_4_;
        auVar37._8_4_ = fVar250 * 1.5;
        fVar253 = auVar24._12_4_;
        auVar37._12_4_ = fVar253 * 1.5;
        fVar254 = auVar24._16_4_;
        auVar37._16_4_ = fVar254 * 1.5;
        fVar256 = auVar24._20_4_;
        auVar37._20_4_ = fVar256 * 1.5;
        fVar267 = auVar24._24_4_;
        fVar195 = auVar23._28_4_;
        auVar37._24_4_ = fVar267 * 1.5;
        auVar37._28_4_ = fVar195;
        auVar38._4_4_ = fVar248 * fVar248 * fVar248 * auVar156._4_4_ * 0.5;
        auVar38._0_4_ = fVar247 * fVar247 * fVar247 * auVar156._0_4_ * 0.5;
        auVar38._8_4_ = fVar250 * fVar250 * fVar250 * auVar156._8_4_ * 0.5;
        auVar38._12_4_ = fVar253 * fVar253 * fVar253 * auVar156._12_4_ * 0.5;
        auVar38._16_4_ = fVar254 * fVar254 * fVar254 * auVar156._16_4_ * 0.5;
        auVar38._20_4_ = fVar256 * fVar256 * fVar256 * auVar156._20_4_ * 0.5;
        auVar38._24_4_ = fVar267 * fVar267 * fVar267 * auVar156._24_4_ * 0.5;
        auVar38._28_4_ = auVar156._28_4_;
        auVar23 = vsubps_avx(auVar37,auVar38);
        fVar247 = auVar23._0_4_;
        fVar253 = auVar23._4_4_;
        fVar267 = auVar23._8_4_;
        fVar271 = auVar23._12_4_;
        fVar175 = auVar23._16_4_;
        fVar316 = auVar23._20_4_;
        fVar323 = auVar23._24_4_;
        fVar248 = auVar25._0_4_;
        fVar254 = auVar25._4_4_;
        fVar268 = auVar25._8_4_;
        fVar333 = auVar25._12_4_;
        fVar177 = auVar25._16_4_;
        fVar317 = auVar25._20_4_;
        fVar303 = auVar25._24_4_;
        auVar157._0_4_ = fVar248 * fVar248 + fVar209 * fVar209;
        auVar157._4_4_ = fVar254 * fVar254 + fVar211 * fVar211;
        auVar157._8_4_ = fVar268 * fVar268 + fVar225 * fVar225;
        auVar157._12_4_ = fVar333 * fVar333 + fVar227 * fVar227;
        auVar157._16_4_ = fVar177 * fVar177 + fVar229 * fVar229;
        auVar157._20_4_ = fVar317 * fVar317 + fVar231 * fVar231;
        auVar157._24_4_ = fVar303 * fVar303 + fVar233 * fVar233;
        auVar157._28_4_ = auVar153._28_4_ + auVar23._28_4_;
        auVar153 = vrsqrtps_avx(auVar157);
        fVar250 = auVar153._0_4_;
        fVar256 = auVar153._4_4_;
        auVar39._4_4_ = fVar256 * 1.5;
        auVar39._0_4_ = fVar250 * 1.5;
        fVar269 = auVar153._8_4_;
        auVar39._8_4_ = fVar269 * 1.5;
        fVar171 = auVar153._12_4_;
        auVar39._12_4_ = fVar171 * 1.5;
        fVar306 = auVar153._16_4_;
        auVar39._16_4_ = fVar306 * 1.5;
        fVar319 = auVar153._20_4_;
        auVar39._20_4_ = fVar319 * 1.5;
        fVar235 = auVar153._24_4_;
        auVar39._24_4_ = fVar235 * 1.5;
        auVar39._28_4_ = fVar195;
        auVar40._4_4_ = fVar256 * fVar256 * fVar256 * auVar157._4_4_ * 0.5;
        auVar40._0_4_ = fVar250 * fVar250 * fVar250 * auVar157._0_4_ * 0.5;
        auVar40._8_4_ = fVar269 * fVar269 * fVar269 * auVar157._8_4_ * 0.5;
        auVar40._12_4_ = fVar171 * fVar171 * fVar171 * auVar157._12_4_ * 0.5;
        auVar40._16_4_ = fVar306 * fVar306 * fVar306 * auVar157._16_4_ * 0.5;
        auVar40._20_4_ = fVar319 * fVar319 * fVar319 * auVar157._20_4_ * 0.5;
        auVar40._24_4_ = fVar235 * fVar235 * fVar235 * auVar157._24_4_ * 0.5;
        auVar40._28_4_ = auVar157._28_4_;
        auVar153 = vsubps_avx(auVar39,auVar40);
        fVar250 = auVar153._0_4_;
        fVar256 = auVar153._4_4_;
        fVar269 = auVar153._8_4_;
        fVar171 = auVar153._12_4_;
        fVar306 = auVar153._16_4_;
        fVar319 = auVar153._20_4_;
        fVar235 = auVar153._24_4_;
        fVar236 = (float)local_780._0_4_ * fVar236 * fVar247;
        fVar252 = (float)local_780._4_4_ * fVar252 * fVar253;
        auVar41._4_4_ = fVar252;
        auVar41._0_4_ = fVar236;
        fVar266 = fStack_778 * fVar266 * fVar267;
        auVar41._8_4_ = fVar266;
        fVar270 = fStack_774 * fVar270 * fVar271;
        auVar41._12_4_ = fVar270;
        fVar173 = fStack_770 * fVar173 * fVar175;
        auVar41._16_4_ = fVar173;
        fVar314 = fStack_76c * fVar314 * fVar316;
        auVar41._20_4_ = fVar314;
        fVar321 = fStack_768 * fVar321 * fVar323;
        auVar41._24_4_ = fVar321;
        auVar41._28_4_ = fVar304;
        local_5a0._4_4_ = fVar252 + auVar332._4_4_;
        local_5a0._0_4_ = fVar236 + auVar332._0_4_;
        fStack_598 = fVar266 + auVar332._8_4_;
        fStack_594 = fVar270 + auVar332._12_4_;
        fStack_590 = fVar173 + auVar332._16_4_;
        fStack_58c = fVar314 + auVar332._20_4_;
        fStack_588 = fVar321 + auVar332._24_4_;
        fStack_584 = fVar304 + auVar332._28_4_;
        fVar236 = (float)local_780._0_4_ * fVar247 * -fVar325;
        fVar252 = (float)local_780._4_4_ * fVar253 * -fVar167;
        auVar42._4_4_ = fVar252;
        auVar42._0_4_ = fVar236;
        fVar266 = fStack_778 * fVar267 * -fVar169;
        auVar42._8_4_ = fVar266;
        fVar270 = fStack_774 * fVar271 * -fVar172;
        auVar42._12_4_ = fVar270;
        fVar173 = fStack_770 * fVar175 * -fVar174;
        auVar42._16_4_ = fVar173;
        fVar314 = fStack_76c * fVar316 * -fVar176;
        auVar42._20_4_ = fVar314;
        fVar321 = fStack_768 * fVar323 * -fVar178;
        auVar42._24_4_ = fVar321;
        auVar42._28_4_ = fVar195;
        local_500._4_4_ = fVar252 + auVar278._4_4_;
        local_500._0_4_ = fVar236 + auVar278._0_4_;
        fStack_4f8 = fVar266 + auVar278._8_4_;
        fStack_4f4 = fVar270 + auVar278._12_4_;
        fStack_4f0 = fVar173 + auVar278._16_4_;
        fStack_4ec = fVar314 + auVar278._20_4_;
        fStack_4e8 = fVar321 + auVar278._24_4_;
        fStack_4e4 = fVar195 + auVar278._28_4_;
        fVar236 = fVar247 * 0.0 * (float)local_780._0_4_;
        fVar247 = fVar253 * 0.0 * (float)local_780._4_4_;
        auVar43._4_4_ = fVar247;
        auVar43._0_4_ = fVar236;
        fVar252 = fVar267 * 0.0 * fStack_778;
        auVar43._8_4_ = fVar252;
        fVar253 = fVar271 * 0.0 * fStack_774;
        auVar43._12_4_ = fVar253;
        fVar266 = fVar175 * 0.0 * fStack_770;
        auVar43._16_4_ = fVar266;
        fVar267 = fVar316 * 0.0 * fStack_76c;
        auVar43._20_4_ = fVar267;
        fVar270 = fVar323 * 0.0 * fStack_768;
        auVar43._24_4_ = fVar270;
        auVar43._28_4_ = fVar283;
        auVar293._0_4_ = fVar236 + (float)local_440._0_4_;
        auVar293._4_4_ = fVar247 + (float)local_440._4_4_;
        auVar293._8_4_ = fVar252 + fStack_438;
        auVar293._12_4_ = fVar253 + fStack_434;
        auVar293._16_4_ = fVar266 + fStack_430;
        auVar293._20_4_ = fVar267 + fStack_42c;
        auVar293._24_4_ = fVar270 + fStack_428;
        auVar293._28_4_ = fVar283 + fStack_424;
        fVar236 = (float)local_6a0._0_4_ * fVar248 * fVar250;
        fVar247 = (float)local_6a0._4_4_ * fVar254 * fVar256;
        auVar44._4_4_ = fVar247;
        auVar44._0_4_ = fVar236;
        fVar248 = fStack_698 * fVar268 * fVar269;
        auVar44._8_4_ = fVar248;
        fVar252 = fStack_694 * fVar333 * fVar171;
        auVar44._12_4_ = fVar252;
        fVar253 = register0x000015d0 * fVar177 * fVar306;
        auVar44._16_4_ = fVar253;
        fVar254 = register0x000015d4 * fVar317 * fVar319;
        auVar44._20_4_ = fVar254;
        fVar266 = register0x000015d8 * fVar303 * fVar235;
        auVar44._24_4_ = fVar266;
        auVar44._28_4_ = auVar25._28_4_;
        auVar26 = vsubps_avx(auVar332,auVar41);
        auVar309._0_4_ = auVar241._0_4_ + fVar236;
        auVar309._4_4_ = auVar241._4_4_ + fVar247;
        auVar309._8_4_ = auVar241._8_4_ + fVar248;
        auVar309._12_4_ = auVar241._12_4_ + fVar252;
        auVar309._16_4_ = auVar241._16_4_ + fVar253;
        auVar309._20_4_ = auVar241._20_4_ + fVar254;
        auVar309._24_4_ = auVar241._24_4_ + fVar266;
        auVar309._28_4_ = auVar241._28_4_ + auVar25._28_4_;
        fVar236 = (float)local_6a0._0_4_ * -fVar209 * fVar250;
        fVar247 = (float)local_6a0._4_4_ * -fVar211 * fVar256;
        auVar45._4_4_ = fVar247;
        auVar45._0_4_ = fVar236;
        fVar248 = fStack_698 * -fVar225 * fVar269;
        auVar45._8_4_ = fVar248;
        fVar252 = fStack_694 * -fVar227 * fVar171;
        auVar45._12_4_ = fVar252;
        fVar253 = register0x000015d0 * -fVar229 * fVar306;
        auVar45._16_4_ = fVar253;
        fVar254 = register0x000015d4 * -fVar231 * fVar319;
        auVar45._20_4_ = fVar254;
        fVar266 = register0x000015d8 * -fVar233 * fVar235;
        auVar45._24_4_ = fVar266;
        auVar45._28_4_ = fVar349;
        auVar27 = vsubps_avx(auVar278,auVar42);
        auVar327._0_4_ = fVar236 + (float)local_220._0_4_;
        auVar327._4_4_ = fVar247 + (float)local_220._4_4_;
        auVar327._8_4_ = fVar248 + fStack_218;
        auVar327._12_4_ = fVar252 + fStack_214;
        auVar327._16_4_ = fVar253 + fStack_210;
        auVar327._20_4_ = fVar254 + fStack_20c;
        auVar327._24_4_ = fVar266 + fStack_208;
        auVar327._28_4_ = fVar349 + register0x000012dc;
        fVar236 = fVar250 * 0.0 * (float)local_6a0._0_4_;
        fVar247 = fVar256 * 0.0 * (float)local_6a0._4_4_;
        auVar46._4_4_ = fVar247;
        auVar46._0_4_ = fVar236;
        fVar248 = fVar269 * 0.0 * fStack_698;
        auVar46._8_4_ = fVar248;
        fVar250 = fVar171 * 0.0 * fStack_694;
        auVar46._12_4_ = fVar250;
        fVar252 = fVar306 * 0.0 * register0x000015d0;
        auVar46._16_4_ = fVar252;
        fVar253 = fVar319 * 0.0 * register0x000015d4;
        auVar46._20_4_ = fVar253;
        fVar254 = fVar235 * 0.0 * register0x000015d8;
        auVar46._24_4_ = fVar254;
        auVar46._28_4_ = fVar355;
        auVar30 = vsubps_avx(_local_440,auVar43);
        auVar357._0_4_ = fVar236 + (float)local_480._0_4_;
        auVar357._4_4_ = fVar247 + (float)local_480._4_4_;
        auVar357._8_4_ = fVar248 + fStack_478;
        auVar357._12_4_ = fVar250 + fStack_474;
        auVar357._16_4_ = fVar252 + fStack_470;
        auVar357._20_4_ = fVar253 + fStack_46c;
        auVar357._24_4_ = fVar254 + fStack_468;
        auVar357._28_4_ = fVar355 + fStack_464;
        auVar153 = vsubps_avx(auVar241,auVar44);
        auVar23 = vsubps_avx(_local_220,auVar45);
        auVar24 = vsubps_avx(_local_480,auVar46);
        auVar25 = vsubps_avx(auVar327,auVar27);
        auVar28 = vsubps_avx(auVar357,auVar30);
        auVar47._4_4_ = auVar30._4_4_ * auVar25._4_4_;
        auVar47._0_4_ = auVar30._0_4_ * auVar25._0_4_;
        auVar47._8_4_ = auVar30._8_4_ * auVar25._8_4_;
        auVar47._12_4_ = auVar30._12_4_ * auVar25._12_4_;
        auVar47._16_4_ = auVar30._16_4_ * auVar25._16_4_;
        auVar47._20_4_ = auVar30._20_4_ * auVar25._20_4_;
        auVar47._24_4_ = auVar30._24_4_ * auVar25._24_4_;
        auVar47._28_4_ = fVar355;
        auVar48._4_4_ = auVar27._4_4_ * auVar28._4_4_;
        auVar48._0_4_ = auVar27._0_4_ * auVar28._0_4_;
        auVar48._8_4_ = auVar27._8_4_ * auVar28._8_4_;
        auVar48._12_4_ = auVar27._12_4_ * auVar28._12_4_;
        auVar48._16_4_ = auVar27._16_4_ * auVar28._16_4_;
        auVar48._20_4_ = auVar27._20_4_ * auVar28._20_4_;
        auVar48._24_4_ = auVar27._24_4_ * auVar28._24_4_;
        auVar48._28_4_ = register0x000012dc;
        auVar29 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = auVar26._4_4_ * auVar28._4_4_;
        auVar49._0_4_ = auVar26._0_4_ * auVar28._0_4_;
        auVar49._8_4_ = auVar26._8_4_ * auVar28._8_4_;
        auVar49._12_4_ = auVar26._12_4_ * auVar28._12_4_;
        auVar49._16_4_ = auVar26._16_4_ * auVar28._16_4_;
        auVar49._20_4_ = auVar26._20_4_ * auVar28._20_4_;
        auVar49._24_4_ = auVar26._24_4_ * auVar28._24_4_;
        auVar49._28_4_ = auVar28._28_4_;
        auVar31 = vsubps_avx(auVar309,auVar26);
        auVar50._4_4_ = auVar30._4_4_ * auVar31._4_4_;
        auVar50._0_4_ = auVar30._0_4_ * auVar31._0_4_;
        auVar50._8_4_ = auVar30._8_4_ * auVar31._8_4_;
        auVar50._12_4_ = auVar30._12_4_ * auVar31._12_4_;
        auVar50._16_4_ = auVar30._16_4_ * auVar31._16_4_;
        auVar50._20_4_ = auVar30._20_4_ * auVar31._20_4_;
        auVar50._24_4_ = auVar30._24_4_ * auVar31._24_4_;
        auVar50._28_4_ = auVar241._28_4_;
        auVar32 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = auVar31._4_4_ * auVar27._4_4_;
        auVar51._0_4_ = auVar31._0_4_ * auVar27._0_4_;
        auVar51._8_4_ = auVar31._8_4_ * auVar27._8_4_;
        auVar51._12_4_ = auVar31._12_4_ * auVar27._12_4_;
        auVar51._16_4_ = auVar31._16_4_ * auVar27._16_4_;
        auVar51._20_4_ = auVar31._20_4_ * auVar27._20_4_;
        auVar51._24_4_ = auVar31._24_4_ * auVar27._24_4_;
        auVar51._28_4_ = auVar28._28_4_;
        auVar52._4_4_ = auVar26._4_4_ * auVar25._4_4_;
        auVar52._0_4_ = auVar26._0_4_ * auVar25._0_4_;
        auVar52._8_4_ = auVar26._8_4_ * auVar25._8_4_;
        auVar52._12_4_ = auVar26._12_4_ * auVar25._12_4_;
        auVar52._16_4_ = auVar26._16_4_ * auVar25._16_4_;
        auVar52._20_4_ = auVar26._20_4_ * auVar25._20_4_;
        auVar52._24_4_ = auVar26._24_4_ * auVar25._24_4_;
        auVar52._28_4_ = auVar25._28_4_;
        auVar25 = vsubps_avx(auVar52,auVar51);
        auVar158._0_4_ = auVar29._0_4_ * 0.0 + auVar25._0_4_ + auVar32._0_4_ * 0.0;
        auVar158._4_4_ = auVar29._4_4_ * 0.0 + auVar25._4_4_ + auVar32._4_4_ * 0.0;
        auVar158._8_4_ = auVar29._8_4_ * 0.0 + auVar25._8_4_ + auVar32._8_4_ * 0.0;
        auVar158._12_4_ = auVar29._12_4_ * 0.0 + auVar25._12_4_ + auVar32._12_4_ * 0.0;
        auVar158._16_4_ = auVar29._16_4_ * 0.0 + auVar25._16_4_ + auVar32._16_4_ * 0.0;
        auVar158._20_4_ = auVar29._20_4_ * 0.0 + auVar25._20_4_ + auVar32._20_4_ * 0.0;
        auVar158._24_4_ = auVar29._24_4_ * 0.0 + auVar25._24_4_ + auVar32._24_4_ * 0.0;
        auVar158._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar32._28_4_;
        auVar29 = vcmpps_avx(auVar158,ZEXT432(0) << 0x20,2);
        _local_6c0 = vblendvps_avx(auVar153,_local_5a0,auVar29);
        _local_680 = vblendvps_avx(auVar23,_local_500,auVar29);
        auVar153 = vblendvps_avx(auVar24,auVar293,auVar29);
        auVar23 = vblendvps_avx(auVar26,auVar309,auVar29);
        auVar24 = vblendvps_avx(auVar27,auVar327,auVar29);
        auVar25 = vblendvps_avx(auVar30,auVar357,auVar29);
        auVar26 = vblendvps_avx(auVar309,auVar26,auVar29);
        auVar27 = vblendvps_avx(auVar327,auVar27,auVar29);
        _local_660 = vpackssdw_avx(local_240._0_16_,local_240._16_16_);
        _auStack_650 = auVar332._16_16_;
        auVar28 = vblendvps_avx(auVar357,auVar30,auVar29);
        auVar26 = vsubps_avx(auVar26,_local_6c0);
        auVar31 = vsubps_avx(auVar27,_local_680);
        auVar28 = vsubps_avx(auVar28,auVar153);
        auVar32 = vsubps_avx(_local_680,auVar24);
        fVar236 = auVar31._0_4_;
        fVar178 = auVar153._0_4_;
        fVar253 = auVar31._4_4_;
        fVar209 = auVar153._4_4_;
        auVar53._4_4_ = fVar209 * fVar253;
        auVar53._0_4_ = fVar178 * fVar236;
        fVar268 = auVar31._8_4_;
        fVar211 = auVar153._8_4_;
        auVar53._8_4_ = fVar211 * fVar268;
        fVar171 = auVar31._12_4_;
        fVar225 = auVar153._12_4_;
        auVar53._12_4_ = fVar225 * fVar171;
        fVar314 = auVar31._16_4_;
        fVar227 = auVar153._16_4_;
        auVar53._16_4_ = fVar227 * fVar314;
        fVar323 = auVar31._20_4_;
        fVar229 = auVar153._20_4_;
        auVar53._20_4_ = fVar229 * fVar323;
        fVar167 = auVar31._24_4_;
        fVar231 = auVar153._24_4_;
        auVar53._24_4_ = fVar231 * fVar167;
        auVar53._28_4_ = auVar27._28_4_;
        fVar247 = local_680._0_4_;
        fVar305 = auVar28._0_4_;
        fVar254 = local_680._4_4_;
        fVar313 = auVar28._4_4_;
        auVar54._4_4_ = fVar313 * fVar254;
        auVar54._0_4_ = fVar305 * fVar247;
        fVar269 = local_680._8_4_;
        fVar315 = auVar28._8_4_;
        auVar54._8_4_ = fVar315 * fVar269;
        fVar173 = local_680._12_4_;
        fVar318 = auVar28._12_4_;
        auVar54._12_4_ = fVar318 * fVar173;
        fVar316 = local_680._16_4_;
        fVar320 = auVar28._16_4_;
        auVar54._16_4_ = fVar320 * fVar316;
        fVar303 = local_680._20_4_;
        fVar322 = auVar28._20_4_;
        auVar54._20_4_ = fVar322 * fVar303;
        fVar169 = local_680._24_4_;
        fVar324 = auVar28._24_4_;
        uVar7 = auVar30._28_4_;
        auVar54._24_4_ = fVar324 * fVar169;
        auVar54._28_4_ = uVar7;
        auVar27 = vsubps_avx(auVar54,auVar53);
        fVar248 = local_6c0._0_4_;
        fVar256 = local_6c0._4_4_;
        auVar55._4_4_ = fVar313 * fVar256;
        auVar55._0_4_ = fVar305 * fVar248;
        fVar270 = local_6c0._8_4_;
        auVar55._8_4_ = fVar315 * fVar270;
        fVar175 = local_6c0._12_4_;
        auVar55._12_4_ = fVar318 * fVar175;
        fVar317 = local_6c0._16_4_;
        auVar55._16_4_ = fVar320 * fVar317;
        fVar235 = local_6c0._20_4_;
        auVar55._20_4_ = fVar322 * fVar235;
        fVar172 = local_6c0._24_4_;
        auVar55._24_4_ = fVar324 * fVar172;
        auVar55._28_4_ = uVar7;
        fVar250 = auVar26._0_4_;
        auVar352._0_4_ = fVar178 * fVar250;
        fVar266 = auVar26._4_4_;
        auVar352._4_4_ = fVar209 * fVar266;
        fVar271 = auVar26._8_4_;
        auVar352._8_4_ = fVar211 * fVar271;
        fVar177 = auVar26._12_4_;
        auVar352._12_4_ = fVar225 * fVar177;
        fVar319 = auVar26._16_4_;
        auVar352._16_4_ = fVar227 * fVar319;
        fVar195 = auVar26._20_4_;
        auVar352._20_4_ = fVar229 * fVar195;
        fVar174 = auVar26._24_4_;
        auVar352._24_4_ = fVar231 * fVar174;
        auVar352._28_4_ = 0;
        auVar30 = vsubps_avx(auVar352,auVar55);
        auVar56._4_4_ = fVar254 * fVar266;
        auVar56._0_4_ = fVar247 * fVar250;
        auVar56._8_4_ = fVar269 * fVar271;
        auVar56._12_4_ = fVar173 * fVar177;
        auVar56._16_4_ = fVar316 * fVar319;
        auVar56._20_4_ = fVar303 * fVar195;
        auVar56._24_4_ = fVar169 * fVar174;
        auVar56._28_4_ = uVar7;
        auVar57._4_4_ = fVar256 * fVar253;
        auVar57._0_4_ = fVar248 * fVar236;
        auVar57._8_4_ = fVar270 * fVar268;
        auVar57._12_4_ = fVar175 * fVar171;
        auVar57._16_4_ = fVar317 * fVar314;
        auVar57._20_4_ = fVar235 * fVar323;
        auVar57._24_4_ = fVar172 * fVar167;
        auVar57._28_4_ = auVar357._28_4_;
        auVar154 = vsubps_avx(auVar57,auVar56);
        auVar155 = vsubps_avx(auVar153,auVar25);
        fVar252 = auVar154._28_4_ + auVar30._28_4_;
        auVar294._0_4_ = auVar154._0_4_ + auVar30._0_4_ * 0.0 + auVar27._0_4_ * 0.0;
        auVar294._4_4_ = auVar154._4_4_ + auVar30._4_4_ * 0.0 + auVar27._4_4_ * 0.0;
        auVar294._8_4_ = auVar154._8_4_ + auVar30._8_4_ * 0.0 + auVar27._8_4_ * 0.0;
        auVar294._12_4_ = auVar154._12_4_ + auVar30._12_4_ * 0.0 + auVar27._12_4_ * 0.0;
        auVar294._16_4_ = auVar154._16_4_ + auVar30._16_4_ * 0.0 + auVar27._16_4_ * 0.0;
        auVar294._20_4_ = auVar154._20_4_ + auVar30._20_4_ * 0.0 + auVar27._20_4_ * 0.0;
        auVar294._24_4_ = auVar154._24_4_ + auVar30._24_4_ * 0.0 + auVar27._24_4_ * 0.0;
        auVar294._28_4_ = fVar252 + auVar27._28_4_;
        fVar233 = auVar32._0_4_;
        fVar304 = auVar32._4_4_;
        auVar58._4_4_ = fVar304 * auVar25._4_4_;
        auVar58._0_4_ = fVar233 * auVar25._0_4_;
        fVar284 = auVar32._8_4_;
        auVar58._8_4_ = fVar284 * auVar25._8_4_;
        fVar255 = auVar32._12_4_;
        auVar58._12_4_ = fVar255 * auVar25._12_4_;
        fVar249 = auVar32._16_4_;
        auVar58._16_4_ = fVar249 * auVar25._16_4_;
        fVar251 = auVar32._20_4_;
        auVar58._20_4_ = fVar251 * auVar25._20_4_;
        fVar297 = auVar32._24_4_;
        auVar58._24_4_ = fVar297 * auVar25._24_4_;
        auVar58._28_4_ = fVar252;
        fVar252 = auVar155._0_4_;
        fVar267 = auVar155._4_4_;
        auVar59._4_4_ = auVar24._4_4_ * fVar267;
        auVar59._0_4_ = auVar24._0_4_ * fVar252;
        fVar333 = auVar155._8_4_;
        auVar59._8_4_ = auVar24._8_4_ * fVar333;
        fVar306 = auVar155._12_4_;
        auVar59._12_4_ = auVar24._12_4_ * fVar306;
        fVar321 = auVar155._16_4_;
        auVar59._16_4_ = auVar24._16_4_ * fVar321;
        fVar325 = auVar155._20_4_;
        auVar59._20_4_ = auVar24._20_4_ * fVar325;
        fVar176 = auVar155._24_4_;
        auVar59._24_4_ = auVar24._24_4_ * fVar176;
        auVar59._28_4_ = auVar154._28_4_;
        auVar30 = vsubps_avx(auVar59,auVar58);
        auVar32 = vsubps_avx(_local_6c0,auVar23);
        fVar339 = auVar32._0_4_;
        fVar340 = auVar32._4_4_;
        auVar60._4_4_ = fVar340 * auVar25._4_4_;
        auVar60._0_4_ = fVar339 * auVar25._0_4_;
        fVar341 = auVar32._8_4_;
        auVar60._8_4_ = fVar341 * auVar25._8_4_;
        fVar342 = auVar32._12_4_;
        auVar60._12_4_ = fVar342 * auVar25._12_4_;
        fVar346 = auVar32._16_4_;
        auVar60._16_4_ = fVar346 * auVar25._16_4_;
        fVar347 = auVar32._20_4_;
        auVar60._20_4_ = fVar347 * auVar25._20_4_;
        fVar348 = auVar32._24_4_;
        auVar60._24_4_ = fVar348 * auVar25._24_4_;
        auVar60._28_4_ = auVar25._28_4_;
        auVar61._4_4_ = auVar23._4_4_ * fVar267;
        auVar61._0_4_ = auVar23._0_4_ * fVar252;
        auVar61._8_4_ = auVar23._8_4_ * fVar333;
        auVar61._12_4_ = auVar23._12_4_ * fVar306;
        auVar61._16_4_ = auVar23._16_4_ * fVar321;
        auVar61._20_4_ = auVar23._20_4_ * fVar325;
        auVar61._24_4_ = auVar23._24_4_ * fVar176;
        auVar61._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar60,auVar61);
        auVar62._4_4_ = auVar24._4_4_ * fVar340;
        auVar62._0_4_ = auVar24._0_4_ * fVar339;
        auVar62._8_4_ = auVar24._8_4_ * fVar341;
        auVar62._12_4_ = auVar24._12_4_ * fVar342;
        auVar62._16_4_ = auVar24._16_4_ * fVar346;
        auVar62._20_4_ = auVar24._20_4_ * fVar347;
        auVar62._24_4_ = auVar24._24_4_ * fVar348;
        auVar62._28_4_ = auVar25._28_4_;
        auVar63._4_4_ = auVar23._4_4_ * fVar304;
        auVar63._0_4_ = auVar23._0_4_ * fVar233;
        auVar63._8_4_ = auVar23._8_4_ * fVar284;
        auVar63._12_4_ = auVar23._12_4_ * fVar255;
        auVar63._16_4_ = auVar23._16_4_ * fVar249;
        auVar63._20_4_ = auVar23._20_4_ * fVar251;
        auVar63._24_4_ = auVar23._24_4_ * fVar297;
        auVar63._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar63,auVar62);
        auVar243._0_4_ = auVar30._0_4_ * 0.0 + auVar23._0_4_ + auVar27._0_4_ * 0.0;
        auVar243._4_4_ = auVar30._4_4_ * 0.0 + auVar23._4_4_ + auVar27._4_4_ * 0.0;
        auVar243._8_4_ = auVar30._8_4_ * 0.0 + auVar23._8_4_ + auVar27._8_4_ * 0.0;
        auVar243._12_4_ = auVar30._12_4_ * 0.0 + auVar23._12_4_ + auVar27._12_4_ * 0.0;
        auVar243._16_4_ = auVar30._16_4_ * 0.0 + auVar23._16_4_ + auVar27._16_4_ * 0.0;
        auVar243._20_4_ = auVar30._20_4_ * 0.0 + auVar23._20_4_ + auVar27._20_4_ * 0.0;
        auVar243._24_4_ = auVar30._24_4_ * 0.0 + auVar23._24_4_ + auVar27._24_4_ * 0.0;
        auVar243._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar27._28_4_;
        auVar23 = vmaxps_avx(auVar294,auVar243);
        auVar23 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,2);
        auVar260 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
        auVar260 = vpand_avx(auVar260,_local_660);
        auVar200 = vpmovsxwd_avx(auVar260);
        auVar194 = vpunpckhwd_avx(auVar260,auVar260);
        auVar220._16_16_ = auVar194;
        auVar220._0_16_ = auVar200;
        if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar220 >> 0x7f,0) == '\0') &&
              (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar194 >> 0x3f,0) == '\0') &&
            (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar194[0xf]) {
LAB_010cc346:
          auVar223 = ZEXT3264(auVar220);
          auVar246 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar302 = ZEXT3264(local_700);
          auVar312 = ZEXT3264(local_720);
        }
        else {
          auVar64._4_4_ = fVar267 * fVar253;
          auVar64._0_4_ = fVar252 * fVar236;
          auVar64._8_4_ = fVar333 * fVar268;
          auVar64._12_4_ = fVar306 * fVar171;
          auVar64._16_4_ = fVar321 * fVar314;
          auVar64._20_4_ = fVar325 * fVar323;
          auVar64._24_4_ = fVar176 * fVar167;
          auVar64._28_4_ = auVar194._12_4_;
          auVar335._0_4_ = fVar233 * fVar305;
          auVar335._4_4_ = fVar304 * fVar313;
          auVar335._8_4_ = fVar284 * fVar315;
          auVar335._12_4_ = fVar255 * fVar318;
          auVar335._16_4_ = fVar249 * fVar320;
          auVar335._20_4_ = fVar251 * fVar322;
          auVar335._24_4_ = fVar297 * fVar324;
          auVar335._28_4_ = 0;
          auVar23 = vsubps_avx(auVar335,auVar64);
          auVar65._4_4_ = fVar340 * fVar313;
          auVar65._0_4_ = fVar339 * fVar305;
          auVar65._8_4_ = fVar341 * fVar315;
          auVar65._12_4_ = fVar342 * fVar318;
          auVar65._16_4_ = fVar346 * fVar320;
          auVar65._20_4_ = fVar347 * fVar322;
          auVar65._24_4_ = fVar348 * fVar324;
          auVar65._28_4_ = auVar28._28_4_;
          auVar66._4_4_ = fVar267 * fVar266;
          auVar66._0_4_ = fVar252 * fVar250;
          auVar66._8_4_ = fVar333 * fVar271;
          auVar66._12_4_ = fVar306 * fVar177;
          auVar66._16_4_ = fVar321 * fVar319;
          auVar66._20_4_ = fVar325 * fVar195;
          auVar66._24_4_ = fVar176 * fVar174;
          auVar66._28_4_ = auVar155._28_4_;
          auVar25 = vsubps_avx(auVar66,auVar65);
          auVar67._4_4_ = fVar304 * fVar266;
          auVar67._0_4_ = fVar233 * fVar250;
          auVar67._8_4_ = fVar284 * fVar271;
          auVar67._12_4_ = fVar255 * fVar177;
          auVar67._16_4_ = fVar249 * fVar319;
          auVar67._20_4_ = fVar251 * fVar195;
          auVar67._24_4_ = fVar297 * fVar174;
          auVar67._28_4_ = auVar26._28_4_;
          auVar68._4_4_ = fVar340 * fVar253;
          auVar68._0_4_ = fVar339 * fVar236;
          auVar68._8_4_ = fVar341 * fVar268;
          auVar68._12_4_ = fVar342 * fVar171;
          auVar68._16_4_ = fVar346 * fVar314;
          auVar68._20_4_ = fVar347 * fVar323;
          auVar68._24_4_ = fVar348 * fVar167;
          auVar68._28_4_ = auVar294._28_4_;
          auVar27 = vsubps_avx(auVar68,auVar67);
          auVar295._0_4_ = auVar23._0_4_ * 0.0 + auVar27._0_4_ + auVar25._0_4_ * 0.0;
          auVar295._4_4_ = auVar23._4_4_ * 0.0 + auVar27._4_4_ + auVar25._4_4_ * 0.0;
          auVar295._8_4_ = auVar23._8_4_ * 0.0 + auVar27._8_4_ + auVar25._8_4_ * 0.0;
          auVar295._12_4_ = auVar23._12_4_ * 0.0 + auVar27._12_4_ + auVar25._12_4_ * 0.0;
          auVar295._16_4_ = auVar23._16_4_ * 0.0 + auVar27._16_4_ + auVar25._16_4_ * 0.0;
          auVar295._20_4_ = auVar23._20_4_ * 0.0 + auVar27._20_4_ + auVar25._20_4_ * 0.0;
          auVar295._24_4_ = auVar23._24_4_ * 0.0 + auVar27._24_4_ + auVar25._24_4_ * 0.0;
          auVar295._28_4_ = auVar294._28_4_ + auVar27._28_4_ + auVar26._28_4_;
          auVar24 = vrcpps_avx(auVar295);
          fVar250 = auVar24._0_4_;
          fVar252 = auVar24._4_4_;
          auVar69._4_4_ = auVar295._4_4_ * fVar252;
          auVar69._0_4_ = auVar295._0_4_ * fVar250;
          fVar253 = auVar24._8_4_;
          auVar69._8_4_ = auVar295._8_4_ * fVar253;
          fVar266 = auVar24._12_4_;
          auVar69._12_4_ = auVar295._12_4_ * fVar266;
          fVar267 = auVar24._16_4_;
          auVar69._16_4_ = auVar295._16_4_ * fVar267;
          fVar268 = auVar24._20_4_;
          auVar69._20_4_ = auVar295._20_4_ * fVar268;
          fVar271 = auVar24._24_4_;
          auVar69._24_4_ = auVar295._24_4_ * fVar271;
          auVar69._28_4_ = auVar155._28_4_;
          auVar336._8_4_ = 0x3f800000;
          auVar336._0_8_ = &DAT_3f8000003f800000;
          auVar336._12_4_ = 0x3f800000;
          auVar336._16_4_ = 0x3f800000;
          auVar336._20_4_ = 0x3f800000;
          auVar336._24_4_ = 0x3f800000;
          auVar336._28_4_ = 0x3f800000;
          auVar26 = vsubps_avx(auVar336,auVar69);
          fVar250 = auVar26._0_4_ * fVar250 + fVar250;
          fVar252 = auVar26._4_4_ * fVar252 + fVar252;
          fVar253 = auVar26._8_4_ * fVar253 + fVar253;
          fVar266 = auVar26._12_4_ * fVar266 + fVar266;
          fVar267 = auVar26._16_4_ * fVar267 + fVar267;
          fVar268 = auVar26._20_4_ * fVar268 + fVar268;
          fVar271 = auVar26._24_4_ * fVar271 + fVar271;
          auVar70._4_4_ =
               (auVar23._4_4_ * fVar256 + auVar25._4_4_ * fVar254 + auVar27._4_4_ * fVar209) *
               fVar252;
          auVar70._0_4_ =
               (auVar23._0_4_ * fVar248 + auVar25._0_4_ * fVar247 + auVar27._0_4_ * fVar178) *
               fVar250;
          auVar70._8_4_ =
               (auVar23._8_4_ * fVar270 + auVar25._8_4_ * fVar269 + auVar27._8_4_ * fVar211) *
               fVar253;
          auVar70._12_4_ =
               (auVar23._12_4_ * fVar175 + auVar25._12_4_ * fVar173 + auVar27._12_4_ * fVar225) *
               fVar266;
          auVar70._16_4_ =
               (auVar23._16_4_ * fVar317 + auVar25._16_4_ * fVar316 + auVar27._16_4_ * fVar227) *
               fVar267;
          auVar70._20_4_ =
               (auVar23._20_4_ * fVar235 + auVar25._20_4_ * fVar303 + auVar27._20_4_ * fVar229) *
               fVar268;
          auVar70._24_4_ =
               (auVar23._24_4_ * fVar172 + auVar25._24_4_ * fVar169 + auVar27._24_4_ * fVar231) *
               fVar271;
          auVar70._28_4_ = local_6c0._28_4_ + auVar31._28_4_ + auVar153._28_4_;
          auVar200 = vpermilps_avx(ZEXT416((uint)local_620),0);
          auVar221._16_16_ = auVar200;
          auVar221._0_16_ = auVar200;
          auVar153 = vcmpps_avx(auVar221,auVar70,2);
          fVar236 = (ray->super_RayK<1>).tfar;
          auVar263._4_4_ = fVar236;
          auVar263._0_4_ = fVar236;
          auVar263._8_4_ = fVar236;
          auVar263._12_4_ = fVar236;
          auVar263._16_4_ = fVar236;
          auVar263._20_4_ = fVar236;
          auVar263._24_4_ = fVar236;
          auVar263._28_4_ = fVar236;
          auVar23 = vcmpps_avx(auVar70,auVar263,2);
          auVar153 = vandps_avx(auVar23,auVar153);
          auVar200 = vpackssdw_avx(auVar153._0_16_,auVar153._16_16_);
          auVar260 = vpand_avx(auVar260,auVar200);
          auVar200 = vpmovsxwd_avx(auVar260);
          auVar194 = vpshufd_avx(auVar260,0xee);
          auVar194 = vpmovsxwd_avx(auVar194);
          auVar220._16_16_ = auVar194;
          auVar220._0_16_ = auVar200;
          if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar220 >> 0x7f,0) == '\0') &&
                (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar194 >> 0x3f,0) == '\0') &&
              (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar194[0xf]) goto LAB_010cc346;
          auVar153 = vcmpps_avx(ZEXT832(0) << 0x20,auVar295,4);
          auVar200 = vpackssdw_avx(auVar153._0_16_,auVar153._16_16_);
          auVar260 = vpand_avx(auVar260,auVar200);
          auVar200 = vpmovsxwd_avx(auVar260);
          auVar260 = vpunpckhwd_avx(auVar260,auVar260);
          auVar223 = ZEXT1664(auVar260);
          auVar279._16_16_ = auVar260;
          auVar279._0_16_ = auVar200;
          auVar246 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar302 = ZEXT3264(local_700);
          auVar312 = ZEXT3264(local_720);
          if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar279 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar279 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar279 >> 0x7f,0) != '\0') ||
                (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar260 >> 0x3f,0) != '\0') ||
              (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar260[0xf] < '\0') {
            auVar222._0_4_ = auVar294._0_4_ * fVar250;
            auVar222._4_4_ = auVar294._4_4_ * fVar252;
            auVar222._8_4_ = auVar294._8_4_ * fVar253;
            auVar222._12_4_ = auVar294._12_4_ * fVar266;
            auVar222._16_4_ = auVar294._16_4_ * fVar267;
            auVar222._20_4_ = auVar294._20_4_ * fVar268;
            auVar222._24_4_ = auVar294._24_4_ * fVar271;
            auVar222._28_4_ = 0;
            auVar71._4_4_ = auVar243._4_4_ * fVar252;
            auVar71._0_4_ = auVar243._0_4_ * fVar250;
            auVar71._8_4_ = auVar243._8_4_ * fVar253;
            auVar71._12_4_ = auVar243._12_4_ * fVar266;
            auVar71._16_4_ = auVar243._16_4_ * fVar267;
            auVar71._20_4_ = auVar243._20_4_ * fVar268;
            auVar71._24_4_ = auVar243._24_4_ * fVar271;
            auVar71._28_4_ = auVar26._28_4_ + auVar24._28_4_;
            auVar264._8_4_ = 0x3f800000;
            auVar264._0_8_ = &DAT_3f8000003f800000;
            auVar264._12_4_ = 0x3f800000;
            auVar264._16_4_ = 0x3f800000;
            auVar264._20_4_ = 0x3f800000;
            auVar264._24_4_ = 0x3f800000;
            auVar264._28_4_ = 0x3f800000;
            auVar153 = vsubps_avx(auVar264,auVar222);
            auVar153 = vblendvps_avx(auVar153,auVar222,auVar29);
            auVar302 = ZEXT3264(auVar153);
            auVar153 = vsubps_avx(auVar264,auVar71);
            auVar223 = ZEXT3264(auVar153);
            _local_260 = vblendvps_avx(auVar153,auVar71,auVar29);
            auVar246 = ZEXT3264(auVar279);
            auVar312 = ZEXT3264(auVar70);
          }
        }
        auVar153 = auVar246._0_32_;
        _local_600 = auVar13;
        _local_540 = auVar11;
        _local_530 = auVar14;
        if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar153 >> 0x7f,0) != '\0') ||
              (auVar246 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar153 >> 0xbf,0) != '\0') ||
            (auVar246 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar246[0x1f] < '\0') {
          auVar23 = vsubps_avx(_local_6a0,_local_780);
          fVar247 = (float)local_780._0_4_ + auVar302._0_4_ * auVar23._0_4_;
          fVar248 = (float)local_780._4_4_ + auVar302._4_4_ * auVar23._4_4_;
          fVar250 = fStack_778 + auVar302._8_4_ * auVar23._8_4_;
          fVar252 = fStack_774 + auVar302._12_4_ * auVar23._12_4_;
          fVar253 = fStack_770 + auVar302._16_4_ * auVar23._16_4_;
          fVar254 = fStack_76c + auVar302._20_4_ * auVar23._20_4_;
          fVar256 = fStack_768 + auVar302._24_4_ * auVar23._24_4_;
          fVar266 = fStack_764 + auVar23._28_4_;
          fVar236 = pre->depth_scale;
          auVar72._4_4_ = (fVar248 + fVar248) * fVar236;
          auVar72._0_4_ = (fVar247 + fVar247) * fVar236;
          auVar72._8_4_ = (fVar250 + fVar250) * fVar236;
          auVar72._12_4_ = (fVar252 + fVar252) * fVar236;
          auVar72._16_4_ = (fVar253 + fVar253) * fVar236;
          auVar72._20_4_ = (fVar254 + fVar254) * fVar236;
          auVar72._24_4_ = (fVar256 + fVar256) * fVar236;
          auVar72._28_4_ = fVar266 + fVar266;
          local_380 = auVar312._0_32_;
          auVar23 = vcmpps_avx(local_380,auVar72,6);
          auVar24 = auVar153 & auVar23;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0x7f,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0xbf,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar24[0x1f] < '\0') {
            auVar153 = vandps_avx(auVar23,auVar153);
            local_260._0_4_ = (float)local_260._0_4_ + (float)local_260._0_4_ + -1.0;
            local_260._4_4_ = (float)local_260._4_4_ + (float)local_260._4_4_ + -1.0;
            uStack_258._0_4_ = (float)uStack_258 + (float)uStack_258 + -1.0;
            uStack_258._4_4_ = uStack_258._4_4_ + uStack_258._4_4_ + -1.0;
            uStack_250._0_4_ = (float)uStack_250 + (float)uStack_250 + -1.0;
            uStack_250._4_4_ = uStack_250._4_4_ + uStack_250._4_4_ + -1.0;
            uStack_248._0_4_ = (float)uStack_248 + (float)uStack_248 + -1.0;
            uStack_248._4_4_ = uStack_248._4_4_ + uStack_248._4_4_ + -1.0;
            local_3c0 = auVar302._0_32_;
            auVar140 = _local_260;
            auVar23 = _local_260;
            local_3a0 = (float)local_260._0_4_;
            fStack_39c = (float)local_260._4_4_;
            fStack_398 = (float)uStack_258;
            fStack_394 = uStack_258._4_4_;
            fStack_390 = (float)uStack_250;
            fStack_38c = uStack_250._4_4_;
            fStack_388 = (float)uStack_248;
            fStack_384 = uStack_248._4_4_;
            local_360 = 0;
            local_35c = uVar20;
            local_350 = (float)local_7c0._0_4_;
            fStack_34c = (float)local_7c0._4_4_;
            fStack_348 = fStack_7b8;
            fStack_344 = fStack_7b4;
            local_340 = local_600;
            uStack_338 = uStack_5f8;
            local_330 = local_530;
            uStack_328 = uStack_528;
            local_320 = local_540;
            uStack_318 = uStack_538;
            local_300 = auVar153;
            _local_260 = auVar23;
            if ((pGVar21->mask & (ray->super_RayK<1>).mask) != 0) {
              local_4c0[0] = auVar153;
              auVar197._0_4_ = 1.0 / (float)(int)uVar20;
              auVar197._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar260 = vshufps_avx(auVar197,auVar197,0);
              local_2e0[0] = auVar260._0_4_ * (auVar302._0_4_ + 0.0);
              local_2e0[1] = auVar260._4_4_ * (auVar302._4_4_ + 1.0);
              local_2e0[2] = auVar260._8_4_ * (auVar302._8_4_ + 2.0);
              local_2e0[3] = auVar260._12_4_ * (auVar302._12_4_ + 3.0);
              fStack_2d0 = auVar260._0_4_ * (auVar302._16_4_ + 4.0);
              fStack_2cc = auVar260._4_4_ * (auVar302._20_4_ + 5.0);
              fStack_2c8 = auVar260._8_4_ * (auVar302._24_4_ + 6.0);
              fStack_2c4 = auVar302._28_4_ + 7.0;
              uStack_250 = auVar140._16_8_;
              uStack_248 = auVar23._24_8_;
              local_2c0 = local_260;
              uStack_2b8 = uStack_258;
              uStack_2b0 = uStack_250;
              uStack_2a8 = uStack_248;
              local_2a0 = local_380;
              auVar185._8_4_ = 0x7f800000;
              auVar185._0_8_ = 0x7f8000007f800000;
              auVar185._12_4_ = 0x7f800000;
              auVar185._16_4_ = 0x7f800000;
              auVar185._20_4_ = 0x7f800000;
              auVar185._24_4_ = 0x7f800000;
              auVar185._28_4_ = 0x7f800000;
              auVar23 = vblendvps_avx(auVar185,local_380,auVar153);
              auVar24 = vshufps_avx(auVar23,auVar23,0xb1);
              auVar24 = vminps_avx(auVar23,auVar24);
              auVar25 = vshufpd_avx(auVar24,auVar24,5);
              auVar24 = vminps_avx(auVar24,auVar25);
              auVar25 = vperm2f128_avx(auVar24,auVar24,1);
              auVar24 = vminps_avx(auVar24,auVar25);
              auVar23 = vcmpps_avx(auVar23,auVar24,0);
              auVar24 = auVar153 & auVar23;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0x7f,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0xbf,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                auVar153 = vandps_avx(auVar23,auVar153);
              }
              uVar141 = vmovmskps_avx(auVar153);
              uVar142 = 0;
              if (uVar141 != 0) {
                for (; (uVar141 >> uVar142 & 1) == 0; uVar142 = uVar142 + 1) {
                }
              }
              auVar145 = (undefined1  [8])(ulong)uVar142;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar236 = local_2e0[(long)auVar145];
                fVar247 = *(float *)((long)&local_2c0 + (long)auVar145 * 4);
                fVar250 = 1.0 - fVar236;
                fVar248 = fVar236 * fVar250 + fVar236 * fVar250;
                auVar260 = ZEXT416((uint)(fVar236 * fVar236 * 3.0));
                auVar260 = vshufps_avx(auVar260,auVar260,0);
                auVar200 = ZEXT416((uint)((fVar248 - fVar236 * fVar236) * 3.0));
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar194 = ZEXT416((uint)((fVar250 * fVar250 - fVar248) * 3.0));
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                auVar214 = ZEXT416((uint)(fVar250 * fVar250 * -3.0));
                auVar214 = vshufps_avx(auVar214,auVar214,0);
                auVar198._0_4_ =
                     (float)local_7c0._0_4_ * auVar214._0_4_ +
                     auVar194._0_4_ * (float)local_600._0_4_ +
                     auVar260._0_4_ * (float)local_540._0_4_ +
                     auVar200._0_4_ * (float)local_530._0_4_;
                auVar198._4_4_ =
                     (float)local_7c0._4_4_ * auVar214._4_4_ +
                     auVar194._4_4_ * (float)local_600._4_4_ +
                     auVar260._4_4_ * (float)local_540._4_4_ +
                     auVar200._4_4_ * (float)local_530._4_4_;
                auVar198._8_4_ =
                     fStack_7b8 * auVar214._8_4_ +
                     auVar194._8_4_ * (float)uStack_5f8 +
                     auVar260._8_4_ * (float)uStack_538 + auVar200._8_4_ * (float)uStack_528;
                auVar198._12_4_ =
                     fStack_7b4 * auVar214._12_4_ +
                     auVar194._12_4_ * uStack_5f8._4_4_ +
                     auVar260._12_4_ * uStack_538._4_4_ + auVar200._12_4_ * uStack_528._4_4_;
                auVar223 = ZEXT464((uint)*(float *)(local_2a0 + (long)auVar145 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_2a0 + (long)auVar145 * 4);
                uVar8 = vmovlps_avx(auVar198);
                *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                fVar248 = (float)vextractps_avx(auVar198,2);
                (ray->Ng).field_0.field_0.z = fVar248;
                ray->u = fVar236;
                ray->v = fVar247;
                ray->primID = uVar143;
                ray->geomID = uVar19;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                _local_660 = _local_600;
                _local_6c0 = _local_530;
                _local_680 = _local_540;
                local_700 = auVar302._0_32_;
                local_720 = local_380;
                local_790 = pPVar147;
                local_798 = context;
                local_7a0 = ray;
                local_7a8 = pre;
                fVar236 = (float)local_7c0._0_4_;
                fVar247 = (float)local_7c0._4_4_;
                fVar248 = fStack_7b8;
                fVar250 = fStack_7b4;
                _local_7c0 = auVar12;
                do {
                  local_5e4 = local_2e0[(long)auVar145];
                  local_5e0 = *(undefined4 *)((long)&local_2c0 + (long)auVar145 * 4);
                  local_6a0._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_2a0 + (long)auVar145 * 4);
                  local_750.context = context->user;
                  fVar253 = 1.0 - local_5e4;
                  fVar252 = local_5e4 * fVar253 + local_5e4 * fVar253;
                  auVar260 = ZEXT416((uint)(local_5e4 * local_5e4 * 3.0));
                  auVar260 = vshufps_avx(auVar260,auVar260,0);
                  auVar200 = ZEXT416((uint)((fVar252 - local_5e4 * local_5e4) * 3.0));
                  auVar200 = vshufps_avx(auVar200,auVar200,0);
                  auVar194 = ZEXT416((uint)((fVar253 * fVar253 - fVar252) * 3.0));
                  auVar194 = vshufps_avx(auVar194,auVar194,0);
                  auVar214 = ZEXT416((uint)(fVar253 * fVar253 * -3.0));
                  auVar214 = vshufps_avx(auVar214,auVar214,0);
                  auVar215._0_4_ = fVar236 * auVar214._0_4_;
                  auVar215._4_4_ = fVar247 * auVar214._4_4_;
                  auVar215._8_4_ = fVar248 * auVar214._8_4_;
                  auVar215._12_4_ = fVar250 * auVar214._12_4_;
                  auVar223 = ZEXT1664(auVar215);
                  auVar203._0_4_ =
                       auVar215._0_4_ +
                       auVar194._0_4_ * (float)local_660._0_4_ +
                       auVar260._0_4_ * (float)local_680._0_4_ +
                       auVar200._0_4_ * (float)local_6c0._0_4_;
                  auVar203._4_4_ =
                       auVar215._4_4_ +
                       auVar194._4_4_ * (float)local_660._4_4_ +
                       auVar260._4_4_ * (float)local_680._4_4_ +
                       auVar200._4_4_ * (float)local_6c0._4_4_;
                  auVar203._8_4_ =
                       auVar215._8_4_ +
                       auVar194._8_4_ * fStack_658 +
                       auVar260._8_4_ * fStack_678 + auVar200._8_4_ * fStack_6b8;
                  auVar203._12_4_ =
                       auVar215._12_4_ +
                       auVar194._12_4_ * fStack_654 +
                       auVar260._12_4_ * fStack_674 + auVar200._12_4_ * fStack_6b4;
                  local_5f0 = vmovlps_avx(auVar203);
                  local_5e8 = vextractps_avx(auVar203,2);
                  local_5dc = uVar143;
                  local_5d8 = (int)local_788;
                  local_5d4 = (local_750.context)->instID[0];
                  local_5d0 = (local_750.context)->instPrimID[0];
                  local_7c4 = -1;
                  local_750.valid = &local_7c4;
                  local_750.geometryUserPtr = pGVar21->userPtr;
                  local_750.ray = (RTCRayN *)ray;
                  local_750.hit = (RTCHitN *)&local_5f0;
                  local_750.N = 1;
                  local_780 = auVar145;
                  if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010cc5b3:
                    p_Var22 = context->args->filter;
                    if (p_Var22 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar21->field_8).field_0x2 & 0x40) != 0)) {
                        auVar223 = ZEXT1664(auVar223._0_16_);
                        (*p_Var22)(&local_750);
                        auVar312 = ZEXT3264(local_720);
                        auVar302 = ZEXT3264(local_700);
                        auVar145 = local_780;
                        ray = local_7a0;
                        pre = local_7a8;
                        pPVar147 = local_790;
                        context = local_798;
                        fVar236 = (float)local_7c0._0_4_;
                        fVar247 = (float)local_7c0._4_4_;
                        fVar248 = fStack_7b8;
                        fVar250 = fStack_7b4;
                        fVar257 = (float)local_5c0._0_4_;
                        fVar150 = (float)local_5c0._4_4_;
                        fVar168 = fStack_5b8;
                        fVar170 = fStack_5b4;
                        fVar210 = fStack_5b0;
                        fVar224 = fStack_5ac;
                        fVar226 = fStack_5a8;
                        fVar272 = (float)local_6e0._0_4_;
                        fVar281 = (float)local_6e0._4_4_;
                        fVar282 = fStack_6d8;
                        fVar283 = fStack_6d4;
                        fVar228 = fStack_6d0;
                        fVar230 = fStack_6cc;
                        fVar232 = fStack_6c8;
                        fVar234 = fStack_6c4;
                      }
                      if (*local_750.valid == 0) goto LAB_010cc697;
                    }
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                         *(float *)local_750.hit;
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_750.hit + 4);
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_750.hit + 8);
                    *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                    *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                    *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                    *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                    *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                    *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                    auVar145 = local_780;
                  }
                  else {
                    auVar223 = ZEXT1664(auVar215);
                    (*pGVar21->intersectionFilterN)(&local_750);
                    auVar312 = ZEXT3264(local_720);
                    auVar302 = ZEXT3264(local_700);
                    auVar145 = local_780;
                    ray = local_7a0;
                    pre = local_7a8;
                    pPVar147 = local_790;
                    context = local_798;
                    fVar236 = (float)local_7c0._0_4_;
                    fVar247 = (float)local_7c0._4_4_;
                    fVar248 = fStack_7b8;
                    fVar250 = fStack_7b4;
                    fVar257 = (float)local_5c0._0_4_;
                    fVar150 = (float)local_5c0._4_4_;
                    fVar168 = fStack_5b8;
                    fVar170 = fStack_5b4;
                    fVar210 = fStack_5b0;
                    fVar224 = fStack_5ac;
                    fVar226 = fStack_5a8;
                    fVar272 = (float)local_6e0._0_4_;
                    fVar281 = (float)local_6e0._4_4_;
                    fVar282 = fStack_6d8;
                    fVar283 = fStack_6d4;
                    fVar228 = fStack_6d0;
                    fVar230 = fStack_6cc;
                    fVar232 = fStack_6c8;
                    fVar234 = fStack_6c4;
                    if (*local_750.valid != 0) goto LAB_010cc5b3;
LAB_010cc697:
                    (ray->super_RayK<1>).tfar = (float)local_6a0._0_4_;
                  }
                  *(undefined4 *)(local_4c0[0] + (long)auVar145 * 4) = 0;
                  auVar24 = local_4c0[0];
                  fVar252 = (ray->super_RayK<1>).tfar;
                  auVar165._4_4_ = fVar252;
                  auVar165._0_4_ = fVar252;
                  auVar165._8_4_ = fVar252;
                  auVar165._12_4_ = fVar252;
                  auVar165._16_4_ = fVar252;
                  auVar165._20_4_ = fVar252;
                  auVar165._24_4_ = fVar252;
                  auVar165._28_4_ = fVar252;
                  auVar23 = vcmpps_avx(auVar312._0_32_,auVar165,2);
                  auVar153 = vandps_avx(auVar23,local_4c0[0]);
                  local_4c0[0] = auVar153;
                  auVar24 = auVar24 & auVar23;
                  bVar123 = (auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar124 = (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar122 = (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar121 = SUB321(auVar24 >> 0x7f,0) != '\0';
                  bVar120 = (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar119 = SUB321(auVar24 >> 0xbf,0) != '\0';
                  bVar117 = (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar116 = auVar24[0x1f] < '\0';
                  if (((((((bVar123 || bVar124) || bVar122) || bVar121) || bVar120) || bVar119) ||
                      bVar117) || bVar116) {
                    auVar193._8_4_ = 0x7f800000;
                    auVar193._0_8_ = 0x7f8000007f800000;
                    auVar193._12_4_ = 0x7f800000;
                    auVar193._16_4_ = 0x7f800000;
                    auVar193._20_4_ = 0x7f800000;
                    auVar193._24_4_ = 0x7f800000;
                    auVar193._28_4_ = 0x7f800000;
                    auVar23 = vblendvps_avx(auVar193,auVar312._0_32_,auVar153);
                    auVar24 = vshufps_avx(auVar23,auVar23,0xb1);
                    auVar24 = vminps_avx(auVar23,auVar24);
                    auVar25 = vshufpd_avx(auVar24,auVar24,5);
                    auVar24 = vminps_avx(auVar24,auVar25);
                    auVar25 = vperm2f128_avx(auVar24,auVar24,1);
                    auVar223 = ZEXT3264(auVar25);
                    auVar24 = vminps_avx(auVar24,auVar25);
                    auVar23 = vcmpps_avx(auVar23,auVar24,0);
                    auVar24 = auVar153 & auVar23;
                    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar24 >> 0x7f,0) != '\0') ||
                          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar24 >> 0xbf,0) != '\0') ||
                        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar24[0x1f] < '\0') {
                      auVar153 = vandps_avx(auVar23,auVar153);
                    }
                    uVar142 = vmovmskps_avx(auVar153);
                    uVar19 = 0;
                    if (uVar142 != 0) {
                      for (; (uVar142 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    auVar145 = (undefined1  [8])(ulong)uVar19;
                  }
                  auVar12 = _local_7c0;
                } while (((((((bVar123 || bVar124) || bVar122) || bVar121) || bVar120) || bVar119)
                         || bVar117) || bVar116);
              }
            }
          }
        }
        _local_7c0 = auVar12;
        auVar260 = local_640._0_16_;
      }
      auVar246 = ZEXT3264(_local_580);
      if (8 < (int)uVar20) {
        auVar200 = vpshufd_avx(ZEXT416(uVar20),0);
        local_460 = auVar200._0_4_;
        fStack_45c = auVar200._4_4_;
        fStack_458 = auVar200._8_4_;
        fStack_454 = auVar200._12_4_;
        auVar260 = vshufps_avx(auVar260,auVar260,0);
        local_240._16_16_ = auVar260;
        local_240._0_16_ = auVar260;
        auVar127._4_4_ = fStack_61c;
        auVar127._0_4_ = local_620;
        auVar127._8_4_ = fStack_618;
        auVar127._12_4_ = fStack_614;
        auVar260 = vpermilps_avx(auVar127,0);
        local_120._16_16_ = auVar260;
        local_120._0_16_ = auVar260;
        auVar152._0_4_ = 1.0 / (float)local_400._0_4_;
        auVar152._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar260 = vshufps_avx(auVar152,auVar152,0);
        _fStack_3f0 = auVar260;
        _local_400 = auVar260;
        auVar166 = ZEXT3264(_local_400);
        lVar149 = 8;
        local_700 = auVar302._0_32_;
        local_720 = auVar312._0_32_;
        fVar236 = (float)local_560._0_4_;
        fVar247 = (float)local_560._4_4_;
        fVar248 = fStack_558;
        fVar250 = fStack_554;
        fVar252 = fStack_550;
        fVar253 = fStack_54c;
        fVar254 = fStack_548;
        fVar256 = fStack_544;
        do {
          pauVar1 = (undefined1 (*) [28])(bezier_basis0 + lVar149 * 4 + lVar146);
          fVar266 = *(float *)*pauVar1;
          fVar267 = *(float *)(*pauVar1 + 4);
          fVar268 = *(float *)(*pauVar1 + 8);
          fVar269 = *(float *)(*pauVar1 + 0xc);
          fVar270 = *(float *)(*pauVar1 + 0x10);
          fVar271 = *(float *)(*pauVar1 + 0x14);
          fVar333 = *(float *)(*pauVar1 + 0x18);
          auVar137 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar146 + 0x2227768 + lVar149 * 4);
          fVar171 = *(float *)*pauVar1;
          fVar173 = *(float *)(*pauVar1 + 4);
          fVar175 = *(float *)(*pauVar1 + 8);
          fVar177 = *(float *)(*pauVar1 + 0xc);
          fVar306 = *(float *)(*pauVar1 + 0x10);
          fVar314 = *(float *)(*pauVar1 + 0x14);
          fVar316 = *(float *)(*pauVar1 + 0x18);
          auVar136 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar146 + 0x2227bec + lVar149 * 4);
          fVar317 = *(float *)*pauVar1;
          fVar319 = *(float *)(*pauVar1 + 4);
          fVar321 = *(float *)(*pauVar1 + 8);
          fVar323 = *(float *)(*pauVar1 + 0xc);
          fVar303 = *(float *)(*pauVar1 + 0x10);
          fVar235 = *(float *)(*pauVar1 + 0x14);
          fVar195 = *(float *)(*pauVar1 + 0x18);
          auVar135 = *pauVar1;
          pauVar3 = (undefined1 (*) [32])(lVar146 + 0x2228070 + lVar149 * 4);
          fVar325 = *(float *)*pauVar3;
          fVar167 = *(float *)(*pauVar3 + 4);
          fVar169 = *(float *)(*pauVar3 + 8);
          fVar172 = *(float *)(*pauVar3 + 0xc);
          fVar174 = *(float *)(*pauVar3 + 0x10);
          fVar176 = *(float *)(*pauVar3 + 0x14);
          fVar178 = *(float *)(*pauVar3 + 0x18);
          auVar134 = *(undefined1 (*) [28])*pauVar3;
          _local_220 = *pauVar3;
          auVar25 = _local_220;
          fVar284 = auVar223._28_4_;
          fVar209 = fVar284 + *(float *)(*pauVar3 + 0x1c);
          fStack_604 = fVar284 + fVar284 + auVar166._28_4_;
          fVar255 = fVar284 + fVar209;
          auVar223 = ZEXT3264(local_1e0);
          fVar211 = local_1e0._0_4_;
          fVar225 = local_1e0._4_4_;
          fVar227 = local_1e0._8_4_;
          fVar229 = local_1e0._12_4_;
          fVar231 = local_1e0._16_4_;
          fVar233 = local_1e0._20_4_;
          fVar304 = local_1e0._24_4_;
          local_640._0_4_ =
               fVar211 * fVar266 +
               (float)local_a0._0_4_ * fVar171 +
               fVar236 * fVar317 + (float)local_3e0._0_4_ * fVar325;
          local_640._4_4_ =
               fVar225 * fVar267 +
               (float)local_a0._4_4_ * fVar173 +
               fVar247 * fVar319 + (float)local_3e0._4_4_ * fVar167;
          local_640._8_4_ =
               fVar227 * fVar268 + fStack_98 * fVar175 + fVar248 * fVar321 + fStack_3d8 * fVar169;
          local_640._12_4_ =
               fVar229 * fVar269 + fStack_94 * fVar177 + fVar250 * fVar323 + fStack_3d4 * fVar172;
          local_640._16_4_ =
               fVar231 * fVar270 + fStack_90 * fVar306 + fVar252 * fVar303 + fStack_3d0 * fVar174;
          local_640._20_4_ =
               fVar233 * fVar271 + fStack_8c * fVar314 + fVar253 * fVar235 + fStack_3cc * fVar176;
          local_640._24_4_ =
               fVar304 * fVar333 + fStack_88 * fVar316 + fVar254 * fVar195 + fStack_3c8 * fVar178;
          local_640._28_4_ = fVar209 + fStack_604;
          auVar208._0_4_ =
               (float)local_200._0_4_ * fVar266 +
               (float)local_1c0._0_4_ * fVar171 + fVar257 * fVar317 + fVar272 * fVar325;
          auVar208._4_4_ =
               (float)local_200._4_4_ * fVar267 +
               (float)local_1c0._4_4_ * fVar173 + fVar150 * fVar319 + fVar281 * fVar167;
          auVar208._8_4_ =
               fStack_1f8 * fVar268 + fStack_1b8 * fVar175 + fVar168 * fVar321 + fVar282 * fVar169;
          auVar208._12_4_ =
               fStack_1f4 * fVar269 + fStack_1b4 * fVar177 + fVar170 * fVar323 + fVar283 * fVar172;
          auVar208._16_4_ =
               fStack_1f0 * fVar270 + fStack_1b0 * fVar306 + fVar210 * fVar303 + fVar228 * fVar174;
          auVar208._20_4_ =
               fStack_1ec * fVar271 + fStack_1ac * fVar314 + fVar224 * fVar235 + fVar230 * fVar176;
          auVar208._24_4_ =
               fStack_1e8 * fVar333 + fStack_1a8 * fVar316 + fVar226 * fVar195 + fVar232 * fVar178;
          auVar208._28_4_ = fStack_604 + fVar284 + fVar284 + auVar246._28_4_;
          local_620 = fVar266 * (float)local_180._0_4_ +
                      (float)local_c0._0_4_ * fVar171 +
                      fVar317 * (float)local_140._0_4_ + fVar325 * (float)local_160._0_4_;
          fStack_61c = fVar267 * (float)local_180._4_4_ +
                       (float)local_c0._4_4_ * fVar173 +
                       fVar319 * (float)local_140._4_4_ + fVar167 * (float)local_160._4_4_;
          fStack_618 = fVar268 * fStack_178 +
                       fStack_b8 * fVar175 + fVar321 * fStack_138 + fVar169 * fStack_158;
          fStack_614 = fVar269 * fStack_174 +
                       fStack_b4 * fVar177 + fVar323 * fStack_134 + fVar172 * fStack_154;
          fStack_610 = fVar270 * fStack_170 +
                       fStack_b0 * fVar306 + fVar303 * fStack_130 + fVar174 * fStack_150;
          fStack_60c = fVar271 * fStack_16c +
                       fStack_ac * fVar314 + fVar235 * fStack_12c + fVar176 * fStack_14c;
          fStack_608 = fVar333 * fStack_168 +
                       fStack_a8 * fVar316 + fVar195 * fStack_128 + fVar178 * fStack_148;
          fStack_604 = fStack_604 + fVar255;
          pfVar2 = (float *)(bezier_basis1 + lVar149 * 4 + lVar146);
          fVar266 = *pfVar2;
          fVar267 = pfVar2[1];
          fVar268 = pfVar2[2];
          fVar269 = pfVar2[3];
          fVar270 = pfVar2[4];
          fVar271 = pfVar2[5];
          fVar333 = pfVar2[6];
          pauVar1 = (undefined1 (*) [28])(lVar146 + 0x2229b88 + lVar149 * 4);
          fVar171 = *(float *)*pauVar1;
          fVar173 = *(float *)(*pauVar1 + 4);
          fVar175 = *(float *)(*pauVar1 + 8);
          fVar177 = *(float *)(*pauVar1 + 0xc);
          fVar306 = *(float *)(*pauVar1 + 0x10);
          fVar314 = *(float *)(*pauVar1 + 0x14);
          fVar316 = *(float *)(*pauVar1 + 0x18);
          auVar139 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar146 + 0x222a00c + lVar149 * 4);
          fVar317 = *(float *)*pauVar1;
          fVar319 = *(float *)(*pauVar1 + 4);
          fVar321 = *(float *)(*pauVar1 + 8);
          fVar323 = *(float *)(*pauVar1 + 0xc);
          fVar303 = *(float *)(*pauVar1 + 0x10);
          fVar235 = *(float *)(*pauVar1 + 0x14);
          fVar195 = *(float *)(*pauVar1 + 0x18);
          auVar138 = *pauVar1;
          pfVar4 = (float *)(lVar146 + 0x222a490 + lVar149 * 4);
          fVar325 = *pfVar4;
          fVar167 = pfVar4[1];
          fVar169 = pfVar4[2];
          fVar172 = pfVar4[3];
          fVar174 = pfVar4[4];
          fVar176 = pfVar4[5];
          fVar178 = pfVar4[6];
          fVar284 = fVar256 + pfVar4[7];
          fVar209 = fVar256 + fVar256 + fVar255;
          local_480._0_4_ =
               fVar266 * fVar211 +
               (float)local_a0._0_4_ * fVar171 +
               fVar236 * fVar317 + (float)local_3e0._0_4_ * fVar325;
          local_480._4_4_ =
               fVar267 * fVar225 +
               (float)local_a0._4_4_ * fVar173 +
               fVar247 * fVar319 + (float)local_3e0._4_4_ * fVar167;
          fStack_478 = fVar268 * fVar227 +
                       fStack_98 * fVar175 + fVar248 * fVar321 + fStack_3d8 * fVar169;
          fStack_474 = fVar269 * fVar229 +
                       fStack_94 * fVar177 + fVar250 * fVar323 + fStack_3d4 * fVar172;
          fStack_470 = fVar270 * fVar231 +
                       fStack_90 * fVar306 + fVar252 * fVar303 + fStack_3d0 * fVar174;
          fStack_46c = fVar271 * fVar233 +
                       fStack_8c * fVar314 + fVar253 * fVar235 + fStack_3cc * fVar176;
          fStack_468 = fVar333 * fVar304 +
                       fStack_88 * fVar316 + fVar254 * fVar195 + fStack_3c8 * fVar178;
          fStack_464 = fVar284 + fVar209;
          local_6a0._0_4_ =
               (float)local_200._0_4_ * fVar266 +
               fVar257 * fVar317 + fVar272 * fVar325 + (float)local_1c0._0_4_ * fVar171;
          local_6a0._4_4_ =
               (float)local_200._4_4_ * fVar267 +
               fVar150 * fVar319 + fVar281 * fVar167 + (float)local_1c0._4_4_ * fVar173;
          fStack_698 = fStack_1f8 * fVar268 +
                       fVar168 * fVar321 + fVar282 * fVar169 + fStack_1b8 * fVar175;
          fStack_694 = fStack_1f4 * fVar269 +
                       fVar170 * fVar323 + fVar283 * fVar172 + fStack_1b4 * fVar177;
          register0x00001350 =
               fStack_1f0 * fVar270 + fVar210 * fVar303 + fVar228 * fVar174 + fStack_1b0 * fVar306;
          register0x00001354 =
               fStack_1ec * fVar271 + fVar224 * fVar235 + fVar230 * fVar176 + fStack_1ac * fVar314;
          register0x00001358 =
               fStack_1e8 * fVar333 + fVar226 * fVar195 + fVar232 * fVar178 + fStack_1a8 * fVar316;
          register0x0000135c = fVar209 + fVar256 + fStack_3c4 + fVar256;
          auVar296._0_4_ =
               (float)local_c0._0_4_ * fVar171 +
               fVar317 * (float)local_140._0_4_ + fVar325 * (float)local_160._0_4_ +
               fVar266 * (float)local_180._0_4_;
          auVar296._4_4_ =
               (float)local_c0._4_4_ * fVar173 +
               fVar319 * (float)local_140._4_4_ + fVar167 * (float)local_160._4_4_ +
               fVar267 * (float)local_180._4_4_;
          auVar296._8_4_ =
               fStack_b8 * fVar175 + fVar321 * fStack_138 + fVar169 * fStack_158 +
               fVar268 * fStack_178;
          auVar296._12_4_ =
               fStack_b4 * fVar177 + fVar323 * fStack_134 + fVar172 * fStack_154 +
               fVar269 * fStack_174;
          auVar296._16_4_ =
               fStack_b0 * fVar306 + fVar303 * fStack_130 + fVar174 * fStack_150 +
               fVar270 * fStack_170;
          auVar296._20_4_ =
               fStack_ac * fVar314 + fVar235 * fStack_12c + fVar176 * fStack_14c +
               fVar271 * fStack_16c;
          auVar296._24_4_ =
               fStack_a8 * fVar316 + fVar195 * fStack_128 + fVar178 * fStack_148 +
               fVar333 * fStack_168;
          auVar296._28_4_ = fVar256 + fVar284 + fVar209;
          auVar23 = vsubps_avx(_local_480,local_640);
          _local_440 = vsubps_avx(_local_6a0,auVar208);
          fVar252 = auVar23._0_4_;
          fVar253 = auVar23._4_4_;
          auVar73._4_4_ = fVar253 * auVar208._4_4_;
          auVar73._0_4_ = fVar252 * auVar208._0_4_;
          fVar254 = auVar23._8_4_;
          auVar73._8_4_ = fVar254 * auVar208._8_4_;
          fVar256 = auVar23._12_4_;
          auVar73._12_4_ = fVar256 * auVar208._12_4_;
          fVar171 = auVar23._16_4_;
          auVar73._16_4_ = fVar171 * auVar208._16_4_;
          fVar173 = auVar23._20_4_;
          auVar73._20_4_ = fVar173 * auVar208._20_4_;
          fVar175 = auVar23._24_4_;
          auVar73._24_4_ = fVar175 * auVar208._24_4_;
          auVar73._28_4_ = fVar209;
          fVar210 = local_440._0_4_;
          fVar224 = local_440._4_4_;
          auVar74._4_4_ = local_640._4_4_ * fVar224;
          auVar74._0_4_ = (float)local_640._0_4_ * fVar210;
          fVar226 = local_440._8_4_;
          auVar74._8_4_ = local_640._8_4_ * fVar226;
          fVar236 = local_440._12_4_;
          auVar74._12_4_ = local_640._12_4_ * fVar236;
          fVar247 = local_440._16_4_;
          auVar74._16_4_ = local_640._16_4_ * fVar247;
          fVar248 = local_440._20_4_;
          auVar74._20_4_ = local_640._20_4_ * fVar248;
          fVar250 = local_440._24_4_;
          auVar74._24_4_ = local_640._24_4_ * fVar250;
          auVar74._28_4_ = register0x0000135c;
          auVar24 = vsubps_avx(auVar73,auVar74);
          auVar128._4_4_ = fStack_61c;
          auVar128._0_4_ = local_620;
          auVar128._8_4_ = fStack_618;
          auVar128._12_4_ = fStack_614;
          auVar128._16_4_ = fStack_610;
          auVar128._20_4_ = fStack_60c;
          auVar128._24_4_ = fStack_608;
          auVar128._28_4_ = fStack_604;
          auVar166 = ZEXT3264(auVar128);
          auVar153 = vmaxps_avx(auVar128,auVar296);
          auVar75._4_4_ = auVar153._4_4_ * auVar153._4_4_ * (fVar253 * fVar253 + fVar224 * fVar224);
          auVar75._0_4_ = auVar153._0_4_ * auVar153._0_4_ * (fVar252 * fVar252 + fVar210 * fVar210);
          auVar75._8_4_ = auVar153._8_4_ * auVar153._8_4_ * (fVar254 * fVar254 + fVar226 * fVar226);
          auVar75._12_4_ =
               auVar153._12_4_ * auVar153._12_4_ * (fVar256 * fVar256 + fVar236 * fVar236);
          auVar75._16_4_ =
               auVar153._16_4_ * auVar153._16_4_ * (fVar171 * fVar171 + fVar247 * fVar247);
          auVar75._20_4_ =
               auVar153._20_4_ * auVar153._20_4_ * (fVar173 * fVar173 + fVar248 * fVar248);
          auVar75._24_4_ =
               auVar153._24_4_ * auVar153._24_4_ * (fVar175 * fVar175 + fVar250 * fVar250);
          auVar75._28_4_ = fVar284 + register0x0000135c;
          auVar76._4_4_ = auVar24._4_4_ * auVar24._4_4_;
          auVar76._0_4_ = auVar24._0_4_ * auVar24._0_4_;
          auVar76._8_4_ = auVar24._8_4_ * auVar24._8_4_;
          auVar76._12_4_ = auVar24._12_4_ * auVar24._12_4_;
          auVar76._16_4_ = auVar24._16_4_ * auVar24._16_4_;
          auVar76._20_4_ = auVar24._20_4_ * auVar24._20_4_;
          auVar76._24_4_ = auVar24._24_4_ * auVar24._24_4_;
          auVar76._28_4_ = auVar24._28_4_;
          auVar246 = ZEXT3264(auVar76);
          auVar153 = vcmpps_avx(auVar76,auVar75,2);
          local_360 = (uint)lVar149;
          auVar200 = vpshufd_avx(ZEXT416(local_360),0);
          auVar260 = vpor_avx(auVar200,_DAT_01ff0cf0);
          auVar200 = vpor_avx(auVar200,_DAT_02020ea0);
          auVar132._4_4_ = fStack_45c;
          auVar132._0_4_ = local_460;
          auVar132._8_4_ = fStack_458;
          auVar132._12_4_ = fStack_454;
          auVar260 = vpcmpgtd_avx(auVar132,auVar260);
          auVar200 = vpcmpgtd_avx(auVar132,auVar200);
          auVar186._16_16_ = auVar200;
          auVar186._0_16_ = auVar260;
          auVar24 = auVar186 & auVar153;
          fVar236 = (float)local_560._0_4_;
          fVar247 = (float)local_560._4_4_;
          fVar248 = fStack_558;
          fVar250 = fStack_554;
          fVar252 = fStack_550;
          fVar253 = fStack_54c;
          fVar254 = fStack_548;
          fVar256 = fStack_544;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0x7f,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0xbf,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar24[0x1f]) {
LAB_010cbca7:
            auVar312 = ZEXT3264(local_720);
            auVar302 = ZEXT3264(local_700);
          }
          else {
            local_5a0._0_4_ = auVar139._0_4_;
            local_5a0._4_4_ = auVar139._4_4_;
            fStack_598 = auVar139._8_4_;
            fStack_594 = auVar139._12_4_;
            fStack_590 = auVar139._16_4_;
            fStack_58c = auVar139._20_4_;
            fStack_588 = auVar139._24_4_;
            fVar306 = (float)local_1a0._0_4_ * (float)local_5a0._0_4_;
            fVar314 = (float)local_1a0._4_4_ * (float)local_5a0._4_4_;
            fVar316 = fStack_198 * fStack_598;
            fVar317 = fStack_194 * fStack_594;
            fVar319 = fStack_190 * fStack_590;
            fVar321 = fStack_18c * fStack_58c;
            fVar323 = fStack_188 * fStack_588;
            _local_5a0 = auVar153;
            local_500._0_4_ = auVar138._0_4_;
            local_500._4_4_ = auVar138._4_4_;
            fStack_4f8 = auVar138._8_4_;
            fStack_4f4 = auVar138._12_4_;
            fStack_4f0 = auVar138._16_4_;
            fStack_4ec = auVar138._20_4_;
            fStack_4e8 = auVar138._24_4_;
            fVar210 = (float)local_e0._0_4_ * (float)local_500._0_4_;
            fVar224 = (float)local_e0._4_4_ * (float)local_500._4_4_;
            fVar226 = fStack_d8 * fStack_4f8;
            fVar171 = fStack_d4 * fStack_4f4;
            fVar173 = fStack_d0 * fStack_4f0;
            fVar175 = fStack_cc * fStack_4ec;
            fVar177 = fStack_c8 * fStack_4e8;
            _local_500 = auVar186;
            local_520 = fVar266 * (float)local_4e0._0_4_ +
                        fVar306 + fVar210 + (float)local_580._0_4_ * fVar325;
            fStack_51c = fVar267 * (float)local_4e0._4_4_ +
                         fVar314 + fVar224 + (float)local_580._4_4_ * fVar167;
            fStack_518 = fVar268 * fStack_4d8 + fVar316 + fVar226 + fStack_578 * fVar169;
            fStack_514 = fVar269 * fStack_4d4 + fVar317 + fVar171 + fStack_574 * fVar172;
            fStack_510 = fVar270 * fStack_4d0 + fVar319 + fVar173 + fStack_570 * fVar174;
            fStack_50c = fVar271 * fStack_4cc + fVar321 + fVar175 + fStack_56c * fVar176;
            fStack_508 = fVar333 * fStack_4c8 + fVar323 + fVar177 + fStack_568 * fVar178;
            fStack_504 = fStack_464 + fStack_604 + auVar200._12_4_ + 0.0;
            local_6c0._0_4_ = auVar136._0_4_;
            local_6c0._4_4_ = auVar136._4_4_;
            fStack_6b8 = auVar136._8_4_;
            fStack_6b4 = auVar136._12_4_;
            auStack_6b0._0_4_ = auVar136._16_4_;
            auStack_6b0._4_4_ = auVar136._20_4_;
            fStack_6a8 = auVar136._24_4_;
            fVar150 = (float)local_1a0._0_4_ * (float)local_6c0._0_4_;
            fVar168 = (float)local_1a0._4_4_ * (float)local_6c0._4_4_;
            fVar170 = fStack_198 * fStack_6b8;
            fVar172 = fStack_194 * fStack_6b4;
            fVar174 = fStack_190 * (float)auStack_6b0._0_4_;
            fVar176 = fStack_18c * (float)auStack_6b0._4_4_;
            fVar178 = fStack_188 * fStack_6a8;
            local_680._0_4_ = auVar135._0_4_;
            local_680._4_4_ = auVar135._4_4_;
            fStack_678 = auVar135._8_4_;
            fStack_674 = auVar135._12_4_;
            auStack_670._0_4_ = auVar135._16_4_;
            auStack_670._4_4_ = auVar135._20_4_;
            fStack_668 = auVar135._24_4_;
            local_220._0_4_ = auVar134._0_4_;
            local_220._4_4_ = auVar134._4_4_;
            fStack_218 = auVar134._8_4_;
            fStack_214 = auVar134._12_4_;
            fStack_210 = auVar134._16_4_;
            fStack_20c = auVar134._20_4_;
            fStack_208 = auVar134._24_4_;
            pfVar4 = (float *)(lVar146 + 0x2228dfc + lVar149 * 4);
            fVar210 = *pfVar4;
            fVar224 = pfVar4[1];
            fVar226 = pfVar4[2];
            fVar266 = pfVar4[3];
            fVar267 = pfVar4[4];
            fVar268 = pfVar4[5];
            fVar269 = pfVar4[6];
            pfVar5 = (float *)(lVar146 + 0x2229280 + lVar149 * 4);
            fVar270 = *pfVar5;
            fVar271 = pfVar5[1];
            fVar333 = pfVar5[2];
            fVar171 = pfVar5[3];
            fVar173 = pfVar5[4];
            fVar175 = pfVar5[5];
            fVar177 = pfVar5[6];
            _local_6c0 = auVar296;
            pfVar6 = (float *)(lVar146 + 0x2228978 + lVar149 * 4);
            fVar306 = *pfVar6;
            fVar314 = pfVar6[1];
            fVar316 = pfVar6[2];
            fVar317 = pfVar6[3];
            fVar319 = pfVar6[4];
            fVar321 = pfVar6[5];
            fVar323 = pfVar6[6];
            fVar209 = pfVar4[7] + pfVar5[7];
            fVar284 = pfVar5[7] + fStack_1e4 + 0.0;
            fVar255 = fStack_1e4 + pfVar2[7] + fStack_1e4 + 0.0;
            pfVar2 = (float *)(lVar146 + 0x22284f4 + lVar149 * 4);
            fVar303 = *pfVar2;
            fVar235 = pfVar2[1];
            fVar195 = pfVar2[2];
            fVar325 = pfVar2[3];
            fVar167 = pfVar2[4];
            fVar169 = pfVar2[5];
            fVar257 = pfVar2[6];
            auVar160._0_4_ =
                 fVar303 * fVar211 +
                 (float)local_a0._0_4_ * fVar306 +
                 (float)local_560._0_4_ * fVar210 + (float)local_3e0._0_4_ * fVar270;
            auVar160._4_4_ =
                 fVar235 * fVar225 +
                 (float)local_a0._4_4_ * fVar314 +
                 (float)local_560._4_4_ * fVar224 + (float)local_3e0._4_4_ * fVar271;
            auVar160._8_4_ =
                 fVar195 * fVar227 +
                 fStack_98 * fVar316 + fStack_558 * fVar226 + fStack_3d8 * fVar333;
            auVar160._12_4_ =
                 fVar325 * fVar229 +
                 fStack_94 * fVar317 + fStack_554 * fVar266 + fStack_3d4 * fVar171;
            auVar160._16_4_ =
                 fVar167 * fVar231 +
                 fStack_90 * fVar319 + fStack_550 * fVar267 + fStack_3d0 * fVar173;
            auVar160._20_4_ =
                 fVar169 * fVar233 +
                 fStack_8c * fVar321 + fStack_54c * fVar268 + fStack_3cc * fVar175;
            auVar160._24_4_ =
                 fVar257 * fVar304 +
                 fStack_88 * fVar323 + fStack_548 * fVar269 + fStack_3c8 * fVar177;
            auVar160._28_4_ = fVar209 + fVar284;
            auVar187._0_4_ =
                 fVar303 * (float)local_200._0_4_ +
                 (float)local_5c0._0_4_ * fVar210 + fVar272 * fVar270 +
                 (float)local_1c0._0_4_ * fVar306;
            auVar187._4_4_ =
                 fVar235 * (float)local_200._4_4_ +
                 (float)local_5c0._4_4_ * fVar224 + fVar281 * fVar271 +
                 (float)local_1c0._4_4_ * fVar314;
            auVar187._8_4_ =
                 fVar195 * fStack_1f8 +
                 fStack_5b8 * fVar226 + fVar282 * fVar333 + fStack_1b8 * fVar316;
            auVar187._12_4_ =
                 fVar325 * fStack_1f4 +
                 fStack_5b4 * fVar266 + fVar283 * fVar171 + fStack_1b4 * fVar317;
            auVar187._16_4_ =
                 fVar167 * fStack_1f0 +
                 fStack_5b0 * fVar267 + fVar228 * fVar173 + fStack_1b0 * fVar319;
            auVar187._20_4_ =
                 fVar169 * fStack_1ec +
                 fStack_5ac * fVar268 + fVar230 * fVar175 + fStack_1ac * fVar321;
            auVar187._24_4_ =
                 fVar257 * fStack_1e8 +
                 fStack_5a8 * fVar269 + fVar232 * fVar177 + fStack_1a8 * fVar323;
            auVar187._28_4_ = fVar284 + fVar255;
            auVar344._0_4_ =
                 fVar306 * (float)local_1a0._0_4_ +
                 (float)local_e0._0_4_ * fVar210 + (float)local_580._0_4_ * fVar270 +
                 fVar303 * (float)local_4e0._0_4_;
            auVar344._4_4_ =
                 fVar314 * (float)local_1a0._4_4_ +
                 (float)local_e0._4_4_ * fVar224 + (float)local_580._4_4_ * fVar271 +
                 fVar235 * (float)local_4e0._4_4_;
            auVar344._8_4_ =
                 fVar316 * fStack_198 + fStack_d8 * fVar226 + fStack_578 * fVar333 +
                 fVar195 * fStack_4d8;
            auVar344._12_4_ =
                 fVar317 * fStack_194 + fStack_d4 * fVar266 + fStack_574 * fVar171 +
                 fVar325 * fStack_4d4;
            auVar344._16_4_ =
                 fVar319 * fStack_190 + fStack_d0 * fVar267 + fStack_570 * fVar173 +
                 fVar167 * fStack_4d0;
            auVar344._20_4_ =
                 fVar321 * fStack_18c + fStack_cc * fVar268 + fStack_56c * fVar175 +
                 fVar169 * fStack_4cc;
            auVar344._24_4_ =
                 fVar323 * fStack_188 + fStack_c8 * fVar269 + fStack_568 * fVar177 +
                 fVar257 * fStack_4c8;
            auVar344._28_4_ = pfVar6[7] + fVar209 + fVar255;
            pfVar2 = (float *)(lVar146 + 0x222b21c + lVar149 * 4);
            fVar210 = *pfVar2;
            fVar224 = pfVar2[1];
            fVar226 = pfVar2[2];
            fVar266 = pfVar2[3];
            fVar267 = pfVar2[4];
            fVar268 = pfVar2[5];
            fVar269 = pfVar2[6];
            pfVar4 = (float *)(lVar146 + 0x222b6a0 + lVar149 * 4);
            fVar270 = *pfVar4;
            fVar271 = pfVar4[1];
            fVar333 = pfVar4[2];
            fVar171 = pfVar4[3];
            fVar173 = pfVar4[4];
            fVar175 = pfVar4[5];
            fVar177 = pfVar4[6];
            pfVar5 = (float *)(lVar146 + 0x222ad98 + lVar149 * 4);
            fVar306 = *pfVar5;
            fVar314 = pfVar5[1];
            fVar316 = pfVar5[2];
            fVar317 = pfVar5[3];
            fVar319 = pfVar5[4];
            fVar321 = pfVar5[5];
            fVar323 = pfVar5[6];
            pfVar6 = (float *)(lVar146 + 0x222a914 + lVar149 * 4);
            fVar303 = *pfVar6;
            fVar235 = pfVar6[1];
            fVar195 = pfVar6[2];
            fVar325 = pfVar6[3];
            fVar167 = pfVar6[4];
            fVar169 = pfVar6[5];
            fVar257 = pfVar6[6];
            auVar310._0_4_ =
                 fVar303 * fVar211 +
                 (float)local_a0._0_4_ * fVar306 +
                 (float)local_560._0_4_ * fVar210 + (float)local_3e0._0_4_ * fVar270;
            auVar310._4_4_ =
                 fVar235 * fVar225 +
                 (float)local_a0._4_4_ * fVar314 +
                 (float)local_560._4_4_ * fVar224 + (float)local_3e0._4_4_ * fVar271;
            auVar310._8_4_ =
                 fVar195 * fVar227 +
                 fStack_98 * fVar316 + fStack_558 * fVar226 + fStack_3d8 * fVar333;
            auVar310._12_4_ =
                 fVar325 * fVar229 +
                 fStack_94 * fVar317 + fStack_554 * fVar266 + fStack_3d4 * fVar171;
            auVar310._16_4_ =
                 fVar167 * fVar231 +
                 fStack_90 * fVar319 + fStack_550 * fVar267 + fStack_3d0 * fVar173;
            auVar310._20_4_ =
                 fVar169 * fVar233 +
                 fStack_8c * fVar321 + fStack_54c * fVar268 + fStack_3cc * fVar175;
            auVar310._24_4_ =
                 fVar257 * fVar304 +
                 fStack_88 * fVar323 + fStack_548 * fVar269 + fStack_3c8 * fVar177;
            auVar310._28_4_ = fStack_1a4 + fStack_1a4 + fStack_3c4 + fStack_1a4;
            auVar337._0_4_ =
                 fVar303 * (float)local_200._0_4_ +
                 fVar306 * (float)local_1c0._0_4_ +
                 (float)local_5c0._0_4_ * fVar210 + fVar272 * fVar270;
            auVar337._4_4_ =
                 fVar235 * (float)local_200._4_4_ +
                 fVar314 * (float)local_1c0._4_4_ +
                 (float)local_5c0._4_4_ * fVar224 + fVar281 * fVar271;
            auVar337._8_4_ =
                 fVar195 * fStack_1f8 +
                 fVar316 * fStack_1b8 + fStack_5b8 * fVar226 + fVar282 * fVar333;
            auVar337._12_4_ =
                 fVar325 * fStack_1f4 +
                 fVar317 * fStack_1b4 + fStack_5b4 * fVar266 + fVar283 * fVar171;
            auVar337._16_4_ =
                 fVar167 * fStack_1f0 +
                 fVar319 * fStack_1b0 + fStack_5b0 * fVar267 + fVar228 * fVar173;
            auVar337._20_4_ =
                 fVar169 * fStack_1ec +
                 fVar321 * fStack_1ac + fStack_5ac * fVar268 + fVar230 * fVar175;
            auVar337._24_4_ =
                 fVar257 * fStack_1e8 +
                 fVar323 * fStack_1a8 + fStack_5a8 * fVar269 + fVar232 * fVar177;
            auVar337._28_4_ = fStack_1a4 + fStack_1a4 + fStack_544 + fStack_1a4;
            auVar265._8_4_ = 0x7fffffff;
            auVar265._0_8_ = 0x7fffffff7fffffff;
            auVar265._12_4_ = 0x7fffffff;
            auVar265._16_4_ = 0x7fffffff;
            auVar265._20_4_ = 0x7fffffff;
            auVar265._24_4_ = 0x7fffffff;
            auVar265._28_4_ = 0x7fffffff;
            auVar24 = vandps_avx(auVar160,auVar265);
            auVar26 = vandps_avx(auVar187,auVar265);
            auVar26 = vmaxps_avx(auVar24,auVar26);
            auVar24 = vandps_avx(auVar344,auVar265);
            auVar26 = vmaxps_avx(auVar26,auVar24);
            auVar26 = vcmpps_avx(auVar26,local_240,1);
            auVar27 = vblendvps_avx(auVar160,auVar23,auVar26);
            auVar161._0_4_ =
                 fVar303 * (float)local_4e0._0_4_ +
                 fVar306 * (float)local_1a0._0_4_ +
                 fVar270 * (float)local_580._0_4_ + (float)local_e0._0_4_ * fVar210;
            auVar161._4_4_ =
                 fVar235 * (float)local_4e0._4_4_ +
                 fVar314 * (float)local_1a0._4_4_ +
                 fVar271 * (float)local_580._4_4_ + (float)local_e0._4_4_ * fVar224;
            auVar161._8_4_ =
                 fVar195 * fStack_4d8 +
                 fVar316 * fStack_198 + fVar333 * fStack_578 + fStack_d8 * fVar226;
            auVar161._12_4_ =
                 fVar325 * fStack_4d4 +
                 fVar317 * fStack_194 + fVar171 * fStack_574 + fStack_d4 * fVar266;
            auVar161._16_4_ =
                 fVar167 * fStack_4d0 +
                 fVar319 * fStack_190 + fVar173 * fStack_570 + fStack_d0 * fVar267;
            auVar161._20_4_ =
                 fVar169 * fStack_4cc +
                 fVar321 * fStack_18c + fVar175 * fStack_56c + fStack_cc * fVar268;
            auVar161._24_4_ =
                 fVar257 * fStack_4c8 +
                 fVar323 * fStack_188 + fVar177 * fStack_568 + fStack_c8 * fVar269;
            auVar161._28_4_ = auVar24._28_4_ + pfVar5[7] + pfVar4[7] + pfVar2[7];
            auVar28 = vblendvps_avx(auVar187,_local_440,auVar26);
            auVar24 = vandps_avx(auVar310,auVar265);
            auVar26 = vandps_avx(auVar337,auVar265);
            auVar29 = vmaxps_avx(auVar24,auVar26);
            auVar24 = vandps_avx(auVar161,auVar265);
            auVar24 = vmaxps_avx(auVar29,auVar24);
            local_660._0_4_ = auVar137._0_4_;
            local_660._4_4_ = auVar137._4_4_;
            fStack_658 = auVar137._8_4_;
            fStack_654 = auVar137._12_4_;
            auStack_650._0_4_ = auVar137._16_4_;
            auStack_650._4_4_ = auVar137._20_4_;
            fStack_648 = auVar137._24_4_;
            auVar26 = vcmpps_avx(auVar24,local_240,1);
            auVar24 = vblendvps_avx(auVar310,auVar23,auVar26);
            auVar162._0_4_ =
                 (float)local_4e0._0_4_ * (float)local_660._0_4_ +
                 fVar150 + (float)local_e0._0_4_ * (float)local_680._0_4_ +
                           (float)local_580._0_4_ * (float)local_220._0_4_;
            auVar162._4_4_ =
                 (float)local_4e0._4_4_ * (float)local_660._4_4_ +
                 fVar168 + (float)local_e0._4_4_ * (float)local_680._4_4_ +
                           (float)local_580._4_4_ * (float)local_220._4_4_;
            auVar162._8_4_ =
                 fStack_4d8 * fStack_658 +
                 fVar170 + fStack_d8 * fStack_678 + fStack_578 * fStack_218;
            auVar162._12_4_ =
                 fStack_4d4 * fStack_654 +
                 fVar172 + fStack_d4 * fStack_674 + fStack_574 * fStack_214;
            auVar162._16_4_ =
                 fStack_4d0 * (float)auStack_650._0_4_ +
                 fVar174 + fStack_d0 * (float)auStack_670._0_4_ + fStack_570 * fStack_210;
            auVar162._20_4_ =
                 fStack_4cc * (float)auStack_650._4_4_ +
                 fVar176 + fStack_cc * (float)auStack_670._4_4_ + fStack_56c * fStack_20c;
            auVar162._24_4_ =
                 fStack_4c8 * fStack_648 +
                 fVar178 + fStack_c8 * fStack_668 + fStack_568 * fStack_208;
            auVar162._28_4_ = auVar29._28_4_ + fStack_504 + auVar200._12_4_ + 0.0;
            auVar26 = vblendvps_avx(auVar337,_local_440,auVar26);
            fVar272 = auVar27._0_4_;
            fVar281 = auVar27._4_4_;
            fVar282 = auVar27._8_4_;
            fVar283 = auVar27._12_4_;
            fVar172 = auVar27._16_4_;
            fVar174 = auVar27._20_4_;
            fVar176 = auVar27._24_4_;
            fVar178 = auVar27._28_4_;
            fVar171 = auVar24._0_4_;
            fVar175 = auVar24._4_4_;
            fVar306 = auVar24._8_4_;
            fVar316 = auVar24._12_4_;
            fVar319 = auVar24._16_4_;
            fVar323 = auVar24._20_4_;
            fVar235 = auVar24._24_4_;
            fVar210 = auVar28._0_4_;
            fVar226 = auVar28._4_4_;
            fVar230 = auVar28._8_4_;
            fVar266 = auVar28._12_4_;
            fVar267 = auVar28._16_4_;
            fVar269 = auVar28._20_4_;
            fVar271 = auVar28._24_4_;
            auVar328._0_4_ = fVar210 * fVar210 + fVar272 * fVar272;
            auVar328._4_4_ = fVar226 * fVar226 + fVar281 * fVar281;
            auVar328._8_4_ = fVar230 * fVar230 + fVar282 * fVar282;
            auVar328._12_4_ = fVar266 * fVar266 + fVar283 * fVar283;
            auVar328._16_4_ = fVar267 * fVar267 + fVar172 * fVar172;
            auVar328._20_4_ = fVar269 * fVar269 + fVar174 * fVar174;
            auVar328._24_4_ = fVar271 * fVar271 + fVar176 * fVar176;
            auVar328._28_4_ = fVar234 + auVar23._28_4_;
            auVar23 = vrsqrtps_avx(auVar328);
            fVar224 = auVar23._0_4_;
            fVar228 = auVar23._4_4_;
            auVar77._4_4_ = fVar228 * 1.5;
            auVar77._0_4_ = fVar224 * 1.5;
            fVar232 = auVar23._8_4_;
            auVar77._8_4_ = fVar232 * 1.5;
            fVar234 = auVar23._12_4_;
            auVar77._12_4_ = fVar234 * 1.5;
            fVar268 = auVar23._16_4_;
            auVar77._16_4_ = fVar268 * 1.5;
            fVar270 = auVar23._20_4_;
            auVar77._20_4_ = fVar270 * 1.5;
            fVar333 = auVar23._24_4_;
            auVar77._24_4_ = fVar333 * 1.5;
            auVar77._28_4_ = auVar337._28_4_;
            auVar78._4_4_ = fVar228 * fVar228 * fVar228 * auVar328._4_4_ * 0.5;
            auVar78._0_4_ = fVar224 * fVar224 * fVar224 * auVar328._0_4_ * 0.5;
            auVar78._8_4_ = fVar232 * fVar232 * fVar232 * auVar328._8_4_ * 0.5;
            auVar78._12_4_ = fVar234 * fVar234 * fVar234 * auVar328._12_4_ * 0.5;
            auVar78._16_4_ = fVar268 * fVar268 * fVar268 * auVar328._16_4_ * 0.5;
            auVar78._20_4_ = fVar270 * fVar270 * fVar270 * auVar328._20_4_ * 0.5;
            auVar78._24_4_ = fVar333 * fVar333 * fVar333 * auVar328._24_4_ * 0.5;
            auVar78._28_4_ = auVar328._28_4_;
            auVar27 = vsubps_avx(auVar77,auVar78);
            fVar325 = auVar27._0_4_;
            fVar167 = auVar27._4_4_;
            fVar169 = auVar27._8_4_;
            fVar257 = auVar27._12_4_;
            fVar150 = auVar27._16_4_;
            fVar168 = auVar27._20_4_;
            fVar170 = auVar27._24_4_;
            fVar224 = auVar26._0_4_;
            fVar228 = auVar26._4_4_;
            fVar232 = auVar26._8_4_;
            fVar234 = auVar26._12_4_;
            fVar268 = auVar26._16_4_;
            fVar270 = auVar26._20_4_;
            fVar333 = auVar26._24_4_;
            auVar301._0_4_ = fVar224 * fVar224 + fVar171 * fVar171;
            auVar301._4_4_ = fVar228 * fVar228 + fVar175 * fVar175;
            auVar301._8_4_ = fVar232 * fVar232 + fVar306 * fVar306;
            auVar301._12_4_ = fVar234 * fVar234 + fVar316 * fVar316;
            auVar301._16_4_ = fVar268 * fVar268 + fVar319 * fVar319;
            auVar301._20_4_ = fVar270 * fVar270 + fVar323 * fVar323;
            auVar301._24_4_ = fVar333 * fVar333 + fVar235 * fVar235;
            auVar301._28_4_ = auVar23._28_4_ + auVar24._28_4_;
            auVar23 = vrsqrtps_avx(auVar301);
            fVar173 = auVar23._0_4_;
            fVar177 = auVar23._4_4_;
            auVar79._4_4_ = fVar177 * 1.5;
            auVar79._0_4_ = fVar173 * 1.5;
            fVar314 = auVar23._8_4_;
            auVar79._8_4_ = fVar314 * 1.5;
            fVar317 = auVar23._12_4_;
            auVar79._12_4_ = fVar317 * 1.5;
            fVar321 = auVar23._16_4_;
            auVar79._16_4_ = fVar321 * 1.5;
            fVar303 = auVar23._20_4_;
            auVar79._20_4_ = fVar303 * 1.5;
            fVar195 = auVar23._24_4_;
            auVar79._24_4_ = fVar195 * 1.5;
            auVar79._28_4_ = auVar337._28_4_;
            auVar80._4_4_ = fVar177 * fVar177 * fVar177 * auVar301._4_4_ * 0.5;
            auVar80._0_4_ = fVar173 * fVar173 * fVar173 * auVar301._0_4_ * 0.5;
            auVar80._8_4_ = fVar314 * fVar314 * fVar314 * auVar301._8_4_ * 0.5;
            auVar80._12_4_ = fVar317 * fVar317 * fVar317 * auVar301._12_4_ * 0.5;
            auVar80._16_4_ = fVar321 * fVar321 * fVar321 * auVar301._16_4_ * 0.5;
            auVar80._20_4_ = fVar303 * fVar303 * fVar303 * auVar301._20_4_ * 0.5;
            auVar80._24_4_ = fVar195 * fVar195 * fVar195 * auVar301._24_4_ * 0.5;
            auVar80._28_4_ = auVar301._28_4_;
            auVar24 = vsubps_avx(auVar79,auVar80);
            fVar173 = auVar24._0_4_;
            fVar177 = auVar24._4_4_;
            fVar314 = auVar24._8_4_;
            fVar317 = auVar24._12_4_;
            fVar321 = auVar24._16_4_;
            fVar303 = auVar24._20_4_;
            fVar195 = auVar24._24_4_;
            fVar210 = local_620 * fVar325 * fVar210;
            fVar226 = fStack_61c * fVar167 * fVar226;
            auVar81._4_4_ = fVar226;
            auVar81._0_4_ = fVar210;
            fVar230 = fStack_618 * fVar169 * fVar230;
            auVar81._8_4_ = fVar230;
            fVar266 = fStack_614 * fVar257 * fVar266;
            auVar81._12_4_ = fVar266;
            fVar267 = fStack_610 * fVar150 * fVar267;
            auVar81._16_4_ = fVar267;
            fVar269 = fStack_60c * fVar168 * fVar269;
            auVar81._20_4_ = fVar269;
            fVar271 = fStack_608 * fVar170 * fVar271;
            auVar81._24_4_ = fVar271;
            auVar81._28_4_ = auVar23._28_4_;
            local_660._4_4_ = fVar226 + local_640._4_4_;
            local_660._0_4_ = fVar210 + (float)local_640._0_4_;
            fStack_658 = fVar230 + local_640._8_4_;
            fStack_654 = fVar266 + local_640._12_4_;
            auStack_650._0_4_ = fVar267 + local_640._16_4_;
            auStack_650._4_4_ = fVar269 + local_640._20_4_;
            fStack_648 = fVar271 + local_640._24_4_;
            fStack_644 = auVar23._28_4_ + local_640._28_4_;
            fVar210 = local_620 * fVar325 * -fVar272;
            fVar226 = fStack_61c * fVar167 * -fVar281;
            auVar82._4_4_ = fVar226;
            auVar82._0_4_ = fVar210;
            fVar230 = fStack_618 * fVar169 * -fVar282;
            auVar82._8_4_ = fVar230;
            fVar266 = fStack_614 * fVar257 * -fVar283;
            auVar82._12_4_ = fVar266;
            fVar267 = fStack_610 * fVar150 * -fVar172;
            auVar82._16_4_ = fVar267;
            fVar269 = fStack_60c * fVar168 * -fVar174;
            auVar82._20_4_ = fVar269;
            fVar271 = fStack_608 * fVar170 * -fVar176;
            auVar82._24_4_ = fVar271;
            auVar82._28_4_ = -fVar178;
            local_680._4_4_ = auVar208._4_4_ + fVar226;
            local_680._0_4_ = auVar208._0_4_ + fVar210;
            fStack_678 = auVar208._8_4_ + fVar230;
            fStack_674 = auVar208._12_4_ + fVar266;
            auStack_670._0_4_ = auVar208._16_4_ + fVar267;
            auStack_670._4_4_ = auVar208._20_4_ + fVar269;
            fStack_668 = auVar208._24_4_ + fVar271;
            fStack_664 = auVar208._28_4_ + -fVar178;
            fVar210 = fVar325 * 0.0 * local_620;
            fVar226 = fVar167 * 0.0 * fStack_61c;
            auVar83._4_4_ = fVar226;
            auVar83._0_4_ = fVar210;
            fVar230 = fVar169 * 0.0 * fStack_618;
            auVar83._8_4_ = fVar230;
            fVar266 = fVar257 * 0.0 * fStack_614;
            auVar83._12_4_ = fVar266;
            fVar267 = fVar150 * 0.0 * fStack_610;
            auVar83._16_4_ = fVar267;
            fVar269 = fVar168 * 0.0 * fStack_60c;
            auVar83._20_4_ = fVar269;
            fVar271 = fVar170 * 0.0 * fStack_608;
            auVar83._24_4_ = fVar271;
            auVar83._28_4_ = fVar178;
            auVar30 = vsubps_avx(local_640,auVar81);
            auVar358._0_4_ = fVar210 + auVar162._0_4_;
            auVar358._4_4_ = fVar226 + auVar162._4_4_;
            auVar358._8_4_ = fVar230 + auVar162._8_4_;
            auVar358._12_4_ = fVar266 + auVar162._12_4_;
            auVar358._16_4_ = fVar267 + auVar162._16_4_;
            auVar358._20_4_ = fVar269 + auVar162._20_4_;
            auVar358._24_4_ = fVar271 + auVar162._24_4_;
            auVar358._28_4_ = fVar178 + auVar162._28_4_;
            fVar210 = auVar296._0_4_ * fVar173 * fVar224;
            fVar224 = auVar296._4_4_ * fVar177 * fVar228;
            auVar84._4_4_ = fVar224;
            auVar84._0_4_ = fVar210;
            fVar226 = auVar296._8_4_ * fVar314 * fVar232;
            auVar84._8_4_ = fVar226;
            fVar228 = auVar296._12_4_ * fVar317 * fVar234;
            auVar84._12_4_ = fVar228;
            fVar230 = auVar296._16_4_ * fVar321 * fVar268;
            auVar84._16_4_ = fVar230;
            fVar232 = auVar296._20_4_ * fVar303 * fVar270;
            auVar84._20_4_ = fVar232;
            fVar234 = auVar296._24_4_ * fVar195 * fVar333;
            auVar84._24_4_ = fVar234;
            auVar84._28_4_ = fStack_604;
            auVar155 = vsubps_avx(auVar208,auVar82);
            auVar345._0_4_ = (float)local_480._0_4_ + fVar210;
            auVar345._4_4_ = (float)local_480._4_4_ + fVar224;
            auVar345._8_4_ = fStack_478 + fVar226;
            auVar345._12_4_ = fStack_474 + fVar228;
            auVar345._16_4_ = fStack_470 + fVar230;
            auVar345._20_4_ = fStack_46c + fVar232;
            auVar345._24_4_ = fStack_468 + fVar234;
            auVar345._28_4_ = fStack_464 + fStack_604;
            fVar210 = fVar173 * -fVar171 * auVar296._0_4_;
            fVar224 = fVar177 * -fVar175 * auVar296._4_4_;
            auVar85._4_4_ = fVar224;
            auVar85._0_4_ = fVar210;
            fVar226 = fVar314 * -fVar306 * auVar296._8_4_;
            auVar85._8_4_ = fVar226;
            fVar228 = fVar317 * -fVar316 * auVar296._12_4_;
            auVar85._12_4_ = fVar228;
            fVar230 = fVar321 * -fVar319 * auVar296._16_4_;
            auVar85._16_4_ = fVar230;
            fVar232 = fVar303 * -fVar323 * auVar296._20_4_;
            auVar85._20_4_ = fVar232;
            fVar234 = fVar195 * -fVar235 * auVar296._24_4_;
            auVar85._24_4_ = fVar234;
            auVar85._28_4_ = local_640._28_4_;
            auVar181 = vsubps_avx(auVar162,auVar83);
            auVar244._0_4_ = (float)local_6a0._0_4_ + fVar210;
            auVar244._4_4_ = (float)local_6a0._4_4_ + fVar224;
            auVar244._8_4_ = fStack_698 + fVar226;
            auVar244._12_4_ = fStack_694 + fVar228;
            auVar244._16_4_ = register0x00001350 + fVar230;
            auVar244._20_4_ = register0x00001354 + fVar232;
            auVar244._24_4_ = register0x00001358 + fVar234;
            auVar244._28_4_ = register0x0000135c + local_640._28_4_;
            fVar210 = fVar173 * 0.0 * auVar296._0_4_;
            fVar224 = fVar177 * 0.0 * auVar296._4_4_;
            auVar86._4_4_ = fVar224;
            auVar86._0_4_ = fVar210;
            fVar226 = fVar314 * 0.0 * auVar296._8_4_;
            auVar86._8_4_ = fVar226;
            fVar228 = fVar317 * 0.0 * auVar296._12_4_;
            auVar86._12_4_ = fVar228;
            fVar230 = fVar321 * 0.0 * auVar296._16_4_;
            auVar86._16_4_ = fVar230;
            fVar232 = fVar303 * 0.0 * auVar296._20_4_;
            auVar86._20_4_ = fVar232;
            fVar234 = fVar195 * 0.0 * auVar296._24_4_;
            auVar86._24_4_ = fVar234;
            auVar86._28_4_ = auVar162._28_4_;
            auVar23 = vsubps_avx(_local_480,auVar84);
            auVar131._4_4_ = fStack_51c;
            auVar131._0_4_ = local_520;
            auVar131._8_4_ = fStack_518;
            auVar131._12_4_ = fStack_514;
            auVar131._16_4_ = fStack_510;
            auVar131._20_4_ = fStack_50c;
            auVar131._24_4_ = fStack_508;
            auVar131._28_4_ = fStack_504;
            auVar311._0_4_ = local_520 + fVar210;
            auVar311._4_4_ = fStack_51c + fVar224;
            auVar311._8_4_ = fStack_518 + fVar226;
            auVar311._12_4_ = fStack_514 + fVar228;
            auVar311._16_4_ = fStack_510 + fVar230;
            auVar311._20_4_ = fStack_50c + fVar232;
            auVar311._24_4_ = fStack_508 + fVar234;
            auVar311._28_4_ = fStack_504 + auVar162._28_4_;
            auVar26 = vsubps_avx(_local_6a0,auVar85);
            auVar27 = vsubps_avx(auVar131,auVar86);
            auVar28 = vsubps_avx(auVar244,auVar155);
            auVar29 = vsubps_avx(auVar311,auVar181);
            auVar87._4_4_ = auVar181._4_4_ * auVar28._4_4_;
            auVar87._0_4_ = auVar181._0_4_ * auVar28._0_4_;
            auVar87._8_4_ = auVar181._8_4_ * auVar28._8_4_;
            auVar87._12_4_ = auVar181._12_4_ * auVar28._12_4_;
            auVar87._16_4_ = auVar181._16_4_ * auVar28._16_4_;
            auVar87._20_4_ = auVar181._20_4_ * auVar28._20_4_;
            auVar87._24_4_ = auVar181._24_4_ * auVar28._24_4_;
            auVar87._28_4_ = auVar337._28_4_;
            auVar88._4_4_ = auVar155._4_4_ * auVar29._4_4_;
            auVar88._0_4_ = auVar155._0_4_ * auVar29._0_4_;
            auVar88._8_4_ = auVar155._8_4_ * auVar29._8_4_;
            auVar88._12_4_ = auVar155._12_4_ * auVar29._12_4_;
            auVar88._16_4_ = auVar155._16_4_ * auVar29._16_4_;
            auVar88._20_4_ = auVar155._20_4_ * auVar29._20_4_;
            auVar88._24_4_ = auVar155._24_4_ * auVar29._24_4_;
            auVar88._28_4_ = register0x0000135c;
            auVar31 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = auVar30._4_4_ * auVar29._4_4_;
            auVar89._0_4_ = auVar30._0_4_ * auVar29._0_4_;
            auVar89._8_4_ = auVar30._8_4_ * auVar29._8_4_;
            auVar89._12_4_ = auVar30._12_4_ * auVar29._12_4_;
            auVar89._16_4_ = auVar30._16_4_ * auVar29._16_4_;
            auVar89._20_4_ = auVar30._20_4_ * auVar29._20_4_;
            auVar89._24_4_ = auVar30._24_4_ * auVar29._24_4_;
            auVar89._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar345,auVar30);
            auVar90._4_4_ = auVar181._4_4_ * auVar29._4_4_;
            auVar90._0_4_ = auVar181._0_4_ * auVar29._0_4_;
            auVar90._8_4_ = auVar181._8_4_ * auVar29._8_4_;
            auVar90._12_4_ = auVar181._12_4_ * auVar29._12_4_;
            auVar90._16_4_ = auVar181._16_4_ * auVar29._16_4_;
            auVar90._20_4_ = auVar181._20_4_ * auVar29._20_4_;
            auVar90._24_4_ = auVar181._24_4_ * auVar29._24_4_;
            auVar90._28_4_ = auVar24._28_4_;
            auVar32 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = auVar155._4_4_ * auVar29._4_4_;
            auVar91._0_4_ = auVar155._0_4_ * auVar29._0_4_;
            auVar91._8_4_ = auVar155._8_4_ * auVar29._8_4_;
            auVar91._12_4_ = auVar155._12_4_ * auVar29._12_4_;
            auVar91._16_4_ = auVar155._16_4_ * auVar29._16_4_;
            auVar91._20_4_ = auVar155._20_4_ * auVar29._20_4_;
            auVar91._24_4_ = auVar155._24_4_ * auVar29._24_4_;
            auVar91._28_4_ = auVar24._28_4_;
            auVar92._4_4_ = auVar30._4_4_ * auVar28._4_4_;
            auVar92._0_4_ = auVar30._0_4_ * auVar28._0_4_;
            auVar92._8_4_ = auVar30._8_4_ * auVar28._8_4_;
            auVar92._12_4_ = auVar30._12_4_ * auVar28._12_4_;
            auVar92._16_4_ = auVar30._16_4_ * auVar28._16_4_;
            auVar92._20_4_ = auVar30._20_4_ * auVar28._20_4_;
            auVar92._24_4_ = auVar30._24_4_ * auVar28._24_4_;
            auVar92._28_4_ = auVar28._28_4_;
            auVar24 = vsubps_avx(auVar92,auVar91);
            auVar188._0_4_ = auVar31._0_4_ * 0.0 + auVar24._0_4_ + auVar32._0_4_ * 0.0;
            auVar188._4_4_ = auVar31._4_4_ * 0.0 + auVar24._4_4_ + auVar32._4_4_ * 0.0;
            auVar188._8_4_ = auVar31._8_4_ * 0.0 + auVar24._8_4_ + auVar32._8_4_ * 0.0;
            auVar188._12_4_ = auVar31._12_4_ * 0.0 + auVar24._12_4_ + auVar32._12_4_ * 0.0;
            auVar188._16_4_ = auVar31._16_4_ * 0.0 + auVar24._16_4_ + auVar32._16_4_ * 0.0;
            auVar188._20_4_ = auVar31._20_4_ * 0.0 + auVar24._20_4_ + auVar32._20_4_ * 0.0;
            auVar188._24_4_ = auVar31._24_4_ * 0.0 + auVar24._24_4_ + auVar32._24_4_ * 0.0;
            auVar188._28_4_ = auVar31._28_4_ + auVar24._28_4_ + auVar32._28_4_;
            auVar154 = vcmpps_avx(auVar188,ZEXT832(0) << 0x20,2);
            auVar23 = vblendvps_avx(auVar23,_local_660,auVar154);
            auVar223 = ZEXT3264(auVar23);
            auVar24 = vblendvps_avx(auVar26,_local_680,auVar154);
            auVar26 = vblendvps_avx(auVar27,auVar358,auVar154);
            auVar27 = vblendvps_avx(auVar30,auVar345,auVar154);
            auVar28 = vblendvps_avx(auVar155,auVar244,auVar154);
            auVar29 = vblendvps_avx(auVar181,auVar311,auVar154);
            auVar30 = vblendvps_avx(auVar345,auVar30,auVar154);
            auVar31 = vblendvps_avx(auVar244,auVar155,auVar154);
            auVar32 = vblendvps_avx(auVar311,auVar181,auVar154);
            _local_780 = vandps_avx(auVar186,auVar153);
            auVar30 = vsubps_avx(auVar30,auVar23);
            auVar182 = vsubps_avx(auVar31,auVar24);
            auVar32 = vsubps_avx(auVar32,auVar26);
            auVar153 = vsubps_avx(auVar24,auVar28);
            fVar210 = auVar182._0_4_;
            fVar233 = auVar26._0_4_;
            fVar266 = auVar182._4_4_;
            fVar304 = auVar26._4_4_;
            auVar93._4_4_ = fVar304 * fVar266;
            auVar93._0_4_ = fVar233 * fVar210;
            fVar171 = auVar182._8_4_;
            fVar284 = auVar26._8_4_;
            auVar93._8_4_ = fVar284 * fVar171;
            fVar317 = auVar182._12_4_;
            fVar255 = auVar26._12_4_;
            auVar93._12_4_ = fVar255 * fVar317;
            fVar325 = auVar182._16_4_;
            fVar249 = auVar26._16_4_;
            auVar93._16_4_ = fVar249 * fVar325;
            fVar272 = auVar182._20_4_;
            fVar251 = auVar26._20_4_;
            auVar93._20_4_ = fVar251 * fVar272;
            fVar178 = auVar182._24_4_;
            fVar297 = auVar26._24_4_;
            auVar93._24_4_ = fVar297 * fVar178;
            auVar93._28_4_ = auVar31._28_4_;
            fVar224 = auVar24._0_4_;
            fVar305 = auVar32._0_4_;
            fVar267 = auVar24._4_4_;
            fVar313 = auVar32._4_4_;
            auVar94._4_4_ = fVar313 * fVar267;
            auVar94._0_4_ = fVar305 * fVar224;
            fVar173 = auVar24._8_4_;
            fVar315 = auVar32._8_4_;
            auVar94._8_4_ = fVar315 * fVar173;
            fVar319 = auVar24._12_4_;
            fVar318 = auVar32._12_4_;
            auVar94._12_4_ = fVar318 * fVar319;
            fVar167 = auVar24._16_4_;
            fVar320 = auVar32._16_4_;
            auVar94._16_4_ = fVar320 * fVar167;
            fVar281 = auVar24._20_4_;
            fVar322 = auVar32._20_4_;
            auVar94._20_4_ = fVar322 * fVar281;
            fVar209 = auVar24._24_4_;
            fVar324 = auVar32._24_4_;
            uVar7 = auVar155._28_4_;
            auVar94._24_4_ = fVar324 * fVar209;
            auVar94._28_4_ = uVar7;
            auVar31 = vsubps_avx(auVar94,auVar93);
            fVar226 = auVar23._0_4_;
            fVar268 = auVar23._4_4_;
            auVar95._4_4_ = fVar313 * fVar268;
            auVar95._0_4_ = fVar305 * fVar226;
            fVar175 = auVar23._8_4_;
            auVar95._8_4_ = fVar315 * fVar175;
            fVar321 = auVar23._12_4_;
            auVar95._12_4_ = fVar318 * fVar321;
            fVar169 = auVar23._16_4_;
            auVar95._16_4_ = fVar320 * fVar169;
            fVar282 = auVar23._20_4_;
            auVar95._20_4_ = fVar322 * fVar282;
            fVar211 = auVar23._24_4_;
            auVar95._24_4_ = fVar324 * fVar211;
            auVar95._28_4_ = uVar7;
            fVar228 = auVar30._0_4_;
            fVar269 = auVar30._4_4_;
            auVar96._4_4_ = fVar304 * fVar269;
            auVar96._0_4_ = fVar233 * fVar228;
            fVar177 = auVar30._8_4_;
            auVar96._8_4_ = fVar284 * fVar177;
            fVar323 = auVar30._12_4_;
            auVar96._12_4_ = fVar255 * fVar323;
            fVar257 = auVar30._16_4_;
            auVar96._16_4_ = fVar249 * fVar257;
            fVar283 = auVar30._20_4_;
            auVar96._20_4_ = fVar251 * fVar283;
            fVar225 = auVar30._24_4_;
            auVar96._24_4_ = fVar297 * fVar225;
            auVar96._28_4_ = auVar345._28_4_;
            auVar155 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar267 * fVar269;
            auVar97._0_4_ = fVar224 * fVar228;
            auVar97._8_4_ = fVar173 * fVar177;
            auVar97._12_4_ = fVar319 * fVar323;
            auVar97._16_4_ = fVar167 * fVar257;
            auVar97._20_4_ = fVar281 * fVar283;
            auVar97._24_4_ = fVar209 * fVar225;
            auVar97._28_4_ = uVar7;
            auVar98._4_4_ = fVar268 * fVar266;
            auVar98._0_4_ = fVar226 * fVar210;
            auVar98._8_4_ = fVar175 * fVar171;
            auVar98._12_4_ = fVar321 * fVar317;
            auVar98._16_4_ = fVar169 * fVar325;
            auVar98._20_4_ = fVar282 * fVar272;
            auVar98._24_4_ = fVar211 * fVar178;
            auVar98._28_4_ = auVar181._28_4_;
            auVar181 = vsubps_avx(auVar98,auVar97);
            auVar183 = vsubps_avx(auVar26,auVar29);
            fVar232 = auVar181._28_4_ + auVar155._28_4_;
            auVar329._0_4_ = auVar181._0_4_ + auVar155._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
            auVar329._4_4_ = auVar181._4_4_ + auVar155._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
            auVar329._8_4_ = auVar181._8_4_ + auVar155._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
            auVar329._12_4_ = auVar181._12_4_ + auVar155._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
            auVar329._16_4_ = auVar181._16_4_ + auVar155._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
            auVar329._20_4_ = auVar181._20_4_ + auVar155._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
            auVar329._24_4_ = auVar181._24_4_ + auVar155._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
            auVar329._28_4_ = fVar232 + auVar31._28_4_;
            fVar230 = auVar153._0_4_;
            fVar270 = auVar153._4_4_;
            auVar99._4_4_ = auVar29._4_4_ * fVar270;
            auVar99._0_4_ = auVar29._0_4_ * fVar230;
            fVar306 = auVar153._8_4_;
            auVar99._8_4_ = auVar29._8_4_ * fVar306;
            fVar303 = auVar153._12_4_;
            auVar99._12_4_ = auVar29._12_4_ * fVar303;
            fVar150 = auVar153._16_4_;
            auVar99._16_4_ = auVar29._16_4_ * fVar150;
            fVar172 = auVar153._20_4_;
            auVar99._20_4_ = auVar29._20_4_ * fVar172;
            fVar227 = auVar153._24_4_;
            auVar99._24_4_ = auVar29._24_4_ * fVar227;
            auVar99._28_4_ = fVar232;
            fVar232 = auVar183._0_4_;
            fVar271 = auVar183._4_4_;
            auVar100._4_4_ = auVar28._4_4_ * fVar271;
            auVar100._0_4_ = auVar28._0_4_ * fVar232;
            fVar314 = auVar183._8_4_;
            auVar100._8_4_ = auVar28._8_4_ * fVar314;
            fVar235 = auVar183._12_4_;
            auVar100._12_4_ = auVar28._12_4_ * fVar235;
            fVar168 = auVar183._16_4_;
            auVar100._16_4_ = auVar28._16_4_ * fVar168;
            fVar174 = auVar183._20_4_;
            auVar100._20_4_ = auVar28._20_4_ * fVar174;
            fVar229 = auVar183._24_4_;
            auVar100._24_4_ = auVar28._24_4_ * fVar229;
            auVar100._28_4_ = auVar181._28_4_;
            auVar153 = vsubps_avx(auVar100,auVar99);
            auVar155 = vsubps_avx(auVar23,auVar27);
            fVar234 = auVar155._0_4_;
            fVar333 = auVar155._4_4_;
            auVar101._4_4_ = auVar29._4_4_ * fVar333;
            auVar101._0_4_ = auVar29._0_4_ * fVar234;
            fVar316 = auVar155._8_4_;
            auVar101._8_4_ = auVar29._8_4_ * fVar316;
            fVar195 = auVar155._12_4_;
            auVar101._12_4_ = auVar29._12_4_ * fVar195;
            fVar170 = auVar155._16_4_;
            auVar101._16_4_ = auVar29._16_4_ * fVar170;
            fVar176 = auVar155._20_4_;
            auVar101._20_4_ = auVar29._20_4_ * fVar176;
            fVar231 = auVar155._24_4_;
            auVar101._24_4_ = auVar29._24_4_ * fVar231;
            auVar101._28_4_ = auVar29._28_4_;
            auVar102._4_4_ = fVar271 * auVar27._4_4_;
            auVar102._0_4_ = fVar232 * auVar27._0_4_;
            auVar102._8_4_ = fVar314 * auVar27._8_4_;
            auVar102._12_4_ = fVar235 * auVar27._12_4_;
            auVar102._16_4_ = fVar168 * auVar27._16_4_;
            auVar102._20_4_ = fVar174 * auVar27._20_4_;
            auVar102._24_4_ = fVar229 * auVar27._24_4_;
            auVar102._28_4_ = auVar31._28_4_;
            auVar29 = vsubps_avx(auVar101,auVar102);
            auVar103._4_4_ = auVar28._4_4_ * fVar333;
            auVar103._0_4_ = auVar28._0_4_ * fVar234;
            auVar103._8_4_ = auVar28._8_4_ * fVar316;
            auVar103._12_4_ = auVar28._12_4_ * fVar195;
            auVar103._16_4_ = auVar28._16_4_ * fVar170;
            auVar103._20_4_ = auVar28._20_4_ * fVar176;
            auVar103._24_4_ = auVar28._24_4_ * fVar231;
            auVar103._28_4_ = auVar28._28_4_;
            auVar104._4_4_ = fVar270 * auVar27._4_4_;
            auVar104._0_4_ = fVar230 * auVar27._0_4_;
            auVar104._8_4_ = fVar306 * auVar27._8_4_;
            auVar104._12_4_ = fVar303 * auVar27._12_4_;
            auVar104._16_4_ = fVar150 * auVar27._16_4_;
            auVar104._20_4_ = fVar172 * auVar27._20_4_;
            auVar104._24_4_ = fVar227 * auVar27._24_4_;
            auVar104._28_4_ = auVar27._28_4_;
            auVar27 = vsubps_avx(auVar104,auVar103);
            auVar163._0_4_ = auVar153._0_4_ * 0.0 + auVar27._0_4_ + auVar29._0_4_ * 0.0;
            auVar163._4_4_ = auVar153._4_4_ * 0.0 + auVar27._4_4_ + auVar29._4_4_ * 0.0;
            auVar163._8_4_ = auVar153._8_4_ * 0.0 + auVar27._8_4_ + auVar29._8_4_ * 0.0;
            auVar163._12_4_ = auVar153._12_4_ * 0.0 + auVar27._12_4_ + auVar29._12_4_ * 0.0;
            auVar163._16_4_ = auVar153._16_4_ * 0.0 + auVar27._16_4_ + auVar29._16_4_ * 0.0;
            auVar163._20_4_ = auVar153._20_4_ * 0.0 + auVar27._20_4_ + auVar29._20_4_ * 0.0;
            auVar163._24_4_ = auVar153._24_4_ * 0.0 + auVar27._24_4_ + auVar29._24_4_ * 0.0;
            auVar163._28_4_ = auVar29._28_4_ + auVar27._28_4_ + auVar29._28_4_;
            auVar166 = ZEXT3264(auVar163);
            auVar153 = vmaxps_avx(auVar329,auVar163);
            auVar153 = vcmpps_avx(auVar153,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar246 = ZEXT3264(_local_780);
            auVar27 = _local_780 & auVar153;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
LAB_010cbf70:
              auVar190._8_8_ = local_4c0[1]._8_8_;
              auVar190._0_8_ = local_4c0[1]._0_8_;
              auVar190._16_8_ = local_4c0[1]._16_8_;
              auVar190._24_8_ = local_4c0[1]._24_8_;
            }
            else {
              auVar27 = vandps_avx(auVar153,_local_780);
              auVar105._4_4_ = fVar271 * fVar266;
              auVar105._0_4_ = fVar232 * fVar210;
              auVar105._8_4_ = fVar314 * fVar171;
              auVar105._12_4_ = fVar235 * fVar317;
              auVar105._16_4_ = fVar168 * fVar325;
              auVar105._20_4_ = fVar174 * fVar272;
              auVar105._24_4_ = fVar229 * fVar178;
              auVar105._28_4_ = local_780._28_4_;
              auVar106._4_4_ = fVar270 * fVar313;
              auVar106._0_4_ = fVar230 * fVar305;
              auVar106._8_4_ = fVar306 * fVar315;
              auVar106._12_4_ = fVar303 * fVar318;
              auVar106._16_4_ = fVar150 * fVar320;
              auVar106._20_4_ = fVar172 * fVar322;
              auVar106._24_4_ = fVar227 * fVar324;
              auVar106._28_4_ = auVar153._28_4_;
              auVar28 = vsubps_avx(auVar106,auVar105);
              auVar107._4_4_ = fVar333 * fVar313;
              auVar107._0_4_ = fVar234 * fVar305;
              auVar107._8_4_ = fVar316 * fVar315;
              auVar107._12_4_ = fVar195 * fVar318;
              auVar107._16_4_ = fVar170 * fVar320;
              auVar107._20_4_ = fVar176 * fVar322;
              auVar107._24_4_ = fVar231 * fVar324;
              auVar107._28_4_ = auVar32._28_4_;
              auVar108._4_4_ = fVar271 * fVar269;
              auVar108._0_4_ = fVar232 * fVar228;
              auVar108._8_4_ = fVar314 * fVar177;
              auVar108._12_4_ = fVar235 * fVar323;
              auVar108._16_4_ = fVar168 * fVar257;
              auVar108._20_4_ = fVar174 * fVar283;
              auVar108._24_4_ = fVar229 * fVar225;
              auVar108._28_4_ = auVar183._28_4_;
              auVar29 = vsubps_avx(auVar108,auVar107);
              auVar109._4_4_ = fVar270 * fVar269;
              auVar109._0_4_ = fVar230 * fVar228;
              auVar109._8_4_ = fVar306 * fVar177;
              auVar109._12_4_ = fVar303 * fVar323;
              auVar109._16_4_ = fVar150 * fVar257;
              auVar109._20_4_ = fVar172 * fVar283;
              auVar109._24_4_ = fVar227 * fVar225;
              auVar109._28_4_ = auVar30._28_4_;
              auVar110._4_4_ = fVar333 * fVar266;
              auVar110._0_4_ = fVar234 * fVar210;
              auVar110._8_4_ = fVar316 * fVar171;
              auVar110._12_4_ = fVar195 * fVar317;
              auVar110._16_4_ = fVar170 * fVar325;
              auVar110._20_4_ = fVar176 * fVar272;
              auVar110._24_4_ = fVar231 * fVar178;
              auVar110._28_4_ = auVar182._28_4_;
              auVar31 = vsubps_avx(auVar110,auVar109);
              auVar189._0_4_ = auVar28._0_4_ * 0.0 + auVar31._0_4_ + auVar29._0_4_ * 0.0;
              auVar189._4_4_ = auVar28._4_4_ * 0.0 + auVar31._4_4_ + auVar29._4_4_ * 0.0;
              auVar189._8_4_ = auVar28._8_4_ * 0.0 + auVar31._8_4_ + auVar29._8_4_ * 0.0;
              auVar189._12_4_ = auVar28._12_4_ * 0.0 + auVar31._12_4_ + auVar29._12_4_ * 0.0;
              auVar189._16_4_ = auVar28._16_4_ * 0.0 + auVar31._16_4_ + auVar29._16_4_ * 0.0;
              auVar189._20_4_ = auVar28._20_4_ * 0.0 + auVar31._20_4_ + auVar29._20_4_ * 0.0;
              auVar189._24_4_ = auVar28._24_4_ * 0.0 + auVar31._24_4_ + auVar29._24_4_ * 0.0;
              auVar189._28_4_ = auVar182._28_4_ + auVar31._28_4_ + auVar30._28_4_;
              auVar153 = vrcpps_avx(auVar189);
              fVar228 = auVar153._0_4_;
              fVar230 = auVar153._4_4_;
              auVar111._4_4_ = auVar189._4_4_ * fVar230;
              auVar111._0_4_ = auVar189._0_4_ * fVar228;
              fVar232 = auVar153._8_4_;
              auVar111._8_4_ = auVar189._8_4_ * fVar232;
              fVar234 = auVar153._12_4_;
              auVar111._12_4_ = auVar189._12_4_ * fVar234;
              fVar266 = auVar153._16_4_;
              auVar111._16_4_ = auVar189._16_4_ * fVar266;
              fVar269 = auVar153._20_4_;
              auVar111._20_4_ = auVar189._20_4_ * fVar269;
              fVar270 = auVar153._24_4_;
              auVar111._24_4_ = auVar189._24_4_ * fVar270;
              auVar111._28_4_ = auVar183._28_4_;
              auVar338._8_4_ = 0x3f800000;
              auVar338._0_8_ = &DAT_3f8000003f800000;
              auVar338._12_4_ = 0x3f800000;
              auVar338._16_4_ = 0x3f800000;
              auVar338._20_4_ = 0x3f800000;
              auVar338._24_4_ = 0x3f800000;
              auVar338._28_4_ = 0x3f800000;
              auVar153 = vsubps_avx(auVar338,auVar111);
              fVar228 = auVar153._0_4_ * fVar228 + fVar228;
              fVar230 = auVar153._4_4_ * fVar230 + fVar230;
              fVar232 = auVar153._8_4_ * fVar232 + fVar232;
              fVar234 = auVar153._12_4_ * fVar234 + fVar234;
              fVar266 = auVar153._16_4_ * fVar266 + fVar266;
              fVar269 = auVar153._20_4_ * fVar269 + fVar269;
              fVar270 = auVar153._24_4_ * fVar270 + fVar270;
              auVar112._4_4_ =
                   (fVar268 * auVar28._4_4_ + auVar29._4_4_ * fVar267 + auVar31._4_4_ * fVar304) *
                   fVar230;
              auVar112._0_4_ =
                   (fVar226 * auVar28._0_4_ + auVar29._0_4_ * fVar224 + auVar31._0_4_ * fVar233) *
                   fVar228;
              auVar112._8_4_ =
                   (fVar175 * auVar28._8_4_ + auVar29._8_4_ * fVar173 + auVar31._8_4_ * fVar284) *
                   fVar232;
              auVar112._12_4_ =
                   (fVar321 * auVar28._12_4_ + auVar29._12_4_ * fVar319 + auVar31._12_4_ * fVar255)
                   * fVar234;
              auVar112._16_4_ =
                   (fVar169 * auVar28._16_4_ + auVar29._16_4_ * fVar167 + auVar31._16_4_ * fVar249)
                   * fVar266;
              auVar112._20_4_ =
                   (fVar282 * auVar28._20_4_ + auVar29._20_4_ * fVar281 + auVar31._20_4_ * fVar251)
                   * fVar269;
              auVar112._24_4_ =
                   (fVar211 * auVar28._24_4_ + auVar29._24_4_ * fVar209 + auVar31._24_4_ * fVar297)
                   * fVar270;
              auVar112._28_4_ = auVar23._28_4_ + auVar24._28_4_ + auVar26._28_4_;
              auVar223 = ZEXT3264(auVar112);
              fVar210 = (ray->super_RayK<1>).tfar;
              auVar245._4_4_ = fVar210;
              auVar245._0_4_ = fVar210;
              auVar245._8_4_ = fVar210;
              auVar245._12_4_ = fVar210;
              auVar245._16_4_ = fVar210;
              auVar245._20_4_ = fVar210;
              auVar245._24_4_ = fVar210;
              auVar245._28_4_ = fVar210;
              auVar153 = vcmpps_avx(local_120,auVar112,2);
              auVar23 = vcmpps_avx(auVar112,auVar245,2);
              auVar246 = ZEXT3264(auVar23);
              auVar153 = vandps_avx(auVar153,auVar23);
              auVar24 = auVar27 & auVar153;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0x7f,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0xbf,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar24[0x1f]) goto LAB_010cbf70;
              auVar153 = vandps_avx(auVar27,auVar153);
              auVar24 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar189,4);
              auVar26 = auVar153 & auVar24;
              auVar190._8_8_ = local_4c0[1]._8_8_;
              auVar190._0_8_ = local_4c0[1]._0_8_;
              auVar190._16_8_ = local_4c0[1]._16_8_;
              auVar190._24_8_ = local_4c0[1]._24_8_;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar190 = vandps_avx(auVar24,auVar153);
                auVar113._4_4_ = auVar329._4_4_ * fVar230;
                auVar113._0_4_ = auVar329._0_4_ * fVar228;
                auVar113._8_4_ = auVar329._8_4_ * fVar232;
                auVar113._12_4_ = auVar329._12_4_ * fVar234;
                auVar113._16_4_ = auVar329._16_4_ * fVar266;
                auVar113._20_4_ = auVar329._20_4_ * fVar269;
                auVar113._24_4_ = auVar329._24_4_ * fVar270;
                auVar113._28_4_ = auVar23._28_4_;
                auVar114._4_4_ = auVar163._4_4_ * fVar230;
                auVar114._0_4_ = auVar163._0_4_ * fVar228;
                auVar114._8_4_ = auVar163._8_4_ * fVar232;
                auVar114._12_4_ = auVar163._12_4_ * fVar234;
                auVar114._16_4_ = auVar163._16_4_ * fVar266;
                auVar114._20_4_ = auVar163._20_4_ * fVar269;
                auVar114._24_4_ = auVar163._24_4_ * fVar270;
                auVar114._28_4_ = auVar163._28_4_;
                auVar280._8_4_ = 0x3f800000;
                auVar280._0_8_ = &DAT_3f8000003f800000;
                auVar280._12_4_ = 0x3f800000;
                auVar280._16_4_ = 0x3f800000;
                auVar280._20_4_ = 0x3f800000;
                auVar280._24_4_ = 0x3f800000;
                auVar280._28_4_ = 0x3f800000;
                auVar153 = vsubps_avx(auVar280,auVar113);
                local_100 = vblendvps_avx(auVar153,auVar113,auVar154);
                auVar153 = vsubps_avx(auVar280,auVar114);
                auVar246 = ZEXT3264(auVar153);
                _local_280 = vblendvps_avx(auVar153,auVar114,auVar154);
                auVar166 = ZEXT3264(_local_280);
                local_420 = auVar112;
              }
            }
            auVar312 = ZEXT3264(local_720);
            auVar302 = ZEXT3264(local_700);
            auVar129._4_4_ = fStack_61c;
            auVar129._0_4_ = local_620;
            auVar129._8_4_ = fStack_618;
            auVar129._12_4_ = fStack_614;
            auVar129._16_4_ = fStack_610;
            auVar129._20_4_ = fStack_60c;
            auVar129._24_4_ = fStack_608;
            auVar129._28_4_ = fStack_604;
            fVar272 = (float)local_6e0._0_4_;
            fVar281 = (float)local_6e0._4_4_;
            fVar282 = fStack_6d8;
            fVar283 = fStack_6d4;
            fVar228 = fStack_6d0;
            fVar230 = fStack_6cc;
            fVar232 = fStack_6c8;
            fVar234 = fStack_6c4;
            if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar190 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar190 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar190 >> 0x7f,0) == '\0') &&
                  (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar190 >> 0xbf,0) == '\0') &&
                (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar190[0x1f]) goto LAB_010cbca7;
            auVar153 = vsubps_avx(auVar296,auVar129);
            auVar223 = ZEXT3264(local_100);
            local_620 = local_620 + auVar153._0_4_ * local_100._0_4_;
            fStack_61c = fStack_61c + auVar153._4_4_ * local_100._4_4_;
            fVar224 = fStack_618 + auVar153._8_4_ * local_100._8_4_;
            fVar226 = fStack_614 + auVar153._12_4_ * local_100._12_4_;
            fVar266 = fStack_610 + auVar153._16_4_ * local_100._16_4_;
            fVar267 = fStack_60c + auVar153._20_4_ * local_100._20_4_;
            fVar268 = fStack_608 + auVar153._24_4_ * local_100._24_4_;
            fVar269 = fStack_604 + auVar153._28_4_;
            fVar210 = pre->depth_scale;
            auVar115._4_4_ = (fStack_61c + fStack_61c) * fVar210;
            auVar115._0_4_ = (local_620 + local_620) * fVar210;
            auVar115._8_4_ = (fVar224 + fVar224) * fVar210;
            auVar115._12_4_ = (fVar226 + fVar226) * fVar210;
            auVar115._16_4_ = (fVar266 + fVar266) * fVar210;
            auVar115._20_4_ = (fVar267 + fVar267) * fVar210;
            auVar115._24_4_ = (fVar268 + fVar268) * fVar210;
            auVar115._28_4_ = fVar269 + fVar269;
            auVar246 = ZEXT3264(local_420);
            auVar153 = vcmpps_avx(local_420,auVar115,6);
            auVar166 = ZEXT3264(auVar153);
            auVar23 = auVar190 & auVar153;
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0x7f,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0xbf,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar23[0x1f] < '\0') {
              auVar153 = vandps_avx(auVar153,auVar190);
              auVar166 = ZEXT3264(auVar153);
              local_280._0_4_ = (float)local_280._0_4_ + (float)local_280._0_4_ + -1.0;
              local_280._4_4_ = (float)local_280._4_4_ + (float)local_280._4_4_ + -1.0;
              uStack_278._0_4_ = (float)uStack_278 + (float)uStack_278 + -1.0;
              uStack_278._4_4_ = uStack_278._4_4_ + uStack_278._4_4_ + -1.0;
              uStack_270._0_4_ = (float)uStack_270 + (float)uStack_270 + -1.0;
              uStack_270._4_4_ = uStack_270._4_4_ + uStack_270._4_4_ + -1.0;
              uStack_268._0_4_ = (float)uStack_268 + (float)uStack_268 + -1.0;
              uStack_268._4_4_ = uStack_268._4_4_ + uStack_268._4_4_ + -1.0;
              local_3c0 = local_100;
              auVar140 = _local_280;
              auVar23 = _local_280;
              local_3a0 = (float)local_280._0_4_;
              fStack_39c = (float)local_280._4_4_;
              fStack_398 = (float)uStack_278;
              fStack_394 = uStack_278._4_4_;
              fStack_390 = (float)uStack_270;
              fStack_38c = uStack_270._4_4_;
              fStack_388 = (float)uStack_268;
              fStack_384 = uStack_268._4_4_;
              local_380 = local_420;
              local_35c = uVar20;
              local_350 = (float)local_7c0._0_4_;
              fStack_34c = (float)local_7c0._4_4_;
              fStack_348 = fStack_7b8;
              fStack_344 = fStack_7b4;
              local_340 = local_600;
              uStack_338 = uStack_5f8;
              local_330 = local_530;
              uStack_328 = uStack_528;
              local_320 = local_540;
              uStack_318 = uStack_538;
              local_300 = auVar153;
              pGVar21 = (context->scene->geometries).items[local_788].ptr;
              _local_280 = auVar23;
              if ((pGVar21->mask & (ray->super_RayK<1>).mask) != 0) {
                local_4c0[0] = auVar153;
                auVar199._0_4_ = (float)(int)local_360;
                auVar199._4_8_ = SUB128(ZEXT812(0),4);
                auVar199._12_4_ = 0;
                auVar260 = vshufps_avx(auVar199,auVar199,0);
                local_2e0[0] = (auVar260._0_4_ + local_100._0_4_ + 0.0) * (float)local_400._0_4_;
                local_2e0[1] = (auVar260._4_4_ + local_100._4_4_ + 1.0) * (float)local_400._4_4_;
                local_2e0[2] = (auVar260._8_4_ + local_100._8_4_ + 2.0) * fStack_3f8;
                local_2e0[3] = (auVar260._12_4_ + local_100._12_4_ + 3.0) * fStack_3f4;
                fStack_2d0 = (auVar260._0_4_ + local_100._16_4_ + 4.0) * fStack_3f0;
                fStack_2cc = (auVar260._4_4_ + local_100._20_4_ + 5.0) * fStack_3ec;
                fStack_2c8 = (auVar260._8_4_ + local_100._24_4_ + 6.0) * fStack_3e8;
                fStack_2c4 = auVar260._12_4_ + local_100._28_4_ + 7.0;
                uStack_270 = auVar140._16_8_;
                uStack_268 = auVar23._24_8_;
                local_2c0 = local_280;
                uStack_2b8 = uStack_278;
                uStack_2b0 = uStack_270;
                uStack_2a8 = uStack_268;
                local_2a0 = local_420;
                auVar191._8_4_ = 0x7f800000;
                auVar191._0_8_ = 0x7f8000007f800000;
                auVar191._12_4_ = 0x7f800000;
                auVar191._16_4_ = 0x7f800000;
                auVar191._20_4_ = 0x7f800000;
                auVar191._24_4_ = 0x7f800000;
                auVar191._28_4_ = 0x7f800000;
                auVar23 = vblendvps_avx(auVar191,local_420,auVar153);
                auVar24 = vshufps_avx(auVar23,auVar23,0xb1);
                auVar24 = vminps_avx(auVar23,auVar24);
                auVar26 = vshufpd_avx(auVar24,auVar24,5);
                auVar24 = vminps_avx(auVar24,auVar26);
                auVar26 = vperm2f128_avx(auVar24,auVar24,1);
                auVar24 = vminps_avx(auVar24,auVar26);
                auVar23 = vcmpps_avx(auVar23,auVar24,0);
                auVar24 = auVar153 & auVar23;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0x7f,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0xbf,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar24[0x1f] < '\0') {
                  auVar153 = vandps_avx(auVar23,auVar153);
                }
                uVar142 = vmovmskps_avx(auVar153);
                uVar19 = 0;
                if (uVar142 != 0) {
                  for (; (uVar142 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar144 = (ulong)uVar19;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar210 = local_2e0[uVar144];
                  auVar166 = ZEXT464((uint)fVar210);
                  fVar224 = *(float *)((long)&local_2c0 + uVar144 * 4);
                  fVar266 = 1.0 - fVar210;
                  fVar226 = fVar210 * fVar266 + fVar210 * fVar266;
                  auVar260 = ZEXT416((uint)(fVar210 * fVar210 * 3.0));
                  auVar260 = vshufps_avx(auVar260,auVar260,0);
                  auVar200 = ZEXT416((uint)((fVar226 - fVar210 * fVar210) * 3.0));
                  auVar200 = vshufps_avx(auVar200,auVar200,0);
                  auVar194 = ZEXT416((uint)((fVar266 * fVar266 - fVar226) * 3.0));
                  auVar194 = vshufps_avx(auVar194,auVar194,0);
                  fVar226 = auVar194._0_4_ * (float)local_600._0_4_;
                  fVar267 = auVar194._4_4_ * (float)local_600._4_4_;
                  fVar268 = auVar194._8_4_ * (float)uStack_5f8;
                  fVar269 = auVar194._12_4_ * uStack_5f8._4_4_;
                  auVar246 = ZEXT1664(CONCAT412(fVar269,CONCAT48(fVar268,CONCAT44(fVar267,fVar226)))
                                     );
                  auVar194 = ZEXT416((uint)(fVar266 * fVar266 * -3.0));
                  auVar194 = vshufps_avx(auVar194,auVar194,0);
                  auVar201._0_4_ =
                       (float)local_7c0._0_4_ * auVar194._0_4_ +
                       fVar226 + auVar260._0_4_ * (float)local_540._0_4_ +
                                 auVar200._0_4_ * (float)local_530._0_4_;
                  auVar201._4_4_ =
                       (float)local_7c0._4_4_ * auVar194._4_4_ +
                       fVar267 + auVar260._4_4_ * (float)local_540._4_4_ +
                                 auVar200._4_4_ * (float)local_530._4_4_;
                  auVar201._8_4_ =
                       fStack_7b8 * auVar194._8_4_ +
                       fVar268 + auVar260._8_4_ * (float)uStack_538 +
                                 auVar200._8_4_ * (float)uStack_528;
                  auVar201._12_4_ =
                       fStack_7b4 * auVar194._12_4_ +
                       fVar269 + auVar260._12_4_ * uStack_538._4_4_ +
                                 auVar200._12_4_ * uStack_528._4_4_;
                  auVar223 = ZEXT464((uint)*(float *)(local_2a0 + uVar144 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_2a0 + uVar144 * 4);
                  uVar8 = vmovlps_avx(auVar201);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                  fVar226 = (float)vextractps_avx(auVar201,2);
                  (ray->Ng).field_0.field_0.z = fVar226;
                  ray->u = fVar210;
                  ray->v = fVar224;
                  ray->primID = uVar143;
                  ray->geomID = (uint)local_788;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_640._0_8_ = pGVar21;
                  _local_6a0 = _local_600;
                  _local_660 = _local_530;
                  _auStack_6b0 = auVar296._16_16_;
                  _local_6c0 = _local_540;
                  local_790 = pPVar147;
                  local_798 = context;
                  local_7a0 = ray;
                  local_7a8 = pre;
                  fVar210 = (float)local_7c0._0_4_;
                  fVar224 = (float)local_7c0._4_4_;
                  fVar226 = fStack_7b8;
                  fVar266 = fStack_7b4;
                  _local_220 = auVar25;
                  do {
                    local_5e4 = local_2e0[uVar144];
                    local_5e0 = *(undefined4 *)((long)&local_2c0 + uVar144 * 4);
                    local_780._0_4_ = (ray->super_RayK<1>).tfar;
                    local_620 = (float)uVar144;
                    fStack_61c = (float)(uVar144 >> 0x20);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2a0 + uVar144 * 4);
                    local_750.context = context->user;
                    fVar268 = 1.0 - local_5e4;
                    fVar267 = local_5e4 * fVar268 + local_5e4 * fVar268;
                    auVar260 = ZEXT416((uint)(local_5e4 * local_5e4 * 3.0));
                    auVar260 = vshufps_avx(auVar260,auVar260,0);
                    auVar200 = ZEXT416((uint)((fVar267 - local_5e4 * local_5e4) * 3.0));
                    auVar200 = vshufps_avx(auVar200,auVar200,0);
                    auVar194 = ZEXT416((uint)((fVar268 * fVar268 - fVar267) * 3.0));
                    auVar194 = vshufps_avx(auVar194,auVar194,0);
                    auVar240._0_4_ = auVar194._0_4_ * (float)local_6a0._0_4_;
                    auVar240._4_4_ = auVar194._4_4_ * (float)local_6a0._4_4_;
                    auVar240._8_4_ = auVar194._8_4_ * fStack_698;
                    auVar240._12_4_ = auVar194._12_4_ * fStack_694;
                    auVar246 = ZEXT1664(auVar240);
                    auVar194 = ZEXT416((uint)(fVar268 * fVar268 * -3.0));
                    auVar194 = vshufps_avx(auVar194,auVar194,0);
                    auVar202._0_4_ =
                         fVar210 * auVar194._0_4_ +
                         auVar240._0_4_ +
                         auVar260._0_4_ * (float)local_6c0._0_4_ +
                         auVar200._0_4_ * (float)local_660._0_4_;
                    auVar202._4_4_ =
                         fVar224 * auVar194._4_4_ +
                         auVar240._4_4_ +
                         auVar260._4_4_ * (float)local_6c0._4_4_ +
                         auVar200._4_4_ * (float)local_660._4_4_;
                    auVar202._8_4_ =
                         fVar226 * auVar194._8_4_ +
                         auVar240._8_4_ + auVar260._8_4_ * fStack_6b8 + auVar200._8_4_ * fStack_658;
                    auVar202._12_4_ =
                         fVar266 * auVar194._12_4_ +
                         auVar240._12_4_ +
                         auVar260._12_4_ * fStack_6b4 + auVar200._12_4_ * fStack_654;
                    local_5f0 = vmovlps_avx(auVar202);
                    local_5e8 = vextractps_avx(auVar202,2);
                    local_5dc = uVar143;
                    local_5d8 = (int)local_788;
                    local_5d4 = (local_750.context)->instID[0];
                    local_5d0 = (local_750.context)->instPrimID[0];
                    local_7c4 = -1;
                    local_750.valid = &local_7c4;
                    local_750.geometryUserPtr = *(void **)(local_640._0_8_ + 0x18);
                    local_750.ray = (RTCRayN *)ray;
                    local_750.hit = (RTCHitN *)&local_5f0;
                    local_750.N = 1;
                    if (*(code **)(local_640._0_8_ + 0x40) == (code *)0x0) {
LAB_010cc1be:
                      p_Var22 = context->args->filter;
                      if (p_Var22 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_640._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar246 = ZEXT1664(auVar246._0_16_);
                          (*p_Var22)(&local_750);
                        }
                        auVar302 = ZEXT3264(local_700);
                        auVar312 = ZEXT3264(local_720);
                        ray = local_7a0;
                        pre = local_7a8;
                        pPVar147 = local_790;
                        context = local_798;
                        fVar236 = (float)local_560._0_4_;
                        fVar247 = (float)local_560._4_4_;
                        fVar248 = fStack_558;
                        fVar250 = fStack_554;
                        fVar252 = fStack_550;
                        fVar253 = fStack_54c;
                        fVar254 = fStack_548;
                        fVar256 = fStack_544;
                        fVar210 = (float)local_7c0._0_4_;
                        fVar224 = (float)local_7c0._4_4_;
                        fVar226 = fStack_7b8;
                        fVar266 = fStack_7b4;
                        fVar272 = (float)local_6e0._0_4_;
                        fVar281 = (float)local_6e0._4_4_;
                        fVar282 = fStack_6d8;
                        fVar283 = fStack_6d4;
                        fVar228 = fStack_6d0;
                        fVar230 = fStack_6cc;
                        fVar232 = fStack_6c8;
                        fVar234 = fStack_6c4;
                        if (*local_750.valid == 0) goto LAB_010cc29f;
                      }
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                           *(float *)local_750.hit;
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_750.hit + 4);
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_750.hit + 8);
                      *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                      *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                      *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                      *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                      *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                      *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                    }
                    else {
                      auVar246 = ZEXT1664(auVar240);
                      (**(code **)(local_640._0_8_ + 0x40))(&local_750);
                      auVar312 = ZEXT3264(local_720);
                      auVar302 = ZEXT3264(local_700);
                      ray = local_7a0;
                      pre = local_7a8;
                      pPVar147 = local_790;
                      context = local_798;
                      fVar236 = (float)local_560._0_4_;
                      fVar247 = (float)local_560._4_4_;
                      fVar248 = fStack_558;
                      fVar250 = fStack_554;
                      fVar252 = fStack_550;
                      fVar253 = fStack_54c;
                      fVar254 = fStack_548;
                      fVar256 = fStack_544;
                      fVar210 = (float)local_7c0._0_4_;
                      fVar224 = (float)local_7c0._4_4_;
                      fVar226 = fStack_7b8;
                      fVar266 = fStack_7b4;
                      fVar272 = (float)local_6e0._0_4_;
                      fVar281 = (float)local_6e0._4_4_;
                      fVar282 = fStack_6d8;
                      fVar283 = fStack_6d4;
                      fVar228 = fStack_6d0;
                      fVar230 = fStack_6cc;
                      fVar232 = fStack_6c8;
                      fVar234 = fStack_6c4;
                      if (*local_750.valid != 0) goto LAB_010cc1be;
LAB_010cc29f:
                      (local_7a0->super_RayK<1>).tfar = (float)local_780._0_4_;
                      ray = local_7a0;
                      pre = local_7a8;
                      pPVar147 = local_790;
                      context = local_798;
                      fVar210 = (float)local_7c0._0_4_;
                      fVar224 = (float)local_7c0._4_4_;
                      fVar226 = fStack_7b8;
                      fVar266 = fStack_7b4;
                      fVar272 = (float)local_6e0._0_4_;
                      fVar281 = (float)local_6e0._4_4_;
                      fVar282 = fStack_6d8;
                      fVar283 = fStack_6d4;
                      fVar228 = fStack_6d0;
                      fVar230 = fStack_6cc;
                      fVar232 = fStack_6c8;
                      fVar234 = fStack_6c4;
                    }
                    auVar23 = local_420;
                    uVar144 = CONCAT44(fStack_61c,local_620);
                    *(undefined4 *)(local_4c0[0] + uVar144 * 4) = 0;
                    auVar24 = local_4c0[0];
                    fVar267 = (ray->super_RayK<1>).tfar;
                    auVar164._4_4_ = fVar267;
                    auVar164._0_4_ = fVar267;
                    auVar164._8_4_ = fVar267;
                    auVar164._12_4_ = fVar267;
                    auVar164._16_4_ = fVar267;
                    auVar164._20_4_ = fVar267;
                    auVar164._24_4_ = fVar267;
                    auVar164._28_4_ = fVar267;
                    auVar153 = vcmpps_avx(auVar23,auVar164,2);
                    local_4c0[0] = vandps_avx(auVar153,local_4c0[0]);
                    auVar166 = ZEXT3264(local_4c0[0]);
                    auVar24 = auVar24 & auVar153;
                    bVar123 = (auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar124 = (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar122 = (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar121 = SUB321(auVar24 >> 0x7f,0) != '\0';
                    bVar120 = (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar119 = SUB321(auVar24 >> 0xbf,0) != '\0';
                    bVar117 = (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar116 = auVar24[0x1f] < '\0';
                    if (((((((bVar123 || bVar124) || bVar122) || bVar121) || bVar120) || bVar119) ||
                        bVar117) || bVar116) {
                      auVar192._8_4_ = 0x7f800000;
                      auVar192._0_8_ = 0x7f8000007f800000;
                      auVar192._12_4_ = 0x7f800000;
                      auVar192._16_4_ = 0x7f800000;
                      auVar192._20_4_ = 0x7f800000;
                      auVar192._24_4_ = 0x7f800000;
                      auVar192._28_4_ = 0x7f800000;
                      auVar153 = vblendvps_avx(auVar192,auVar23,local_4c0[0]);
                      auVar23 = vshufps_avx(auVar153,auVar153,0xb1);
                      auVar23 = vminps_avx(auVar153,auVar23);
                      auVar24 = vshufpd_avx(auVar23,auVar23,5);
                      auVar24 = vminps_avx(auVar23,auVar24);
                      auVar23 = vperm2f128_avx(auVar24,auVar24,1);
                      auVar24 = vminps_avx(auVar24,auVar23);
                      auVar153 = vcmpps_avx(auVar153,auVar24,0);
                      auVar24 = local_4c0[0] & auVar153;
                      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar24 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar24 >> 0x7f,0) != '\0') ||
                            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar24 >> 0xbf,0) != '\0') ||
                          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar24[0x1f] < '\0') {
                        auVar153 = vandps_avx(auVar153,local_4c0[0]);
                        auVar166 = ZEXT3264(auVar153);
                      }
                      uVar142 = vmovmskps_avx(auVar166._0_32_);
                      uVar19 = 0;
                      if (uVar142 != 0) {
                        for (; (uVar142 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                        }
                      }
                      uVar144 = (ulong)uVar19;
                    }
                    auVar223 = ZEXT3264(auVar23);
                  } while (((((((bVar123 || bVar124) || bVar122) || bVar121) || bVar120) || bVar119)
                           || bVar117) || bVar116);
                }
              }
            }
          }
          lVar149 = lVar149 + 8;
          fVar257 = (float)local_5c0._0_4_;
          fVar150 = (float)local_5c0._4_4_;
          fVar168 = fStack_5b8;
          fVar170 = fStack_5b4;
          fVar210 = fStack_5b0;
          fVar224 = fStack_5ac;
          fVar226 = fStack_5a8;
        } while ((int)lVar149 < (int)uVar20);
      }
      fVar210 = (ray->super_RayK<1>).tfar;
      auVar159._4_4_ = fVar210;
      auVar159._0_4_ = fVar210;
      auVar159._8_4_ = fVar210;
      auVar159._12_4_ = fVar210;
      auVar159._16_4_ = fVar210;
      auVar159._20_4_ = fVar210;
      auVar159._24_4_ = fVar210;
      auVar159._28_4_ = fVar210;
      auVar153 = vcmpps_avx(local_80,auVar159,2);
      uVar143 = vmovmskps_avx(auVar153);
      uVar143 = (uint)uVar148 & uVar143;
    } while (uVar143 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }